

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack1to4.h
# Opt level: O0

void ncnn::conv3x3s1_pack1to4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  float _v [4];
  float _v_00 [4];
  float _v_01 [4];
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  float *pfVar37;
  Mat *in_RCX;
  long in_RSI;
  long in_RDI;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  __m128 _r23_5;
  __m128 _r22_5;
  __m128 _r21_5;
  __m128 _r13_5;
  __m128 _r12_5;
  __m128 _r11_5;
  __m128 _r03_5;
  __m128 _r02_5;
  __m128 _r01_5;
  __m128 _sum0_2;
  __m128 _r24_3;
  __m128 _r14_3;
  __m128 _r04_3;
  __m128 _sum1_1;
  __m128 _r23_4;
  __m128 _r22_4;
  __m128 _r21_4;
  __m128 _r13_4;
  __m128 _r12_4;
  __m128 _r11_4;
  __m128 _r03_4;
  __m128 _r02_4;
  __m128 _r01_4;
  __m128 _sum0_1;
  __m128 _r26_1;
  __m128 _r16_1;
  __m128 _r06_1;
  __m128 _sum3;
  __m128 _r25_1;
  __m128 _r15_1;
  __m128 _r05_1;
  __m128 _sum2;
  __m128 _r24_2;
  __m128 _r14_2;
  __m128 _r04_2;
  __m128 _sum1;
  __m128 _r23_3;
  __m128 _r22_3;
  __m128 _r21_3;
  __m128 _r13_3;
  __m128 _r12_3;
  __m128 _r11_3;
  __m128 _r03_3;
  __m128 _r02_3;
  __m128 _r01_3;
  __m128 _sum0;
  int j_1;
  int i_1;
  __m128 _k22;
  __m128 _k21;
  __m128 _k20;
  __m128 _k12;
  __m128 _k11;
  __m128 _k10;
  __m128 _k02;
  __m128 _k01;
  __m128 _k00;
  float *r2_1;
  float *r1_1;
  float *r0_1;
  Mat img0_1;
  float *outptr0_1;
  int q_1;
  float *k0_1;
  __m128 _bias0_1;
  Mat out0_1;
  int p_1;
  __m128 _r23_2;
  __m128 _r22_2;
  __m128 _r21_2;
  __m128 _r13_2;
  __m128 _r12_2;
  __m128 _r11_2;
  __m128 _r03_2;
  __m128 _r02_2;
  __m128 _r01_2;
  __m128 _sum10_2;
  __m128 _sum00_2;
  __m128 _r24_1;
  __m128 _r14_1;
  __m128 _r04_1;
  __m128 _sum11_1;
  __m128 _sum01_1;
  __m128 _r23_1;
  __m128 _r22_1;
  __m128 _r21_1;
  __m128 _r13_1;
  __m128 _r12_1;
  __m128 _r11_1;
  __m128 _r03_1;
  __m128 _r02_1;
  __m128 _r01_1;
  __m128 _sum10_1;
  __m128 _sum00_1;
  __m128 _sum13;
  __m128 _sum03;
  __m128 _r26;
  __m128 _r16;
  __m128 _r06;
  __m128 _r25;
  __m128 _r15;
  __m128 _r05;
  __m128 _sum12;
  __m128 _sum02;
  __m128 _r24;
  __m128 _r14;
  __m128 _r04;
  __m128 _sum11;
  __m128 _sum01;
  __m128 _r23;
  __m128 _r22;
  __m128 _r21;
  __m128 _r13;
  __m128 _r12;
  __m128 _r11;
  __m128 _r03;
  __m128 _r02;
  __m128 _r01;
  __m128 _sum10;
  __m128 _sum00;
  int j;
  int i;
  __m128 _k22_1;
  __m128 _k21_1;
  __m128 _k20_1;
  __m128 _k12_1;
  __m128 _k11_1;
  __m128 _k10_1;
  __m128 _k02_1;
  __m128 _k01_1;
  __m128 _k00_1;
  __m128 _k22_0;
  __m128 _k21_0;
  __m128 _k20_0;
  __m128 _k12_0;
  __m128 _k11_0;
  __m128 _k10_0;
  __m128 _k02_0;
  __m128 _k01_0;
  __m128 _k00_0;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr1;
  float *outptr0;
  int q;
  float *k1;
  float *k0;
  __m128 _bias1;
  __m128 _bias0;
  Mat out1;
  Mat out0;
  int p;
  int pp;
  int remain_outch_start;
  int nn_outch;
  float *bias;
  int outch;
  int outh;
  int outw;
  int inch;
  float in_stack_ffffffffffff8790;
  float in_stack_ffffffffffff8794;
  float in_stack_ffffffffffff8798;
  float in_stack_ffffffffffff879c;
  float in_stack_ffffffffffff87a0;
  float in_stack_ffffffffffff87a4;
  float in_stack_ffffffffffff87a8;
  float in_stack_ffffffffffff87ac;
  undefined8 local_7488;
  undefined8 uStack_7480;
  undefined8 local_6c78;
  undefined8 uStack_6c70;
  undefined8 local_6c68;
  undefined8 uStack_6c60;
  int local_6970;
  int local_696c;
  float *local_68d8;
  float *local_68d0;
  float *local_68c8;
  Mat local_68c0;
  float *local_6878;
  int local_686c;
  Mat local_6868;
  float *local_6820;
  undefined8 local_6818;
  undefined8 uStack_6810;
  Mat local_6808;
  int local_67bc;
  undefined8 local_67b8;
  undefined8 uStack_67b0;
  undefined8 local_67a8;
  undefined8 uStack_67a0;
  undefined8 local_6798;
  undefined8 uStack_6790;
  undefined8 local_6788;
  undefined8 uStack_6780;
  undefined8 local_6778;
  undefined8 uStack_6770;
  undefined8 local_6768;
  undefined8 uStack_6760;
  undefined8 local_6758;
  undefined8 uStack_6750;
  undefined8 local_6748;
  undefined8 uStack_6740;
  undefined8 local_6738;
  undefined8 uStack_6730;
  undefined8 local_6728;
  undefined8 uStack_6720;
  undefined8 local_6718;
  undefined8 uStack_6710;
  undefined8 local_6708;
  undefined8 uStack_6700;
  undefined8 local_66f8;
  undefined8 uStack_66f0;
  undefined8 local_66e8;
  undefined8 uStack_66e0;
  undefined8 local_66d8;
  undefined8 uStack_66d0;
  undefined8 local_66c8;
  undefined8 uStack_66c0;
  undefined8 local_66b8;
  undefined8 uStack_66b0;
  undefined8 local_66a8;
  undefined8 uStack_66a0;
  undefined8 local_6698;
  undefined8 uStack_6690;
  undefined8 local_6688;
  undefined8 uStack_6680;
  undefined8 local_6678;
  undefined8 uStack_6670;
  undefined8 local_6668;
  undefined8 uStack_6660;
  undefined8 local_6658;
  undefined8 uStack_6650;
  undefined8 local_6648;
  undefined8 uStack_6640;
  undefined8 local_6638;
  undefined8 uStack_6630;
  undefined8 local_6628;
  undefined8 uStack_6620;
  undefined8 local_6618;
  undefined8 uStack_6610;
  undefined8 local_6608;
  undefined8 uStack_6600;
  undefined8 local_65f8;
  undefined8 uStack_65f0;
  undefined8 local_65e8;
  undefined8 uStack_65e0;
  undefined8 local_65d8;
  undefined8 uStack_65d0;
  undefined8 local_65c8;
  undefined8 uStack_65c0;
  undefined8 local_65b8;
  undefined8 uStack_65b0;
  undefined8 local_65a8;
  undefined8 uStack_65a0;
  undefined8 local_6598;
  undefined8 uStack_6590;
  undefined8 local_6588;
  undefined8 uStack_6580;
  undefined8 local_6578;
  undefined8 uStack_6570;
  undefined8 local_6568;
  undefined8 uStack_6560;
  undefined8 local_6558;
  undefined8 uStack_6550;
  undefined8 local_6548;
  undefined8 uStack_6540;
  undefined8 local_6538;
  undefined8 uStack_6530;
  undefined8 local_6528;
  undefined8 uStack_6520;
  undefined8 local_6518;
  undefined8 uStack_6510;
  undefined8 local_6508;
  undefined8 uStack_6500;
  undefined8 local_64f8;
  undefined8 uStack_64f0;
  undefined8 local_64e8;
  undefined8 uStack_64e0;
  undefined8 local_64d8;
  undefined8 uStack_64d0;
  undefined8 local_64c8;
  undefined8 uStack_64c0;
  undefined8 local_64b8;
  undefined8 uStack_64b0;
  undefined8 local_64a8;
  undefined8 uStack_64a0;
  undefined8 local_6498;
  undefined8 uStack_6490;
  undefined8 local_6488;
  undefined8 uStack_6480;
  undefined8 local_6478;
  undefined8 uStack_6470;
  int local_6460;
  int local_645c;
  undefined8 local_6458;
  undefined8 uStack_6450;
  undefined8 local_6448;
  undefined8 uStack_6440;
  undefined8 local_6438;
  undefined8 uStack_6430;
  undefined8 local_6428;
  undefined8 uStack_6420;
  undefined8 local_6418;
  undefined8 uStack_6410;
  undefined8 local_6408;
  undefined8 uStack_6400;
  undefined8 local_63f8;
  undefined8 uStack_63f0;
  undefined8 local_63e8;
  undefined8 uStack_63e0;
  undefined8 local_63d8;
  undefined8 uStack_63d0;
  undefined8 local_63c8;
  undefined8 uStack_63c0;
  undefined8 local_63b8;
  undefined8 uStack_63b0;
  undefined8 local_63a8;
  undefined8 uStack_63a0;
  undefined8 local_6398;
  undefined8 uStack_6390;
  undefined8 local_6388;
  undefined8 uStack_6380;
  undefined8 local_6378;
  undefined8 uStack_6370;
  undefined8 local_6368;
  undefined8 uStack_6360;
  undefined8 local_6358;
  undefined8 uStack_6350;
  undefined8 local_6348;
  undefined8 uStack_6340;
  float *local_6330;
  float *local_6328;
  float *local_6320;
  Mat local_6318;
  float *local_62d0;
  float *local_62c8;
  int local_62bc;
  Mat local_62b8;
  float *local_6270;
  Mat local_6268;
  float *local_6220;
  undefined8 local_6218;
  undefined8 uStack_6210;
  undefined8 local_6208;
  undefined8 uStack_6200;
  Mat local_61e8;
  Mat local_61a0;
  int local_6158;
  int local_6154;
  int local_6150;
  int local_614c;
  float *local_6148;
  int local_6140;
  int local_613c;
  int local_6138;
  int local_6134;
  float local_6108;
  float fStack_6104;
  float fStack_6100;
  float fStack_60fc;
  float local_60ec;
  float local_60e8;
  float fStack_60e4;
  float fStack_60e0;
  float fStack_60dc;
  float local_60cc;
  float local_60c8;
  float fStack_60c4;
  float fStack_60c0;
  float fStack_60bc;
  float local_60ac;
  float local_60a8;
  float fStack_60a4;
  float fStack_60a0;
  float fStack_609c;
  float local_608c;
  float local_6088;
  float fStack_6084;
  float fStack_6080;
  float fStack_607c;
  float local_606c;
  float local_6068;
  float fStack_6064;
  float fStack_6060;
  float fStack_605c;
  float local_604c;
  float local_6048;
  float fStack_6044;
  float fStack_6040;
  float fStack_603c;
  float local_602c;
  float local_6028;
  float fStack_6024;
  float fStack_6020;
  float fStack_601c;
  float local_600c;
  float local_6008;
  float fStack_6004;
  float fStack_6000;
  float fStack_5ffc;
  float local_5fec;
  float local_5fe8;
  float fStack_5fe4;
  float fStack_5fe0;
  float fStack_5fdc;
  float local_5fcc;
  float local_5fc8;
  float fStack_5fc4;
  float fStack_5fc0;
  float fStack_5fbc;
  float local_5fac;
  float local_5fa8;
  float fStack_5fa4;
  float fStack_5fa0;
  float fStack_5f9c;
  float local_5f8c;
  float local_5f88;
  float fStack_5f84;
  float fStack_5f80;
  float fStack_5f7c;
  float local_5f6c;
  float local_5f68;
  float fStack_5f64;
  float fStack_5f60;
  float fStack_5f5c;
  float local_5f4c;
  float local_5f48;
  float fStack_5f44;
  float fStack_5f40;
  float fStack_5f3c;
  float local_5f2c;
  float local_5f28;
  float fStack_5f24;
  float fStack_5f20;
  float fStack_5f1c;
  float local_5f0c;
  float local_5f08;
  float fStack_5f04;
  float fStack_5f00;
  float fStack_5efc;
  float local_5eec;
  float local_5ee8;
  float fStack_5ee4;
  float fStack_5ee0;
  float fStack_5edc;
  float local_5ecc;
  float local_5ec8;
  float fStack_5ec4;
  float fStack_5ec0;
  float fStack_5ebc;
  float local_5eac;
  float local_5ea8;
  float fStack_5ea4;
  float fStack_5ea0;
  float fStack_5e9c;
  float local_5e8c;
  float local_5e88;
  float fStack_5e84;
  float fStack_5e80;
  float fStack_5e7c;
  float local_5e6c;
  float local_5e68;
  float fStack_5e64;
  float fStack_5e60;
  float fStack_5e5c;
  float local_5e4c;
  float local_5e48;
  float fStack_5e44;
  float fStack_5e40;
  float fStack_5e3c;
  float local_5e2c;
  float local_5e28;
  float fStack_5e24;
  float fStack_5e20;
  float fStack_5e1c;
  float local_5e0c;
  float local_5e08;
  float fStack_5e04;
  float fStack_5e00;
  float fStack_5dfc;
  float local_5dec;
  float local_5de8;
  float fStack_5de4;
  float fStack_5de0;
  float fStack_5ddc;
  float local_5dcc;
  float local_5dc8;
  float fStack_5dc4;
  float fStack_5dc0;
  float fStack_5dbc;
  float local_5dac;
  float local_5da8;
  float fStack_5da4;
  float fStack_5da0;
  float fStack_5d9c;
  float local_5d8c;
  float local_5d88;
  float fStack_5d84;
  float fStack_5d80;
  float fStack_5d7c;
  float local_5d6c;
  float local_5d68;
  float fStack_5d64;
  float fStack_5d60;
  float fStack_5d5c;
  float local_5d4c;
  float local_5d48;
  float fStack_5d44;
  float fStack_5d40;
  float fStack_5d3c;
  float local_5d2c;
  float local_5d28;
  float fStack_5d24;
  float fStack_5d20;
  float fStack_5d1c;
  float local_5d0c;
  float local_5d08;
  float fStack_5d04;
  float fStack_5d00;
  float fStack_5cfc;
  float local_5cec;
  float local_5ce8;
  float fStack_5ce4;
  float fStack_5ce0;
  float fStack_5cdc;
  float local_5ccc;
  float local_5cc8;
  float fStack_5cc4;
  float fStack_5cc0;
  float fStack_5cbc;
  float local_5cac;
  float local_5ca8;
  float fStack_5ca4;
  float fStack_5ca0;
  float fStack_5c9c;
  float local_5c8c;
  float local_5c88;
  float fStack_5c84;
  float fStack_5c80;
  float fStack_5c7c;
  float local_5c6c;
  float local_5c68;
  float fStack_5c64;
  float fStack_5c60;
  float fStack_5c5c;
  float local_5c4c;
  float local_5c48;
  float fStack_5c44;
  float fStack_5c40;
  float fStack_5c3c;
  float local_5c2c;
  undefined4 local_5c28;
  undefined4 uStack_5c24;
  undefined4 uStack_5c20;
  undefined4 uStack_5c1c;
  undefined4 local_5c0c;
  float local_5c08;
  float fStack_5c04;
  float fStack_5c00;
  float fStack_5bfc;
  float local_5bec;
  float local_5be8;
  float fStack_5be4;
  float fStack_5be0;
  float fStack_5bdc;
  float local_5bcc;
  float local_5bc8;
  float fStack_5bc4;
  float fStack_5bc0;
  float fStack_5bbc;
  float local_5bac;
  float local_5ba8;
  float fStack_5ba4;
  float fStack_5ba0;
  float fStack_5b9c;
  float local_5b8c;
  float local_5b88;
  float fStack_5b84;
  float fStack_5b80;
  float fStack_5b7c;
  float local_5b6c;
  float local_5b68;
  float fStack_5b64;
  float fStack_5b60;
  float fStack_5b5c;
  float local_5b4c;
  float local_5b48;
  float fStack_5b44;
  float fStack_5b40;
  float fStack_5b3c;
  float local_5b2c;
  float local_5b28;
  float fStack_5b24;
  float fStack_5b20;
  float fStack_5b1c;
  float local_5b0c;
  float local_5b08;
  float fStack_5b04;
  float fStack_5b00;
  float fStack_5afc;
  float local_5aec;
  float local_5ae8;
  float fStack_5ae4;
  float fStack_5ae0;
  float fStack_5adc;
  float local_5acc;
  float local_5ac8;
  float fStack_5ac4;
  float fStack_5ac0;
  float fStack_5abc;
  float local_5aac;
  float local_5aa8;
  float fStack_5aa4;
  float fStack_5aa0;
  float fStack_5a9c;
  float local_5a8c;
  float local_5a88;
  float fStack_5a84;
  float fStack_5a80;
  float fStack_5a7c;
  float local_5a6c;
  float local_5a68;
  float fStack_5a64;
  float fStack_5a60;
  float fStack_5a5c;
  float local_5a4c;
  float local_5a48;
  float fStack_5a44;
  float fStack_5a40;
  float fStack_5a3c;
  float local_5a2c;
  float local_5a28;
  float fStack_5a24;
  float fStack_5a20;
  float fStack_5a1c;
  float local_5a0c;
  float local_5a08;
  float fStack_5a04;
  float fStack_5a00;
  float fStack_59fc;
  float local_59ec;
  float local_59e8;
  float fStack_59e4;
  float fStack_59e0;
  float fStack_59dc;
  float local_59cc;
  float local_59c8;
  float fStack_59c4;
  float fStack_59c0;
  float fStack_59bc;
  float local_59ac;
  float local_59a8;
  float fStack_59a4;
  float fStack_59a0;
  float fStack_599c;
  float local_598c;
  float local_5988;
  float fStack_5984;
  float fStack_5980;
  float fStack_597c;
  float local_596c;
  float local_5968;
  float fStack_5964;
  float fStack_5960;
  float fStack_595c;
  float local_594c;
  float local_5948;
  float fStack_5944;
  float fStack_5940;
  float fStack_593c;
  float local_592c;
  float local_5928;
  float fStack_5924;
  float fStack_5920;
  float fStack_591c;
  float local_590c;
  float local_5908;
  float fStack_5904;
  float fStack_5900;
  float fStack_58fc;
  float local_58ec;
  float local_58e8;
  float fStack_58e4;
  float fStack_58e0;
  float fStack_58dc;
  float local_58cc;
  float local_58c8;
  float fStack_58c4;
  float fStack_58c0;
  float fStack_58bc;
  float local_58ac;
  float local_58a8;
  float fStack_58a4;
  float fStack_58a0;
  float fStack_589c;
  float local_588c;
  float local_5888;
  float fStack_5884;
  float fStack_5880;
  float fStack_587c;
  float local_586c;
  float local_5868;
  float fStack_5864;
  float fStack_5860;
  float fStack_585c;
  float local_584c;
  float local_5848;
  float fStack_5844;
  float fStack_5840;
  float fStack_583c;
  float local_582c;
  float local_5828;
  float fStack_5824;
  float fStack_5820;
  float fStack_581c;
  float local_580c;
  float local_5808;
  float fStack_5804;
  float fStack_5800;
  float fStack_57fc;
  float local_57ec;
  float local_57e8;
  float fStack_57e4;
  float fStack_57e0;
  float fStack_57dc;
  float local_57cc;
  float local_57c8;
  float fStack_57c4;
  float fStack_57c0;
  float fStack_57bc;
  float local_57ac;
  float local_57a8;
  float fStack_57a4;
  float fStack_57a0;
  float fStack_579c;
  float local_578c;
  float local_5788;
  float fStack_5784;
  float fStack_5780;
  float fStack_577c;
  float local_576c;
  float local_5768;
  float fStack_5764;
  float fStack_5760;
  float fStack_575c;
  float local_574c;
  float local_5748;
  float fStack_5744;
  float fStack_5740;
  float fStack_573c;
  float local_572c;
  undefined4 local_5728;
  undefined4 uStack_5724;
  undefined4 uStack_5720;
  undefined4 uStack_571c;
  undefined4 local_570c;
  undefined4 local_5708;
  undefined4 uStack_5704;
  undefined4 uStack_5700;
  undefined4 uStack_56fc;
  undefined4 local_56f4;
  float *local_56f0;
  float *local_56e8;
  float *local_56e0;
  float *local_56d8;
  float *local_56d0;
  float *local_56c8;
  float *local_56c0;
  float *local_56b8;
  float *local_56b0;
  float *local_56a8;
  float *local_56a0;
  float *local_5698;
  float *local_5690;
  float *local_5688;
  float *local_5680;
  float *local_5678;
  float *local_5670;
  float *local_5668;
  float *local_5660;
  float *local_5658;
  float *local_5650;
  float *local_5648;
  float *local_5640;
  float *local_5638;
  float *local_5630;
  float *local_5628;
  float *local_5620;
  float *local_5618;
  float *local_5610;
  float *local_5608;
  float *local_5600;
  float *local_55f8;
  float *local_55f0;
  float *local_55e8;
  float *local_55e0;
  float *local_55d8;
  float *local_55d0;
  float *local_55c8;
  float *local_55c0;
  float *local_55b8;
  float *local_55b0;
  float *local_55a8;
  float *local_55a0;
  float *local_5598;
  float *local_5590;
  float *local_5588;
  float *local_5580;
  float *local_5578;
  float *local_5570;
  float *local_5568;
  float *local_5560;
  undefined8 local_5558;
  undefined8 uStack_5550;
  undefined8 local_5548;
  undefined8 uStack_5540;
  undefined8 local_5538;
  undefined8 uStack_5530;
  undefined8 local_5528;
  undefined8 uStack_5520;
  undefined8 local_5518;
  undefined8 uStack_5510;
  undefined8 local_5508;
  undefined8 uStack_5500;
  undefined8 local_54f8;
  undefined8 uStack_54f0;
  undefined8 local_54e8;
  undefined8 uStack_54e0;
  undefined8 local_54d8;
  undefined8 uStack_54d0;
  undefined8 local_54c8;
  undefined8 uStack_54c0;
  undefined8 local_54b8;
  undefined8 uStack_54b0;
  undefined8 local_54a8;
  undefined8 uStack_54a0;
  undefined8 local_5498;
  undefined8 uStack_5490;
  undefined8 local_5488;
  undefined8 uStack_5480;
  undefined8 local_5478;
  undefined8 uStack_5470;
  undefined8 local_5468;
  undefined8 uStack_5460;
  undefined8 local_5458;
  undefined8 uStack_5450;
  undefined8 local_5448;
  undefined8 uStack_5440;
  undefined8 local_5438;
  undefined8 uStack_5430;
  undefined8 local_5428;
  undefined8 uStack_5420;
  undefined8 local_5418;
  undefined8 uStack_5410;
  undefined8 local_5408;
  undefined8 uStack_5400;
  undefined8 local_53f8;
  undefined8 uStack_53f0;
  undefined8 local_53e8;
  undefined8 uStack_53e0;
  undefined8 local_53d8;
  undefined8 uStack_53d0;
  undefined8 local_53c8;
  undefined8 uStack_53c0;
  undefined8 local_53b8;
  undefined8 uStack_53b0;
  undefined8 local_53a8;
  undefined8 uStack_53a0;
  undefined8 local_5398;
  undefined8 uStack_5390;
  undefined8 local_5388;
  undefined8 uStack_5380;
  undefined8 local_5378;
  undefined8 uStack_5370;
  undefined8 local_5368;
  undefined8 uStack_5360;
  undefined8 local_5358;
  undefined8 uStack_5350;
  undefined8 local_5348;
  undefined8 uStack_5340;
  undefined8 local_5338;
  undefined8 uStack_5330;
  undefined8 local_5328;
  undefined8 uStack_5320;
  undefined8 local_5318;
  undefined8 uStack_5310;
  undefined8 local_5308;
  undefined8 uStack_5300;
  undefined8 local_52f8;
  undefined8 uStack_52f0;
  undefined8 local_52e8;
  undefined8 uStack_52e0;
  undefined8 local_52d8;
  undefined8 uStack_52d0;
  undefined8 local_52c8;
  undefined8 uStack_52c0;
  undefined8 local_52b8;
  undefined8 uStack_52b0;
  undefined8 local_52a8;
  undefined8 uStack_52a0;
  undefined8 local_5298;
  undefined8 uStack_5290;
  undefined8 local_5288;
  undefined8 uStack_5280;
  undefined8 local_5278;
  undefined8 uStack_5270;
  undefined8 local_5268;
  undefined8 uStack_5260;
  undefined8 local_5258;
  undefined8 uStack_5250;
  undefined8 local_5248;
  undefined8 uStack_5240;
  undefined8 local_5238;
  undefined8 uStack_5230;
  undefined8 local_5228;
  undefined8 uStack_5220;
  undefined8 local_5218;
  undefined8 uStack_5210;
  undefined8 local_5208;
  undefined8 uStack_5200;
  undefined8 local_51f8;
  undefined8 uStack_51f0;
  undefined8 local_51e8;
  undefined8 uStack_51e0;
  undefined8 local_51d8;
  undefined8 uStack_51d0;
  undefined8 local_51c8;
  undefined8 uStack_51c0;
  undefined8 local_51b8;
  undefined8 uStack_51b0;
  undefined8 local_51a8;
  undefined8 uStack_51a0;
  undefined8 local_5198;
  undefined8 uStack_5190;
  undefined8 local_5188;
  undefined8 uStack_5180;
  undefined8 local_5178;
  undefined8 uStack_5170;
  undefined8 local_5168;
  undefined8 uStack_5160;
  undefined8 local_5158;
  undefined8 uStack_5150;
  undefined8 local_5148;
  undefined8 uStack_5140;
  undefined8 local_5138;
  undefined8 uStack_5130;
  undefined8 local_5128;
  undefined8 uStack_5120;
  undefined8 local_5118;
  undefined8 uStack_5110;
  undefined8 local_5108;
  undefined8 uStack_5100;
  undefined8 local_50f8;
  undefined8 uStack_50f0;
  undefined8 local_50e8;
  undefined8 uStack_50e0;
  undefined8 local_50d8;
  undefined8 uStack_50d0;
  undefined8 local_50c8;
  undefined8 uStack_50c0;
  undefined8 local_50b8;
  undefined8 uStack_50b0;
  undefined8 local_50a8;
  undefined8 uStack_50a0;
  undefined8 local_5098;
  undefined8 uStack_5090;
  undefined8 local_5088;
  undefined8 uStack_5080;
  undefined8 local_5078;
  undefined8 uStack_5070;
  undefined8 local_5068;
  undefined8 uStack_5060;
  undefined8 local_5058;
  undefined8 uStack_5050;
  undefined8 local_5048;
  undefined8 uStack_5040;
  undefined8 local_5038;
  undefined8 uStack_5030;
  undefined8 local_5028;
  undefined8 uStack_5020;
  undefined8 local_5018;
  undefined8 uStack_5010;
  undefined8 local_5008;
  undefined8 uStack_5000;
  undefined8 local_4ff8;
  undefined8 uStack_4ff0;
  undefined8 local_4fe8;
  undefined8 uStack_4fe0;
  undefined8 local_4fd8;
  undefined8 uStack_4fd0;
  undefined8 local_4fc8;
  undefined8 uStack_4fc0;
  undefined8 local_4fb8;
  undefined8 uStack_4fb0;
  undefined8 local_4fa8;
  undefined8 uStack_4fa0;
  undefined8 local_4f98;
  undefined8 uStack_4f90;
  undefined8 local_4f88;
  undefined8 uStack_4f80;
  undefined8 local_4f78;
  undefined8 uStack_4f70;
  undefined8 local_4f68;
  undefined8 uStack_4f60;
  undefined8 local_4f58;
  undefined8 uStack_4f50;
  undefined8 local_4f48;
  undefined8 uStack_4f40;
  undefined8 local_4f38;
  undefined8 uStack_4f30;
  undefined8 local_4f28;
  undefined8 uStack_4f20;
  undefined8 local_4f18;
  undefined8 uStack_4f10;
  undefined8 local_4f08;
  undefined8 uStack_4f00;
  undefined8 local_4ef8;
  undefined8 uStack_4ef0;
  undefined8 local_4ee8;
  undefined8 uStack_4ee0;
  undefined8 local_4ed8;
  undefined8 uStack_4ed0;
  undefined8 local_4ec8;
  undefined8 uStack_4ec0;
  undefined8 local_4eb8;
  undefined8 uStack_4eb0;
  undefined8 local_4ea8;
  undefined8 uStack_4ea0;
  undefined8 local_4e98;
  undefined8 uStack_4e90;
  undefined8 local_4e88;
  undefined8 uStack_4e80;
  undefined8 local_4e78;
  undefined8 uStack_4e70;
  undefined8 local_4e68;
  undefined8 uStack_4e60;
  undefined8 local_4e58;
  undefined8 uStack_4e50;
  undefined8 local_4e48;
  undefined8 uStack_4e40;
  undefined8 local_4e38;
  undefined8 uStack_4e30;
  undefined8 local_4e28;
  undefined8 uStack_4e20;
  undefined8 local_4e18;
  undefined8 uStack_4e10;
  undefined8 local_4e08;
  undefined8 uStack_4e00;
  undefined8 local_4df8;
  undefined8 uStack_4df0;
  undefined8 local_4de8;
  undefined8 uStack_4de0;
  undefined8 local_4dd8;
  undefined8 uStack_4dd0;
  undefined8 local_4dc8;
  undefined8 uStack_4dc0;
  undefined8 local_4db8;
  undefined8 uStack_4db0;
  undefined8 local_4da8;
  undefined8 uStack_4da0;
  undefined8 local_4d98;
  undefined8 uStack_4d90;
  undefined8 local_4d88;
  undefined8 uStack_4d80;
  undefined8 local_4d78;
  undefined8 uStack_4d70;
  undefined8 local_4d68;
  undefined8 uStack_4d60;
  undefined8 local_4d58;
  undefined8 uStack_4d50;
  undefined8 local_4d48;
  undefined8 uStack_4d40;
  undefined8 local_4d38;
  undefined8 uStack_4d30;
  undefined8 local_4d28;
  undefined8 uStack_4d20;
  undefined8 local_4d18;
  undefined8 uStack_4d10;
  undefined8 local_4d08;
  undefined8 uStack_4d00;
  undefined8 local_4cf8;
  undefined8 uStack_4cf0;
  undefined8 local_4ce8;
  undefined8 uStack_4ce0;
  undefined8 local_4cd8;
  undefined8 uStack_4cd0;
  undefined8 local_4cc8;
  undefined8 uStack_4cc0;
  undefined8 local_4cb8;
  undefined8 uStack_4cb0;
  undefined8 local_4ca8;
  undefined8 uStack_4ca0;
  undefined8 local_4c98;
  undefined8 uStack_4c90;
  undefined8 local_4c88;
  undefined8 uStack_4c80;
  undefined8 local_4c78;
  undefined8 uStack_4c70;
  undefined8 local_4c68;
  undefined8 uStack_4c60;
  undefined8 local_4c58;
  undefined8 uStack_4c50;
  undefined8 local_4c48;
  undefined8 uStack_4c40;
  undefined8 local_4c38;
  undefined8 uStack_4c30;
  undefined8 local_4c28;
  undefined8 uStack_4c20;
  undefined8 local_4c18;
  undefined8 uStack_4c10;
  undefined8 local_4c08;
  undefined8 uStack_4c00;
  undefined8 local_4bf8;
  undefined8 uStack_4bf0;
  undefined8 local_4be8;
  undefined8 uStack_4be0;
  undefined8 local_4bd8;
  undefined8 uStack_4bd0;
  undefined8 local_4bc8;
  undefined8 uStack_4bc0;
  undefined8 local_4bb8;
  undefined8 uStack_4bb0;
  undefined8 local_4ba8;
  undefined8 uStack_4ba0;
  undefined8 local_4b98;
  undefined8 uStack_4b90;
  undefined8 local_4b88;
  undefined8 uStack_4b80;
  undefined8 local_4b78;
  undefined8 uStack_4b70;
  undefined8 local_4b68;
  undefined8 uStack_4b60;
  undefined8 local_4b58;
  undefined8 uStack_4b50;
  undefined8 local_4b48;
  undefined8 uStack_4b40;
  undefined8 local_4b38;
  undefined8 uStack_4b30;
  undefined8 local_4b28;
  undefined8 uStack_4b20;
  undefined8 local_4b18;
  undefined8 uStack_4b10;
  undefined8 local_4b08;
  undefined8 uStack_4b00;
  undefined8 local_4af8;
  undefined8 uStack_4af0;
  undefined8 local_4ae8;
  undefined8 uStack_4ae0;
  undefined8 local_4ad8;
  undefined8 uStack_4ad0;
  undefined8 local_4ac8;
  undefined8 uStack_4ac0;
  undefined8 local_4ab8;
  undefined8 uStack_4ab0;
  undefined8 local_4aa8;
  undefined8 uStack_4aa0;
  undefined8 local_4a98;
  undefined8 uStack_4a90;
  undefined8 local_4a88;
  undefined8 uStack_4a80;
  undefined8 local_4a78;
  undefined8 uStack_4a70;
  undefined8 local_4a68;
  undefined8 uStack_4a60;
  undefined8 local_4a58;
  undefined8 uStack_4a50;
  undefined8 local_4a48;
  undefined8 uStack_4a40;
  undefined8 local_4a38;
  undefined8 uStack_4a30;
  undefined8 local_4a28;
  undefined8 uStack_4a20;
  undefined8 local_4a18;
  undefined8 uStack_4a10;
  undefined8 local_4a08;
  undefined8 uStack_4a00;
  undefined8 local_49f8;
  undefined8 uStack_49f0;
  undefined8 local_49e8;
  undefined8 uStack_49e0;
  undefined8 local_49d8;
  undefined8 uStack_49d0;
  undefined8 local_49c8;
  undefined8 uStack_49c0;
  undefined8 local_49b8;
  undefined8 uStack_49b0;
  undefined8 local_49a8;
  undefined8 uStack_49a0;
  undefined8 local_4998;
  undefined8 uStack_4990;
  undefined8 local_4988;
  undefined8 uStack_4980;
  undefined8 local_4978;
  undefined8 uStack_4970;
  undefined8 local_4968;
  undefined8 uStack_4960;
  undefined8 local_4958;
  undefined8 uStack_4950;
  undefined8 local_4948;
  undefined8 uStack_4940;
  undefined8 local_4938;
  undefined8 uStack_4930;
  undefined8 local_4928;
  undefined8 uStack_4920;
  undefined8 local_4918;
  undefined8 uStack_4910;
  undefined8 local_4908;
  undefined8 uStack_4900;
  undefined8 local_48f8;
  undefined8 uStack_48f0;
  undefined8 local_48e8;
  undefined8 uStack_48e0;
  undefined8 local_48d8;
  undefined8 uStack_48d0;
  undefined8 local_48c8;
  undefined8 uStack_48c0;
  undefined8 local_48b8;
  undefined8 uStack_48b0;
  undefined8 local_48a8;
  undefined8 uStack_48a0;
  undefined8 local_4898;
  undefined8 uStack_4890;
  undefined8 local_4888;
  undefined8 uStack_4880;
  undefined8 local_4878;
  undefined8 uStack_4870;
  undefined8 local_4868;
  undefined8 uStack_4860;
  undefined8 local_4858;
  undefined8 uStack_4850;
  undefined8 local_4848;
  undefined8 uStack_4840;
  undefined8 local_4838;
  undefined8 uStack_4830;
  undefined8 local_4828;
  undefined8 uStack_4820;
  undefined8 local_4818;
  undefined8 uStack_4810;
  undefined8 local_4808;
  undefined8 uStack_4800;
  undefined8 local_47f8;
  undefined8 uStack_47f0;
  undefined8 local_47e8;
  undefined8 uStack_47e0;
  undefined8 local_47d8;
  undefined8 uStack_47d0;
  undefined8 local_47c8;
  undefined8 uStack_47c0;
  undefined8 local_47b8;
  undefined8 uStack_47b0;
  undefined8 local_47a8;
  undefined8 uStack_47a0;
  undefined8 local_4798;
  undefined8 uStack_4790;
  undefined8 local_4788;
  undefined8 uStack_4780;
  undefined8 local_4778;
  undefined8 uStack_4770;
  undefined8 local_4768;
  undefined8 uStack_4760;
  undefined8 local_4758;
  undefined8 uStack_4750;
  undefined8 local_4748;
  undefined8 uStack_4740;
  undefined8 local_4738;
  undefined8 uStack_4730;
  undefined8 local_4728;
  undefined8 uStack_4720;
  undefined8 local_4718;
  undefined8 uStack_4710;
  undefined8 local_4708;
  undefined8 uStack_4700;
  undefined8 local_46f8;
  undefined8 uStack_46f0;
  undefined8 local_46e8;
  undefined8 uStack_46e0;
  undefined8 local_46d8;
  undefined8 uStack_46d0;
  undefined8 local_46c8;
  undefined8 uStack_46c0;
  undefined8 local_46b8;
  undefined8 uStack_46b0;
  undefined8 local_46a8;
  undefined8 uStack_46a0;
  undefined8 local_4698;
  undefined8 uStack_4690;
  undefined8 local_4688;
  undefined8 uStack_4680;
  undefined8 local_4678;
  undefined8 uStack_4670;
  undefined8 local_4668;
  undefined8 uStack_4660;
  undefined8 local_4658;
  undefined8 uStack_4650;
  undefined8 local_4648;
  undefined8 uStack_4640;
  undefined8 local_4638;
  undefined8 uStack_4630;
  undefined8 local_4628;
  undefined8 uStack_4620;
  undefined8 local_4618;
  undefined8 uStack_4610;
  undefined8 local_4608;
  undefined8 uStack_4600;
  undefined8 local_45f8;
  undefined8 uStack_45f0;
  undefined8 local_45e8;
  undefined8 uStack_45e0;
  undefined8 local_45d8;
  undefined8 uStack_45d0;
  undefined8 local_45c8;
  undefined8 uStack_45c0;
  undefined8 local_45b8;
  undefined8 uStack_45b0;
  undefined8 local_45a8;
  undefined8 uStack_45a0;
  undefined8 local_4598;
  undefined8 uStack_4590;
  undefined8 local_4588;
  undefined8 uStack_4580;
  undefined8 local_4578;
  undefined8 uStack_4570;
  undefined8 local_4568;
  undefined8 uStack_4560;
  undefined8 local_4558;
  undefined8 uStack_4550;
  undefined8 local_4548;
  undefined8 uStack_4540;
  undefined8 local_4538;
  undefined8 uStack_4530;
  undefined8 local_4528;
  undefined8 uStack_4520;
  undefined8 local_4518;
  undefined8 uStack_4510;
  undefined8 local_4508;
  undefined8 uStack_4500;
  undefined8 local_44f8;
  undefined8 uStack_44f0;
  undefined8 local_44e8;
  undefined8 uStack_44e0;
  undefined8 local_44d8;
  undefined8 uStack_44d0;
  undefined8 local_44c8;
  undefined8 uStack_44c0;
  undefined8 local_44b8;
  undefined8 uStack_44b0;
  undefined8 local_44a8;
  undefined8 uStack_44a0;
  undefined8 local_4498;
  undefined8 uStack_4490;
  undefined8 local_4488;
  undefined8 uStack_4480;
  undefined8 local_4478;
  undefined8 uStack_4470;
  undefined8 local_4468;
  undefined8 uStack_4460;
  undefined8 local_4458;
  undefined8 uStack_4450;
  undefined8 local_4448;
  undefined8 uStack_4440;
  undefined8 local_4438;
  undefined8 uStack_4430;
  undefined8 local_4428;
  undefined8 uStack_4420;
  undefined8 local_4418;
  undefined8 uStack_4410;
  undefined8 local_4408;
  undefined8 uStack_4400;
  undefined8 local_43f8;
  undefined8 uStack_43f0;
  undefined8 local_43e8;
  undefined8 uStack_43e0;
  undefined8 local_43d8;
  undefined8 uStack_43d0;
  undefined8 local_43c8;
  undefined8 uStack_43c0;
  undefined8 local_43b8;
  undefined8 uStack_43b0;
  undefined8 local_43a8;
  undefined8 uStack_43a0;
  undefined8 local_4398;
  undefined8 uStack_4390;
  undefined8 local_4388;
  undefined8 uStack_4380;
  undefined8 local_4378;
  undefined8 uStack_4370;
  undefined8 local_4368;
  undefined8 uStack_4360;
  undefined8 local_4358;
  undefined8 uStack_4350;
  undefined8 local_4348;
  undefined8 uStack_4340;
  undefined8 local_4338;
  undefined8 uStack_4330;
  undefined8 local_4328;
  undefined8 uStack_4320;
  undefined8 local_4318;
  undefined8 uStack_4310;
  undefined8 local_4308;
  undefined8 uStack_4300;
  undefined8 local_42f8;
  undefined8 uStack_42f0;
  undefined8 local_42e8;
  undefined8 uStack_42e0;
  undefined8 local_42d8;
  undefined8 uStack_42d0;
  undefined8 local_42c8;
  undefined8 uStack_42c0;
  undefined8 local_42b8;
  undefined8 uStack_42b0;
  undefined8 local_42a8;
  undefined8 uStack_42a0;
  undefined8 local_4298;
  undefined8 uStack_4290;
  undefined8 local_4288;
  undefined8 uStack_4280;
  undefined8 local_4278;
  undefined8 uStack_4270;
  undefined8 local_4268;
  undefined8 uStack_4260;
  undefined8 local_4258;
  undefined8 uStack_4250;
  undefined8 local_4248;
  undefined8 uStack_4240;
  undefined8 local_4238;
  undefined8 uStack_4230;
  undefined8 local_4228;
  undefined8 uStack_4220;
  undefined8 local_4218;
  undefined8 uStack_4210;
  undefined8 local_4208;
  undefined8 uStack_4200;
  undefined8 local_41f8;
  undefined8 uStack_41f0;
  undefined8 local_41e8;
  undefined8 uStack_41e0;
  undefined8 local_41d8;
  undefined8 uStack_41d0;
  undefined8 local_41c8;
  undefined8 uStack_41c0;
  undefined8 local_41b8;
  undefined8 uStack_41b0;
  undefined8 local_41a8;
  undefined8 uStack_41a0;
  undefined8 local_4198;
  undefined8 uStack_4190;
  undefined8 local_4188;
  undefined8 uStack_4180;
  undefined8 local_4178;
  undefined8 uStack_4170;
  undefined8 local_4168;
  undefined8 uStack_4160;
  undefined8 local_4158;
  undefined8 uStack_4150;
  undefined8 local_4148;
  undefined8 uStack_4140;
  undefined8 local_4138;
  undefined8 uStack_4130;
  undefined8 local_4128;
  undefined8 uStack_4120;
  undefined8 local_4118;
  undefined8 uStack_4110;
  undefined8 local_4108;
  undefined8 uStack_4100;
  undefined8 local_40f8;
  undefined8 uStack_40f0;
  undefined8 local_40e8;
  undefined8 uStack_40e0;
  undefined8 local_40d8;
  undefined8 uStack_40d0;
  undefined8 local_40c8;
  undefined8 uStack_40c0;
  undefined8 local_40b8;
  undefined8 uStack_40b0;
  undefined8 local_40a8;
  undefined8 uStack_40a0;
  undefined8 local_4098;
  undefined8 uStack_4090;
  undefined8 local_4088;
  undefined8 uStack_4080;
  undefined8 local_4078;
  undefined8 uStack_4070;
  undefined8 local_4068;
  undefined8 uStack_4060;
  undefined8 local_4058;
  undefined8 uStack_4050;
  undefined8 local_4048;
  undefined8 uStack_4040;
  undefined8 local_4038;
  undefined8 uStack_4030;
  undefined8 local_4028;
  undefined8 uStack_4020;
  undefined8 local_4018;
  undefined8 uStack_4010;
  undefined8 local_4008;
  undefined8 uStack_4000;
  undefined8 local_3ff8;
  undefined8 uStack_3ff0;
  undefined8 local_3fe8;
  undefined8 uStack_3fe0;
  undefined8 local_3fd8;
  undefined8 uStack_3fd0;
  undefined8 local_3fc8;
  undefined8 uStack_3fc0;
  undefined8 local_3fb8;
  undefined8 uStack_3fb0;
  undefined8 local_3fa8;
  undefined8 uStack_3fa0;
  undefined8 local_3f98;
  undefined8 uStack_3f90;
  undefined8 local_3f88;
  undefined8 uStack_3f80;
  undefined8 local_3f78;
  undefined8 uStack_3f70;
  undefined8 local_3f68;
  undefined8 uStack_3f60;
  undefined8 local_3f58;
  undefined8 uStack_3f50;
  undefined8 local_3f48;
  undefined8 uStack_3f40;
  undefined8 local_3f38;
  undefined8 uStack_3f30;
  undefined8 local_3f28;
  undefined8 uStack_3f20;
  undefined8 local_3f18;
  undefined8 uStack_3f10;
  undefined8 local_3f08;
  undefined8 uStack_3f00;
  undefined8 local_3ef8;
  undefined8 uStack_3ef0;
  undefined8 local_3ee8;
  undefined8 uStack_3ee0;
  undefined8 local_3ed8;
  undefined8 uStack_3ed0;
  undefined8 local_3ec8;
  undefined8 uStack_3ec0;
  undefined8 local_3eb8;
  undefined8 uStack_3eb0;
  undefined8 local_3ea8;
  undefined8 uStack_3ea0;
  undefined8 local_3e98;
  undefined8 uStack_3e90;
  undefined8 local_3e88;
  undefined8 uStack_3e80;
  undefined8 local_3e78;
  undefined8 uStack_3e70;
  undefined8 local_3e68;
  undefined8 uStack_3e60;
  undefined8 local_3e58;
  undefined8 uStack_3e50;
  undefined8 local_3e48;
  undefined8 uStack_3e40;
  undefined8 local_3e38;
  undefined8 uStack_3e30;
  undefined8 local_3e28;
  undefined8 uStack_3e20;
  undefined8 local_3e18;
  undefined8 uStack_3e10;
  undefined8 local_3e08;
  undefined8 uStack_3e00;
  undefined8 local_3df8;
  undefined8 uStack_3df0;
  undefined8 local_3de8;
  undefined8 uStack_3de0;
  undefined8 local_3dd8;
  undefined8 uStack_3dd0;
  undefined8 local_3dc8;
  undefined8 uStack_3dc0;
  undefined8 local_3db8;
  undefined8 uStack_3db0;
  undefined8 local_3da8;
  undefined8 uStack_3da0;
  undefined8 local_3d98;
  undefined8 uStack_3d90;
  undefined8 local_3d88;
  undefined8 uStack_3d80;
  undefined8 local_3d78;
  undefined8 uStack_3d70;
  undefined8 local_3d68;
  undefined8 uStack_3d60;
  undefined8 local_3d58;
  undefined8 uStack_3d50;
  undefined8 local_3d48;
  undefined8 uStack_3d40;
  undefined8 local_3d38;
  undefined8 uStack_3d30;
  undefined8 local_3d28;
  undefined8 uStack_3d20;
  undefined8 local_3d18;
  undefined8 uStack_3d10;
  undefined8 local_3d08;
  undefined8 uStack_3d00;
  undefined8 local_3cf8;
  undefined8 uStack_3cf0;
  undefined8 local_3ce8;
  undefined8 uStack_3ce0;
  undefined8 local_3cd8;
  undefined8 uStack_3cd0;
  undefined8 local_3cc8;
  undefined8 uStack_3cc0;
  undefined8 local_3cb8;
  undefined8 uStack_3cb0;
  undefined8 local_3ca8;
  undefined8 uStack_3ca0;
  undefined8 local_3c98;
  undefined8 uStack_3c90;
  undefined8 local_3c88;
  undefined8 uStack_3c80;
  undefined8 local_3c78;
  undefined8 uStack_3c70;
  undefined8 local_3c68;
  undefined8 uStack_3c60;
  undefined8 local_3c58;
  undefined8 uStack_3c50;
  undefined8 local_3c48;
  undefined8 uStack_3c40;
  undefined8 local_3c38;
  undefined8 uStack_3c30;
  undefined8 local_3c28;
  undefined8 uStack_3c20;
  undefined8 local_3c18;
  undefined8 uStack_3c10;
  undefined8 local_3c08;
  undefined8 uStack_3c00;
  undefined8 local_3bf8;
  undefined8 uStack_3bf0;
  undefined8 local_3be8;
  undefined8 uStack_3be0;
  undefined8 local_3bd8;
  undefined8 uStack_3bd0;
  undefined8 local_3bc8;
  undefined8 uStack_3bc0;
  undefined8 local_3bb8;
  undefined8 uStack_3bb0;
  undefined8 local_3ba8;
  undefined8 uStack_3ba0;
  undefined8 local_3b98;
  undefined8 uStack_3b90;
  undefined8 local_3b88;
  undefined8 uStack_3b80;
  undefined8 local_3b78;
  undefined8 uStack_3b70;
  undefined8 local_3b68;
  undefined8 uStack_3b60;
  undefined8 local_3b58;
  undefined8 uStack_3b50;
  undefined8 local_3b48;
  undefined8 uStack_3b40;
  undefined8 local_3b38;
  undefined8 uStack_3b30;
  undefined8 local_3b28;
  undefined8 uStack_3b20;
  undefined8 local_3b18;
  undefined8 uStack_3b10;
  undefined8 local_3b08;
  undefined8 uStack_3b00;
  undefined8 local_3af8;
  undefined8 uStack_3af0;
  undefined8 local_3ae8;
  undefined8 uStack_3ae0;
  undefined8 local_3ad8;
  undefined8 uStack_3ad0;
  undefined8 local_3ac8;
  undefined8 uStack_3ac0;
  undefined8 local_3ab8;
  undefined8 uStack_3ab0;
  undefined8 local_3aa8;
  undefined8 uStack_3aa0;
  undefined8 local_3a98;
  undefined8 uStack_3a90;
  undefined8 local_3a88;
  undefined8 uStack_3a80;
  undefined8 local_3a78;
  undefined8 uStack_3a70;
  undefined8 local_3a68;
  undefined8 uStack_3a60;
  undefined8 local_3a58;
  undefined8 uStack_3a50;
  undefined8 local_3a48;
  undefined8 uStack_3a40;
  undefined8 local_3a38;
  undefined8 uStack_3a30;
  undefined8 local_3a28;
  undefined8 uStack_3a20;
  undefined8 local_3a18;
  undefined8 uStack_3a10;
  undefined8 local_3a08;
  undefined8 uStack_3a00;
  undefined8 local_39f8;
  undefined8 uStack_39f0;
  undefined8 local_39e8;
  undefined8 uStack_39e0;
  undefined8 local_39d8;
  undefined8 uStack_39d0;
  undefined8 local_39c8;
  undefined8 uStack_39c0;
  undefined8 local_39b8;
  undefined8 uStack_39b0;
  undefined8 local_39a8;
  undefined8 uStack_39a0;
  undefined8 local_3998;
  undefined8 uStack_3990;
  undefined8 local_3988;
  undefined8 uStack_3980;
  undefined8 local_3978;
  undefined8 uStack_3970;
  undefined8 local_3968;
  undefined8 uStack_3960;
  undefined8 local_3958;
  undefined8 uStack_3950;
  undefined8 local_3948;
  undefined8 uStack_3940;
  undefined8 local_3938;
  undefined8 uStack_3930;
  undefined8 local_3928;
  undefined8 uStack_3920;
  undefined8 local_3918;
  undefined8 uStack_3910;
  undefined8 local_3908;
  undefined8 uStack_3900;
  undefined8 local_38f8;
  undefined8 uStack_38f0;
  undefined8 local_38e8;
  undefined8 uStack_38e0;
  undefined8 local_38d8;
  undefined8 uStack_38d0;
  undefined8 local_38c8;
  undefined8 uStack_38c0;
  undefined8 local_38b8;
  undefined8 uStack_38b0;
  undefined8 local_38a8;
  undefined8 uStack_38a0;
  undefined8 local_3898;
  undefined8 uStack_3890;
  undefined8 local_3888;
  undefined8 uStack_3880;
  undefined8 local_3878;
  undefined8 uStack_3870;
  undefined8 local_3868;
  undefined8 uStack_3860;
  undefined8 local_3858;
  undefined8 uStack_3850;
  undefined8 local_3848;
  undefined8 uStack_3840;
  undefined8 local_3838;
  undefined8 uStack_3830;
  undefined8 local_3828;
  undefined8 uStack_3820;
  undefined8 local_3818;
  undefined8 uStack_3810;
  undefined8 local_3808;
  undefined8 uStack_3800;
  undefined8 local_37f8;
  undefined8 uStack_37f0;
  undefined8 local_37e8;
  undefined8 uStack_37e0;
  undefined8 local_37d8;
  undefined8 uStack_37d0;
  undefined8 local_37c8;
  undefined8 uStack_37c0;
  undefined8 local_37b8;
  undefined8 uStack_37b0;
  undefined8 local_37a8;
  undefined8 uStack_37a0;
  undefined8 local_3798;
  undefined8 uStack_3790;
  undefined8 local_3788;
  undefined8 uStack_3780;
  undefined8 local_3778;
  undefined8 uStack_3770;
  undefined8 local_3768;
  undefined8 uStack_3760;
  undefined8 local_3758;
  undefined8 uStack_3750;
  undefined8 local_3748;
  undefined8 uStack_3740;
  undefined8 local_3738;
  undefined8 uStack_3730;
  undefined8 local_3728;
  undefined8 uStack_3720;
  undefined8 local_3718;
  undefined8 uStack_3710;
  undefined8 local_3708;
  undefined8 uStack_3700;
  undefined8 local_36f8;
  undefined8 uStack_36f0;
  undefined8 local_36e8;
  undefined8 uStack_36e0;
  undefined8 local_36d8;
  undefined8 uStack_36d0;
  undefined8 local_36c8;
  undefined8 uStack_36c0;
  undefined8 local_36b8;
  undefined8 uStack_36b0;
  undefined8 local_36a8;
  undefined8 uStack_36a0;
  undefined8 local_3698;
  undefined8 uStack_3690;
  undefined8 local_3688;
  undefined8 uStack_3680;
  undefined8 local_3678;
  undefined8 uStack_3670;
  undefined8 local_3668;
  undefined8 uStack_3660;
  undefined8 local_3658;
  undefined8 uStack_3650;
  undefined8 local_3648;
  undefined8 uStack_3640;
  undefined8 local_3638;
  undefined8 uStack_3630;
  undefined8 local_3628;
  undefined8 uStack_3620;
  undefined8 local_3618;
  undefined8 uStack_3610;
  undefined8 local_3608;
  undefined8 uStack_3600;
  undefined8 local_35f8;
  undefined8 uStack_35f0;
  undefined8 local_35e8;
  undefined8 uStack_35e0;
  undefined8 local_35d8;
  undefined8 uStack_35d0;
  undefined8 local_35c8;
  undefined8 uStack_35c0;
  undefined8 local_35b8;
  undefined8 uStack_35b0;
  undefined8 local_35a8;
  undefined8 uStack_35a0;
  undefined8 local_3598;
  undefined8 uStack_3590;
  undefined8 local_3588;
  undefined8 uStack_3580;
  undefined8 local_3578;
  undefined8 uStack_3570;
  undefined8 local_3568;
  undefined8 uStack_3560;
  undefined8 local_3558;
  undefined8 uStack_3550;
  undefined8 local_3548;
  undefined8 uStack_3540;
  undefined8 local_3538;
  undefined8 uStack_3530;
  undefined8 local_3528;
  undefined8 uStack_3520;
  undefined8 local_3518;
  undefined8 uStack_3510;
  undefined8 local_3508;
  undefined8 uStack_3500;
  undefined8 local_34f8;
  undefined8 uStack_34f0;
  undefined8 local_34e8;
  undefined8 uStack_34e0;
  undefined8 local_34d8;
  undefined8 uStack_34d0;
  undefined8 local_34c8;
  undefined8 uStack_34c0;
  undefined8 local_34b8;
  undefined8 uStack_34b0;
  undefined8 local_34a8;
  undefined8 uStack_34a0;
  undefined8 local_3498;
  undefined8 uStack_3490;
  undefined8 local_3488;
  undefined8 uStack_3480;
  undefined8 local_3478;
  undefined8 uStack_3470;
  undefined8 local_3468;
  undefined8 uStack_3460;
  undefined8 local_3458;
  undefined8 uStack_3450;
  undefined8 local_3448;
  undefined8 uStack_3440;
  undefined8 local_3438;
  undefined8 uStack_3430;
  undefined8 local_3428;
  undefined8 uStack_3420;
  undefined8 local_3418;
  undefined8 uStack_3410;
  undefined8 local_3408;
  undefined8 uStack_3400;
  undefined8 local_33f8;
  undefined8 uStack_33f0;
  undefined8 local_33e8;
  undefined8 uStack_33e0;
  undefined8 local_33d8;
  undefined8 uStack_33d0;
  undefined8 local_33c8;
  undefined8 uStack_33c0;
  undefined8 local_33b8;
  undefined8 uStack_33b0;
  undefined8 local_33a8;
  undefined8 uStack_33a0;
  undefined8 local_3398;
  undefined8 uStack_3390;
  undefined8 local_3388;
  undefined8 uStack_3380;
  undefined8 local_3378;
  undefined8 uStack_3370;
  undefined8 local_3368;
  undefined8 uStack_3360;
  undefined8 local_3358;
  undefined8 uStack_3350;
  undefined8 local_3348;
  undefined8 uStack_3340;
  undefined8 local_3338;
  undefined8 uStack_3330;
  undefined8 local_3328;
  undefined8 uStack_3320;
  undefined8 local_3318;
  undefined8 uStack_3310;
  undefined8 local_3308;
  undefined8 uStack_3300;
  undefined8 local_32f8;
  undefined8 uStack_32f0;
  undefined8 local_32e8;
  undefined8 uStack_32e0;
  undefined8 local_32d8;
  undefined8 uStack_32d0;
  undefined8 local_32c8;
  undefined8 uStack_32c0;
  undefined8 local_32b8;
  undefined8 uStack_32b0;
  undefined8 local_32a8;
  undefined8 uStack_32a0;
  undefined8 local_3298;
  undefined8 uStack_3290;
  undefined8 local_3288;
  undefined8 uStack_3280;
  undefined8 local_3278;
  undefined8 uStack_3270;
  undefined8 local_3268;
  undefined8 uStack_3260;
  undefined8 local_3258;
  undefined8 uStack_3250;
  undefined8 local_3248;
  undefined8 uStack_3240;
  undefined8 local_3238;
  undefined8 uStack_3230;
  undefined8 local_3228;
  undefined8 uStack_3220;
  undefined8 local_3218;
  undefined8 uStack_3210;
  undefined8 local_3208;
  undefined8 uStack_3200;
  undefined8 local_31f8;
  undefined8 uStack_31f0;
  undefined8 local_31e8;
  undefined8 uStack_31e0;
  float *local_31d0;
  undefined8 local_31c8;
  undefined8 uStack_31c0;
  float *local_31b0;
  undefined8 local_31a8;
  undefined8 uStack_31a0;
  float *local_3190;
  undefined8 local_3188;
  undefined8 uStack_3180;
  float *local_3170;
  undefined8 local_3168;
  undefined8 uStack_3160;
  float *local_3150;
  undefined8 local_3148;
  undefined8 uStack_3140;
  float *local_3130;
  undefined8 local_3128;
  undefined8 uStack_3120;
  float *local_3110;
  undefined8 local_3108;
  undefined8 uStack_3100;
  float *local_30f0;
  undefined8 local_30e8;
  undefined8 uStack_30e0;
  float *local_30d0;
  undefined8 local_30c8;
  undefined8 uStack_30c0;
  float *local_30b0;
  undefined8 local_30a8;
  undefined8 uStack_30a0;
  float *local_3090;
  undefined8 local_3088;
  undefined8 uStack_3080;
  float *local_3070;
  undefined8 local_3068;
  undefined8 uStack_3060;
  float *local_3050;
  undefined8 local_3048;
  undefined8 uStack_3040;
  float *local_3030;
  undefined8 local_3028;
  undefined8 uStack_3020;
  float *local_3010;
  undefined8 local_3008;
  undefined8 uStack_3000;
  float *local_2ff0;
  undefined8 local_2fe8;
  undefined8 uStack_2fe0;
  float *local_2fd0;
  undefined8 local_2fc8;
  undefined8 uStack_2fc0;
  float *local_2fb0;
  undefined8 local_2fa8;
  undefined8 uStack_2fa0;
  float *local_2f90;
  undefined8 local_2f88;
  undefined8 uStack_2f80;
  float *local_2f70;
  undefined8 local_2f68;
  undefined8 uStack_2f60;
  float *local_2f50;
  undefined8 local_2f48;
  undefined8 uStack_2f40;
  float local_2f38;
  float fStack_2f34;
  float fStack_2f30;
  float fStack_2f2c;
  undefined8 local_2f28;
  undefined8 uStack_2f20;
  float local_2f18;
  float fStack_2f14;
  float fStack_2f10;
  float fStack_2f0c;
  undefined8 local_2f08;
  undefined8 uStack_2f00;
  float local_2ef8;
  float fStack_2ef4;
  float fStack_2ef0;
  float fStack_2eec;
  undefined8 local_2ee8;
  undefined8 uStack_2ee0;
  float local_2ed8;
  float fStack_2ed4;
  float fStack_2ed0;
  float fStack_2ecc;
  undefined8 local_2ec8;
  undefined8 uStack_2ec0;
  float local_2eb8;
  float fStack_2eb4;
  float fStack_2eb0;
  float fStack_2eac;
  undefined8 local_2ea8;
  undefined8 uStack_2ea0;
  float local_2e98;
  float fStack_2e94;
  float fStack_2e90;
  float fStack_2e8c;
  undefined8 local_2e88;
  undefined8 uStack_2e80;
  float local_2e78;
  float fStack_2e74;
  float fStack_2e70;
  float fStack_2e6c;
  undefined8 local_2e68;
  undefined8 uStack_2e60;
  float local_2e58;
  float fStack_2e54;
  float fStack_2e50;
  float fStack_2e4c;
  undefined8 local_2e48;
  undefined8 uStack_2e40;
  float local_2e38;
  float fStack_2e34;
  float fStack_2e30;
  float fStack_2e2c;
  undefined8 local_2e28;
  undefined8 uStack_2e20;
  float local_2e18;
  float fStack_2e14;
  float fStack_2e10;
  float fStack_2e0c;
  undefined8 local_2e08;
  undefined8 uStack_2e00;
  float local_2df8;
  float fStack_2df4;
  float fStack_2df0;
  float fStack_2dec;
  undefined8 local_2de8;
  undefined8 uStack_2de0;
  float local_2dd8;
  float fStack_2dd4;
  float fStack_2dd0;
  float fStack_2dcc;
  undefined8 local_2dc8;
  undefined8 uStack_2dc0;
  float local_2db8;
  float fStack_2db4;
  float fStack_2db0;
  float fStack_2dac;
  undefined8 local_2da8;
  undefined8 uStack_2da0;
  float local_2d98;
  float fStack_2d94;
  float fStack_2d90;
  float fStack_2d8c;
  undefined8 local_2d88;
  undefined8 uStack_2d80;
  float local_2d78;
  float fStack_2d74;
  float fStack_2d70;
  float fStack_2d6c;
  undefined8 local_2d68;
  undefined8 uStack_2d60;
  float local_2d58;
  float fStack_2d54;
  float fStack_2d50;
  float fStack_2d4c;
  undefined8 local_2d48;
  undefined8 uStack_2d40;
  float local_2d38;
  float fStack_2d34;
  float fStack_2d30;
  float fStack_2d2c;
  undefined8 local_2d28;
  undefined8 uStack_2d20;
  float local_2d18;
  float fStack_2d14;
  float fStack_2d10;
  float fStack_2d0c;
  undefined8 local_2d08;
  undefined8 uStack_2d00;
  float local_2cf8;
  float fStack_2cf4;
  float fStack_2cf0;
  float fStack_2cec;
  undefined8 local_2ce8;
  undefined8 uStack_2ce0;
  float local_2cd8;
  float fStack_2cd4;
  float fStack_2cd0;
  float fStack_2ccc;
  undefined8 local_2cc8;
  undefined8 uStack_2cc0;
  float local_2cb8;
  float fStack_2cb4;
  float fStack_2cb0;
  float fStack_2cac;
  undefined8 local_2ca8;
  undefined8 uStack_2ca0;
  float local_2c98;
  float fStack_2c94;
  float fStack_2c90;
  float fStack_2c8c;
  undefined8 local_2c88;
  undefined8 uStack_2c80;
  float local_2c78;
  float fStack_2c74;
  float fStack_2c70;
  float fStack_2c6c;
  undefined8 local_2c68;
  undefined8 uStack_2c60;
  float local_2c58;
  float fStack_2c54;
  float fStack_2c50;
  float fStack_2c4c;
  undefined8 local_2c48;
  undefined8 uStack_2c40;
  float local_2c38;
  float fStack_2c34;
  float fStack_2c30;
  float fStack_2c2c;
  undefined8 local_2c28;
  undefined8 uStack_2c20;
  float local_2c18;
  float fStack_2c14;
  float fStack_2c10;
  float fStack_2c0c;
  undefined8 local_2c08;
  undefined8 uStack_2c00;
  float local_2bf8;
  float fStack_2bf4;
  float fStack_2bf0;
  float fStack_2bec;
  undefined8 local_2be8;
  undefined8 uStack_2be0;
  float local_2bd8;
  float fStack_2bd4;
  float fStack_2bd0;
  float fStack_2bcc;
  undefined8 local_2bc8;
  undefined8 uStack_2bc0;
  float local_2bb8;
  float fStack_2bb4;
  float fStack_2bb0;
  float fStack_2bac;
  undefined8 local_2ba8;
  undefined8 uStack_2ba0;
  float local_2b98;
  float fStack_2b94;
  float fStack_2b90;
  float fStack_2b8c;
  undefined8 local_2b88;
  undefined8 uStack_2b80;
  float local_2b78;
  float fStack_2b74;
  float fStack_2b70;
  float fStack_2b6c;
  undefined8 local_2b68;
  undefined8 uStack_2b60;
  float local_2b58;
  float fStack_2b54;
  float fStack_2b50;
  float fStack_2b4c;
  undefined8 local_2b48;
  undefined8 uStack_2b40;
  float local_2b38;
  float fStack_2b34;
  float fStack_2b30;
  float fStack_2b2c;
  undefined8 local_2b28;
  undefined8 uStack_2b20;
  float local_2b18;
  float fStack_2b14;
  float fStack_2b10;
  float fStack_2b0c;
  undefined8 local_2b08;
  undefined8 uStack_2b00;
  float local_2af8;
  float fStack_2af4;
  float fStack_2af0;
  float fStack_2aec;
  undefined8 local_2ae8;
  undefined8 uStack_2ae0;
  float local_2ad8;
  float fStack_2ad4;
  float fStack_2ad0;
  float fStack_2acc;
  undefined8 local_2ac8;
  undefined8 uStack_2ac0;
  float local_2ab8;
  float fStack_2ab4;
  float fStack_2ab0;
  float fStack_2aac;
  undefined8 local_2aa8;
  undefined8 uStack_2aa0;
  float local_2a98;
  float fStack_2a94;
  float fStack_2a90;
  float fStack_2a8c;
  undefined8 local_2a88;
  undefined8 uStack_2a80;
  float local_2a78;
  float fStack_2a74;
  float fStack_2a70;
  float fStack_2a6c;
  undefined8 local_2a68;
  undefined8 uStack_2a60;
  float local_2a58;
  float fStack_2a54;
  float fStack_2a50;
  float fStack_2a4c;
  undefined8 local_2a48;
  undefined8 uStack_2a40;
  float local_2a38;
  float fStack_2a34;
  float fStack_2a30;
  float fStack_2a2c;
  undefined8 local_2a28;
  undefined8 uStack_2a20;
  float local_2a18;
  float fStack_2a14;
  float fStack_2a10;
  float fStack_2a0c;
  undefined8 local_2a08;
  undefined8 uStack_2a00;
  float local_29f8;
  float fStack_29f4;
  float fStack_29f0;
  float fStack_29ec;
  undefined8 local_29e8;
  undefined8 uStack_29e0;
  float local_29d8;
  float fStack_29d4;
  float fStack_29d0;
  float fStack_29cc;
  undefined8 local_29c8;
  undefined8 uStack_29c0;
  float local_29b8;
  float fStack_29b4;
  float fStack_29b0;
  float fStack_29ac;
  undefined8 local_29a8;
  undefined8 uStack_29a0;
  float local_2998;
  float fStack_2994;
  float fStack_2990;
  float fStack_298c;
  undefined8 local_2988;
  undefined8 uStack_2980;
  float local_2978;
  float fStack_2974;
  float fStack_2970;
  float fStack_296c;
  undefined8 local_2968;
  undefined8 uStack_2960;
  float local_2958;
  float fStack_2954;
  float fStack_2950;
  float fStack_294c;
  undefined8 local_2948;
  undefined8 uStack_2940;
  float local_2938;
  float fStack_2934;
  float fStack_2930;
  float fStack_292c;
  undefined8 local_2928;
  undefined8 uStack_2920;
  float local_2918;
  float fStack_2914;
  float fStack_2910;
  float fStack_290c;
  undefined8 local_2908;
  undefined8 uStack_2900;
  float local_28f8;
  float fStack_28f4;
  float fStack_28f0;
  float fStack_28ec;
  undefined8 local_28e8;
  undefined8 uStack_28e0;
  float local_28d8;
  float fStack_28d4;
  float fStack_28d0;
  float fStack_28cc;
  undefined8 local_28c8;
  undefined8 uStack_28c0;
  float local_28b8;
  float fStack_28b4;
  float fStack_28b0;
  float fStack_28ac;
  undefined8 local_28a8;
  undefined8 uStack_28a0;
  float local_2898;
  float fStack_2894;
  float fStack_2890;
  float fStack_288c;
  undefined8 local_2888;
  undefined8 uStack_2880;
  float local_2878;
  float fStack_2874;
  float fStack_2870;
  float fStack_286c;
  undefined8 local_2868;
  undefined8 uStack_2860;
  float local_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  undefined8 local_2848;
  undefined8 uStack_2840;
  float local_2838;
  float fStack_2834;
  float fStack_2830;
  float fStack_282c;
  undefined8 local_2828;
  undefined8 uStack_2820;
  float local_2818;
  float fStack_2814;
  float fStack_2810;
  float fStack_280c;
  undefined8 local_2808;
  undefined8 uStack_2800;
  float local_27f8;
  float fStack_27f4;
  float fStack_27f0;
  float fStack_27ec;
  undefined8 local_27e8;
  undefined8 uStack_27e0;
  float local_27d8;
  float fStack_27d4;
  float fStack_27d0;
  float fStack_27cc;
  undefined8 local_27c8;
  undefined8 uStack_27c0;
  float local_27b8;
  float fStack_27b4;
  float fStack_27b0;
  float fStack_27ac;
  undefined8 local_27a8;
  undefined8 uStack_27a0;
  float local_2798;
  float fStack_2794;
  float fStack_2790;
  float fStack_278c;
  undefined8 local_2788;
  undefined8 uStack_2780;
  float local_2778;
  float fStack_2774;
  float fStack_2770;
  float fStack_276c;
  undefined8 local_2768;
  undefined8 uStack_2760;
  float local_2758;
  float fStack_2754;
  float fStack_2750;
  float fStack_274c;
  undefined8 local_2748;
  undefined8 uStack_2740;
  float local_2738;
  float fStack_2734;
  float fStack_2730;
  float fStack_272c;
  undefined8 local_2728;
  undefined8 uStack_2720;
  float local_2718;
  float fStack_2714;
  float fStack_2710;
  float fStack_270c;
  undefined8 local_2708;
  undefined8 uStack_2700;
  float local_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  undefined8 local_26e8;
  undefined8 uStack_26e0;
  float local_26d8;
  float fStack_26d4;
  float fStack_26d0;
  float fStack_26cc;
  undefined8 local_26c8;
  undefined8 uStack_26c0;
  float local_26b8;
  float fStack_26b4;
  float fStack_26b0;
  float fStack_26ac;
  undefined8 local_26a8;
  undefined8 uStack_26a0;
  float local_2698;
  float fStack_2694;
  float fStack_2690;
  float fStack_268c;
  undefined8 local_2688;
  undefined8 uStack_2680;
  float local_2678;
  float fStack_2674;
  float fStack_2670;
  float fStack_266c;
  undefined8 local_2668;
  undefined8 uStack_2660;
  undefined1 local_2658 [16];
  undefined8 local_2648;
  undefined8 uStack_2640;
  float local_2638;
  float fStack_2634;
  float fStack_2630;
  float fStack_262c;
  undefined8 local_2628;
  undefined8 uStack_2620;
  float local_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  undefined8 local_2608;
  undefined8 uStack_2600;
  float local_25f8;
  float fStack_25f4;
  float fStack_25f0;
  float fStack_25ec;
  undefined8 local_25e8;
  undefined8 uStack_25e0;
  float local_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  undefined8 local_25c8;
  undefined8 uStack_25c0;
  float local_25b8;
  float fStack_25b4;
  float fStack_25b0;
  float fStack_25ac;
  undefined8 local_25a8;
  undefined8 uStack_25a0;
  float local_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  undefined8 local_2588;
  undefined8 uStack_2580;
  float local_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  undefined8 local_2568;
  undefined8 uStack_2560;
  float local_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  undefined8 local_2548;
  undefined8 uStack_2540;
  float local_2538;
  float fStack_2534;
  float fStack_2530;
  float fStack_252c;
  undefined8 local_2528;
  undefined8 uStack_2520;
  float local_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  undefined8 local_2508;
  undefined8 uStack_2500;
  float local_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  undefined8 local_24e8;
  undefined8 uStack_24e0;
  float local_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  undefined8 local_24c8;
  undefined8 uStack_24c0;
  float local_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  undefined8 local_24a8;
  undefined8 uStack_24a0;
  float local_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  undefined8 local_2488;
  undefined8 uStack_2480;
  float local_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  undefined8 local_2468;
  undefined8 uStack_2460;
  float local_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  undefined8 local_2448;
  undefined8 uStack_2440;
  float local_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  undefined8 local_2428;
  undefined8 uStack_2420;
  float local_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  undefined8 local_2408;
  undefined8 uStack_2400;
  float local_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  undefined8 local_23e8;
  undefined8 uStack_23e0;
  float local_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  undefined8 local_23c8;
  undefined8 uStack_23c0;
  float local_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  undefined8 local_23a8;
  undefined8 uStack_23a0;
  float local_2398;
  float fStack_2394;
  float fStack_2390;
  float fStack_238c;
  undefined8 local_2388;
  undefined8 uStack_2380;
  float local_2378;
  float fStack_2374;
  float fStack_2370;
  float fStack_236c;
  undefined8 local_2368;
  undefined8 uStack_2360;
  float local_2358;
  float fStack_2354;
  float fStack_2350;
  float fStack_234c;
  undefined8 local_2348;
  undefined8 uStack_2340;
  float local_2338;
  float fStack_2334;
  float fStack_2330;
  float fStack_232c;
  undefined8 local_2328;
  undefined8 uStack_2320;
  float local_2318;
  float fStack_2314;
  float fStack_2310;
  float fStack_230c;
  undefined8 local_2308;
  undefined8 uStack_2300;
  float local_22f8;
  float fStack_22f4;
  float fStack_22f0;
  float fStack_22ec;
  undefined8 local_22e8;
  undefined8 uStack_22e0;
  float local_22d8;
  float fStack_22d4;
  float fStack_22d0;
  float fStack_22cc;
  undefined8 local_22c8;
  undefined8 uStack_22c0;
  float local_22b8;
  float fStack_22b4;
  float fStack_22b0;
  float fStack_22ac;
  undefined8 local_22a8;
  undefined8 uStack_22a0;
  float local_2298;
  float fStack_2294;
  float fStack_2290;
  float fStack_228c;
  undefined8 local_2288;
  undefined8 uStack_2280;
  float local_2278;
  float fStack_2274;
  float fStack_2270;
  float fStack_226c;
  undefined8 local_2268;
  undefined8 uStack_2260;
  float local_2258;
  float fStack_2254;
  float fStack_2250;
  float fStack_224c;
  undefined8 local_2248;
  undefined8 uStack_2240;
  float local_2238;
  float fStack_2234;
  float fStack_2230;
  float fStack_222c;
  undefined8 local_2228;
  undefined8 uStack_2220;
  float local_2218;
  float fStack_2214;
  float fStack_2210;
  float fStack_220c;
  undefined8 local_2208;
  undefined8 uStack_2200;
  float local_21f8;
  float fStack_21f4;
  float fStack_21f0;
  float fStack_21ec;
  undefined8 local_21e8;
  undefined8 uStack_21e0;
  undefined1 local_21d8 [16];
  undefined8 local_21c8;
  undefined8 uStack_21c0;
  float local_21b8;
  float fStack_21b4;
  float fStack_21b0;
  float fStack_21ac;
  undefined8 local_21a8;
  undefined8 uStack_21a0;
  float local_2198;
  float fStack_2194;
  float fStack_2190;
  float fStack_218c;
  undefined8 local_2188;
  undefined8 uStack_2180;
  float local_2178;
  float fStack_2174;
  float fStack_2170;
  float fStack_216c;
  undefined8 local_2168;
  undefined8 uStack_2160;
  float local_2158;
  float fStack_2154;
  float fStack_2150;
  float fStack_214c;
  undefined8 local_2148;
  undefined8 uStack_2140;
  float local_2138;
  float fStack_2134;
  float fStack_2130;
  float fStack_212c;
  undefined8 local_2128;
  undefined8 uStack_2120;
  float local_2118;
  float fStack_2114;
  float fStack_2110;
  float fStack_210c;
  undefined8 local_2108;
  undefined8 uStack_2100;
  float local_20f8;
  float fStack_20f4;
  float fStack_20f0;
  float fStack_20ec;
  undefined8 local_20e8;
  undefined8 uStack_20e0;
  float local_20d8;
  float fStack_20d4;
  float fStack_20d0;
  float fStack_20cc;
  undefined8 local_20c8;
  undefined8 uStack_20c0;
  float local_20b8;
  float fStack_20b4;
  float fStack_20b0;
  float fStack_20ac;
  undefined8 local_20a8;
  undefined8 uStack_20a0;
  float local_2098;
  float fStack_2094;
  float fStack_2090;
  float fStack_208c;
  undefined8 local_2088;
  undefined8 uStack_2080;
  float local_2078;
  float fStack_2074;
  float fStack_2070;
  float fStack_206c;
  undefined8 local_2068;
  undefined8 uStack_2060;
  float local_2058;
  float fStack_2054;
  float fStack_2050;
  float fStack_204c;
  undefined8 local_2048;
  undefined8 uStack_2040;
  float local_2038;
  float fStack_2034;
  float fStack_2030;
  float fStack_202c;
  undefined8 local_2028;
  undefined8 uStack_2020;
  float local_2018;
  float fStack_2014;
  float fStack_2010;
  float fStack_200c;
  undefined8 local_2008;
  undefined8 uStack_2000;
  float local_1ff8;
  float fStack_1ff4;
  float fStack_1ff0;
  float fStack_1fec;
  undefined8 local_1fe8;
  undefined8 uStack_1fe0;
  float local_1fd8;
  float fStack_1fd4;
  float fStack_1fd0;
  float fStack_1fcc;
  undefined8 local_1fc8;
  undefined8 uStack_1fc0;
  float local_1fb8;
  float fStack_1fb4;
  float fStack_1fb0;
  float fStack_1fac;
  undefined8 local_1fa8;
  undefined8 uStack_1fa0;
  undefined1 local_1f98 [16];
  undefined8 local_1f88;
  undefined8 uStack_1f80;
  float local_1f78;
  float fStack_1f74;
  float fStack_1f70;
  float fStack_1f6c;
  undefined8 local_1f68;
  undefined8 uStack_1f60;
  float local_1f58;
  float fStack_1f54;
  float fStack_1f50;
  float fStack_1f4c;
  undefined8 local_1f48;
  undefined8 uStack_1f40;
  float local_1f38;
  float fStack_1f34;
  float fStack_1f30;
  float fStack_1f2c;
  undefined8 local_1f28;
  undefined8 uStack_1f20;
  float local_1f18;
  float fStack_1f14;
  float fStack_1f10;
  float fStack_1f0c;
  undefined8 local_1f08;
  undefined8 uStack_1f00;
  float local_1ef8;
  float fStack_1ef4;
  float fStack_1ef0;
  float fStack_1eec;
  undefined8 local_1ee8;
  undefined8 uStack_1ee0;
  float local_1ed8;
  float fStack_1ed4;
  float fStack_1ed0;
  float fStack_1ecc;
  undefined8 local_1ec8;
  undefined8 uStack_1ec0;
  float local_1eb8;
  float fStack_1eb4;
  float fStack_1eb0;
  float fStack_1eac;
  undefined8 local_1ea8;
  undefined8 uStack_1ea0;
  float local_1e98;
  float fStack_1e94;
  float fStack_1e90;
  float fStack_1e8c;
  undefined8 local_1e88;
  undefined8 uStack_1e80;
  float local_1e78;
  float fStack_1e74;
  float fStack_1e70;
  float fStack_1e6c;
  undefined8 local_1e68;
  undefined8 uStack_1e60;
  float local_1e58;
  float fStack_1e54;
  float fStack_1e50;
  float fStack_1e4c;
  undefined8 local_1e48;
  undefined8 uStack_1e40;
  float local_1e38;
  float fStack_1e34;
  float fStack_1e30;
  float fStack_1e2c;
  undefined8 local_1e28;
  undefined8 uStack_1e20;
  float local_1e18;
  float fStack_1e14;
  float fStack_1e10;
  float fStack_1e0c;
  undefined8 local_1e08;
  undefined8 uStack_1e00;
  float local_1df8;
  float fStack_1df4;
  float fStack_1df0;
  float fStack_1dec;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  float local_1dd8;
  float fStack_1dd4;
  float fStack_1dd0;
  float fStack_1dcc;
  undefined8 local_1dc8;
  undefined8 uStack_1dc0;
  float local_1db8;
  float fStack_1db4;
  float fStack_1db0;
  float fStack_1dac;
  undefined8 local_1da8;
  undefined8 uStack_1da0;
  float local_1d98;
  float fStack_1d94;
  float fStack_1d90;
  float fStack_1d8c;
  undefined8 local_1d88;
  undefined8 uStack_1d80;
  float local_1d78;
  float fStack_1d74;
  float fStack_1d70;
  float fStack_1d6c;
  undefined8 local_1d68;
  undefined8 uStack_1d60;
  float local_1d58;
  float fStack_1d54;
  float fStack_1d50;
  float fStack_1d4c;
  undefined8 local_1d48;
  undefined8 uStack_1d40;
  float local_1d38;
  float fStack_1d34;
  float fStack_1d30;
  float fStack_1d2c;
  undefined8 local_1d28;
  undefined8 uStack_1d20;
  float local_1d18;
  float fStack_1d14;
  float fStack_1d10;
  float fStack_1d0c;
  undefined8 local_1d08;
  undefined8 uStack_1d00;
  float local_1cf8;
  float fStack_1cf4;
  float fStack_1cf0;
  float fStack_1cec;
  undefined8 local_1ce8;
  undefined8 uStack_1ce0;
  float local_1cd8;
  float fStack_1cd4;
  float fStack_1cd0;
  float fStack_1ccc;
  undefined8 local_1cc8;
  undefined8 uStack_1cc0;
  float local_1cb8;
  float fStack_1cb4;
  float fStack_1cb0;
  float fStack_1cac;
  undefined8 local_1ca8;
  undefined8 uStack_1ca0;
  float local_1c98;
  float fStack_1c94;
  float fStack_1c90;
  float fStack_1c8c;
  undefined8 local_1c88;
  undefined8 uStack_1c80;
  float local_1c78;
  float fStack_1c74;
  float fStack_1c70;
  float fStack_1c6c;
  undefined8 local_1c68;
  undefined8 uStack_1c60;
  float local_1c58;
  float fStack_1c54;
  float fStack_1c50;
  float fStack_1c4c;
  undefined8 local_1c48;
  undefined8 uStack_1c40;
  float local_1c38;
  float fStack_1c34;
  float fStack_1c30;
  float fStack_1c2c;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  float local_1c18;
  float fStack_1c14;
  float fStack_1c10;
  float fStack_1c0c;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  float local_1bf8;
  float fStack_1bf4;
  float fStack_1bf0;
  float fStack_1bec;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  float local_1bd8;
  float fStack_1bd4;
  float fStack_1bd0;
  float fStack_1bcc;
  undefined8 local_1bc8;
  undefined8 uStack_1bc0;
  float local_1bb8;
  float fStack_1bb4;
  float fStack_1bb0;
  float fStack_1bac;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  float local_1b98;
  float fStack_1b94;
  float fStack_1b90;
  float fStack_1b8c;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  float local_1b78;
  float fStack_1b74;
  float fStack_1b70;
  float fStack_1b6c;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  float local_1b58;
  float fStack_1b54;
  float fStack_1b50;
  float fStack_1b4c;
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  float local_1b38;
  float fStack_1b34;
  float fStack_1b30;
  float fStack_1b2c;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined1 local_1b18 [16];
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  float local_1af8;
  float fStack_1af4;
  float fStack_1af0;
  float fStack_1aec;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  float local_1ad8;
  float fStack_1ad4;
  float fStack_1ad0;
  float fStack_1acc;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  float local_1ab8;
  float fStack_1ab4;
  float fStack_1ab0;
  float fStack_1aac;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  float local_1a98;
  float fStack_1a94;
  float fStack_1a90;
  float fStack_1a8c;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  float local_1a78;
  float fStack_1a74;
  float fStack_1a70;
  float fStack_1a6c;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  float local_1a58;
  float fStack_1a54;
  float fStack_1a50;
  float fStack_1a4c;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  float local_1a38;
  float fStack_1a34;
  float fStack_1a30;
  float fStack_1a2c;
  undefined8 local_1a28;
  undefined8 uStack_1a20;
  float local_1a18;
  float fStack_1a14;
  float fStack_1a10;
  float fStack_1a0c;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  float local_19f8;
  float fStack_19f4;
  float fStack_19f0;
  float fStack_19ec;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  float local_19d8;
  float fStack_19d4;
  float fStack_19d0;
  float fStack_19cc;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  float local_19b8;
  float fStack_19b4;
  float fStack_19b0;
  float fStack_19ac;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  float local_1998;
  float fStack_1994;
  float fStack_1990;
  float fStack_198c;
  undefined8 local_1988;
  undefined8 uStack_1980;
  float local_1978;
  float fStack_1974;
  float fStack_1970;
  float fStack_196c;
  undefined8 local_1968;
  undefined8 uStack_1960;
  float local_1958;
  float fStack_1954;
  float fStack_1950;
  float fStack_194c;
  undefined8 local_1948;
  undefined8 uStack_1940;
  float local_1938;
  float fStack_1934;
  float fStack_1930;
  float fStack_192c;
  undefined8 local_1928;
  undefined8 uStack_1920;
  float local_1918;
  float fStack_1914;
  float fStack_1910;
  float fStack_190c;
  undefined8 local_1908;
  undefined8 uStack_1900;
  float local_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined1 local_18d8 [16];
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  float local_18b8;
  float fStack_18b4;
  float fStack_18b0;
  float fStack_18ac;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  float local_1898;
  float fStack_1894;
  float fStack_1890;
  float fStack_188c;
  undefined8 local_1888;
  undefined8 uStack_1880;
  float local_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  undefined8 local_1868;
  undefined8 uStack_1860;
  float local_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  undefined8 local_1848;
  undefined8 uStack_1840;
  float local_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  undefined8 local_1828;
  undefined8 uStack_1820;
  float local_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  undefined8 local_1808;
  undefined8 uStack_1800;
  float local_17f8;
  float fStack_17f4;
  float fStack_17f0;
  float fStack_17ec;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  float local_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  undefined1 local_17b8 [16];
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined8 local_1698;
  undefined8 uStack_1690;
  undefined8 local_1688;
  undefined8 uStack_1680;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  undefined8 uStack_1630;
  undefined8 local_1628;
  undefined8 uStack_1620;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 local_1538;
  undefined8 uStack_1530;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_6134 = *(int *)(in_RDI + 0x38);
  local_6138 = *(int *)(in_RSI + 0x2c);
  local_613c = *(int *)(in_RSI + 0x30);
  local_6140 = *(int *)(in_RSI + 0x38);
  local_6148 = Mat::operator_cast_to_float_(in_RCX);
  local_614c = local_6140 >> 1;
  local_6150 = local_614c << 1;
  for (local_6154 = 0; local_6154 < local_614c; local_6154 = local_6154 + 1) {
    local_6158 = local_6154 * 2;
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffff87ac,in_stack_ffffffffffff87a8),
                 (int)in_stack_ffffffffffff87a4);
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffff87ac,in_stack_ffffffffffff87a8),
                 (int)in_stack_ffffffffffff87a4);
    if (local_6148 == (float *)0x0) {
      local_56f4 = 0;
      local_5708 = 0;
      uStack_5704 = 0;
      uStack_5700 = 0;
      uStack_56fc = 0;
      local_6c68 = 0;
      uStack_6c60 = 0;
    }
    else {
      local_5560 = local_6148 + (local_6158 << 2);
      local_6c68 = *(undefined8 *)local_5560;
      uStack_6c60 = *(undefined8 *)(local_5560 + 2);
    }
    local_6208 = local_6c68;
    uStack_6200 = uStack_6c60;
    if (local_6148 == (float *)0x0) {
      local_570c = 0;
      local_5728 = 0;
      uStack_5724 = 0;
      uStack_5720 = 0;
      uStack_571c = 0;
      local_6c78 = 0;
      uStack_6c70 = 0;
    }
    else {
      local_5568 = local_6148 + (local_6158 + 1) * 4;
      local_6c78 = *(undefined8 *)local_5568;
      uStack_6c70 = *(undefined8 *)(local_5568 + 2);
    }
    local_6218 = local_6c78;
    uStack_6210 = uStack_6c70;
    _v[1] = in_stack_ffffffffffff8794;
    _v[0] = in_stack_ffffffffffff8790;
    _v[2] = in_stack_ffffffffffff8798;
    _v[3] = in_stack_ffffffffffff879c;
    Mat::fill<float__vector(4)>
              ((Mat *)CONCAT44(in_stack_ffffffffffff87a4,in_stack_ffffffffffff87a0),_v);
    _v_00[1] = in_stack_ffffffffffff8794;
    _v_00[0] = in_stack_ffffffffffff8790;
    _v_00[2] = in_stack_ffffffffffff8798;
    _v_00[3] = in_stack_ffffffffffff879c;
    Mat::fill<float__vector(4)>
              ((Mat *)CONCAT44(in_stack_ffffffffffff87a4,in_stack_ffffffffffff87a0),_v_00);
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffff87ac,in_stack_ffffffffffff87a8),
                 (int)in_stack_ffffffffffff87a4);
    pfVar37 = Mat::operator_cast_to_float_(&local_6268);
    Mat::~Mat((Mat *)0x33993c);
    local_6220 = pfVar37;
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffff87ac,in_stack_ffffffffffff87a8),
                 (int)in_stack_ffffffffffff87a4);
    pfVar37 = Mat::operator_cast_to_float_(&local_62b8);
    Mat::~Mat((Mat *)0x339990);
    local_6270 = pfVar37;
    for (local_62bc = 0; local_62bc < local_6134; local_62bc = local_62bc + 1) {
      local_62c8 = Mat::operator_cast_to_float_(&local_61a0);
      local_62d0 = Mat::operator_cast_to_float_(&local_61e8);
      Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffff87ac,in_stack_ffffffffffff87a8),
                   (int)in_stack_ffffffffffff87a4);
      local_6320 = Mat::row(&local_6318,0);
      local_6328 = Mat::row(&local_6318,1);
      local_6330 = Mat::row(&local_6318,2);
      local_5570 = local_6220;
      local_6348 = *(undefined8 *)local_6220;
      uStack_6340 = *(undefined8 *)(local_6220 + 2);
      local_5578 = local_6220 + 4;
      local_6358 = *(undefined8 *)local_5578;
      uStack_6350 = *(undefined8 *)(local_6220 + 6);
      local_5580 = local_6220 + 8;
      local_6368 = *(undefined8 *)local_5580;
      uStack_6360 = *(undefined8 *)(local_6220 + 10);
      local_5588 = local_6220 + 0xc;
      local_6378 = *(undefined8 *)local_5588;
      uStack_6370 = *(undefined8 *)(local_6220 + 0xe);
      local_5590 = local_6220 + 0x10;
      local_6388 = *(undefined8 *)local_5590;
      uStack_6380 = *(undefined8 *)(local_6220 + 0x12);
      local_5598 = local_6220 + 0x14;
      local_6398 = *(undefined8 *)local_5598;
      uStack_6390 = *(undefined8 *)(local_6220 + 0x16);
      local_55a0 = local_6220 + 0x18;
      local_63a8 = *(undefined8 *)local_55a0;
      uStack_63a0 = *(undefined8 *)(local_6220 + 0x1a);
      local_55a8 = local_6220 + 0x1c;
      local_63b8 = *(undefined8 *)local_55a8;
      uStack_63b0 = *(undefined8 *)(local_6220 + 0x1e);
      local_55b0 = local_6220 + 0x20;
      local_63c8 = *(undefined8 *)local_55b0;
      uStack_63c0 = *(undefined8 *)(local_6220 + 0x22);
      local_55b8 = local_6270;
      local_63d8 = *(undefined8 *)local_6270;
      uStack_63d0 = *(undefined8 *)(local_6270 + 2);
      local_55c0 = local_6270 + 4;
      local_63e8 = *(undefined8 *)local_55c0;
      uStack_63e0 = *(undefined8 *)(local_6270 + 6);
      local_55c8 = local_6270 + 8;
      local_63f8 = *(undefined8 *)local_55c8;
      uStack_63f0 = *(undefined8 *)(local_6270 + 10);
      local_55d0 = local_6270 + 0xc;
      local_6408 = *(undefined8 *)local_55d0;
      uStack_6400 = *(undefined8 *)(local_6270 + 0xe);
      local_55d8 = local_6270 + 0x10;
      local_6418 = *(undefined8 *)local_55d8;
      uStack_6410 = *(undefined8 *)(local_6270 + 0x12);
      local_55e0 = local_6270 + 0x14;
      local_6428 = *(undefined8 *)local_55e0;
      uStack_6420 = *(undefined8 *)(local_6270 + 0x16);
      local_55e8 = local_6270 + 0x18;
      local_6438 = *(undefined8 *)local_55e8;
      uStack_6430 = *(undefined8 *)(local_6270 + 0x1a);
      local_55f0 = local_6270 + 0x1c;
      local_6448 = *(undefined8 *)local_55f0;
      uStack_6440 = *(undefined8 *)(local_6270 + 0x1e);
      local_55f8 = local_6270 + 0x20;
      local_6458 = *(undefined8 *)local_55f8;
      uStack_6450 = *(undefined8 *)(local_6270 + 0x22);
      for (local_645c = 0; local_645c < local_613c; local_645c = local_645c + 1) {
        local_6460 = 0;
        while( true ) {
          uVar36 = uStack_1580;
          uVar35 = local_1588;
          uVar34 = uStack_15a0;
          uVar33 = local_15a8;
          uVar32 = uStack_15c0;
          uVar31 = local_15c8;
          uVar30 = uStack_15e0;
          uVar29 = local_15e8;
          uVar28 = uStack_1600;
          uVar27 = local_1608;
          uVar26 = uStack_1620;
          uVar25 = local_1628;
          uVar24 = uStack_1640;
          uVar23 = local_1648;
          uVar22 = uStack_1660;
          uVar21 = local_1668;
          uVar20 = uStack_1680;
          uVar19 = local_1688;
          uVar18 = uStack_16a0;
          uVar17 = local_16a8;
          uVar16 = uStack_16c0;
          uVar15 = local_16c8;
          uVar14 = uStack_16e0;
          uVar13 = local_16e8;
          uVar12 = uStack_1700;
          uVar11 = local_1708;
          uVar10 = uStack_1720;
          uVar9 = local_1728;
          uVar8 = uStack_1740;
          uVar7 = local_1748;
          uVar6 = uStack_1760;
          uVar5 = local_1768;
          uVar4 = uStack_1780;
          uVar3 = local_1788;
          uVar2 = uStack_17a0;
          uVar1 = local_17a8;
          local_17a8._0_4_ = (float)local_6348;
          local_17a8._4_4_ = (float)((ulong)local_6348 >> 0x20);
          uStack_17a0._0_4_ = (float)uStack_6340;
          uStack_17a0._4_4_ = (float)((ulong)uStack_6340 >> 0x20);
          local_1788._0_4_ = (float)local_6358;
          local_1788._4_4_ = (float)((ulong)local_6358 >> 0x20);
          uStack_1780._0_4_ = (float)uStack_6350;
          uStack_1780._4_4_ = (float)((ulong)uStack_6350 >> 0x20);
          local_1768._0_4_ = (float)local_6368;
          local_1768._4_4_ = (float)((ulong)local_6368 >> 0x20);
          uStack_1760._0_4_ = (float)uStack_6360;
          uStack_1760._4_4_ = (float)((ulong)uStack_6360 >> 0x20);
          local_1748._0_4_ = (float)local_6378;
          local_1748._4_4_ = (float)((ulong)local_6378 >> 0x20);
          uStack_1740._0_4_ = (float)uStack_6370;
          uStack_1740._4_4_ = (float)((ulong)uStack_6370 >> 0x20);
          local_1728._0_4_ = (float)local_6388;
          local_1728._4_4_ = (float)((ulong)local_6388 >> 0x20);
          uStack_1720._0_4_ = (float)uStack_6380;
          uStack_1720._4_4_ = (float)((ulong)uStack_6380 >> 0x20);
          local_1708._0_4_ = (float)local_6398;
          local_1708._4_4_ = (float)((ulong)local_6398 >> 0x20);
          uStack_1700._0_4_ = (float)uStack_6390;
          uStack_1700._4_4_ = (float)((ulong)uStack_6390 >> 0x20);
          local_16e8._0_4_ = (float)local_63a8;
          local_16e8._4_4_ = (float)((ulong)local_63a8 >> 0x20);
          uStack_16e0._0_4_ = (float)uStack_63a0;
          uStack_16e0._4_4_ = (float)((ulong)uStack_63a0 >> 0x20);
          local_16c8._0_4_ = (float)local_63b8;
          local_16c8._4_4_ = (float)((ulong)local_63b8 >> 0x20);
          uStack_16c0._0_4_ = (float)uStack_63b0;
          uStack_16c0._4_4_ = (float)((ulong)uStack_63b0 >> 0x20);
          local_16a8._0_4_ = (float)local_63c8;
          local_16a8._4_4_ = (float)((ulong)local_63c8 >> 0x20);
          uStack_16a0._0_4_ = (float)uStack_63c0;
          uStack_16a0._4_4_ = (float)((ulong)uStack_63c0 >> 0x20);
          local_1688._0_4_ = (float)local_63d8;
          local_1688._4_4_ = (float)((ulong)local_63d8 >> 0x20);
          uStack_1680._0_4_ = (float)uStack_63d0;
          uStack_1680._4_4_ = (float)((ulong)uStack_63d0 >> 0x20);
          local_1668._0_4_ = (float)local_63e8;
          local_1668._4_4_ = (float)((ulong)local_63e8 >> 0x20);
          uStack_1660._0_4_ = (float)uStack_63e0;
          uStack_1660._4_4_ = (float)((ulong)uStack_63e0 >> 0x20);
          local_1648._0_4_ = (float)local_63f8;
          local_1648._4_4_ = (float)((ulong)local_63f8 >> 0x20);
          uStack_1640._0_4_ = (float)uStack_63f0;
          uStack_1640._4_4_ = (float)((ulong)uStack_63f0 >> 0x20);
          local_1628._0_4_ = (float)local_6408;
          local_1628._4_4_ = (float)((ulong)local_6408 >> 0x20);
          uStack_1620._0_4_ = (float)uStack_6400;
          uStack_1620._4_4_ = (float)((ulong)uStack_6400 >> 0x20);
          local_1608._0_4_ = (float)local_6418;
          local_1608._4_4_ = (float)((ulong)local_6418 >> 0x20);
          uStack_1600._0_4_ = (float)uStack_6410;
          uStack_1600._4_4_ = (float)((ulong)uStack_6410 >> 0x20);
          local_15e8._0_4_ = (float)local_6428;
          local_15e8._4_4_ = (float)((ulong)local_6428 >> 0x20);
          uStack_15e0._0_4_ = (float)uStack_6420;
          uStack_15e0._4_4_ = (float)((ulong)uStack_6420 >> 0x20);
          local_15c8._0_4_ = (float)local_6438;
          local_15c8._4_4_ = (float)((ulong)local_6438 >> 0x20);
          uStack_15c0._0_4_ = (float)uStack_6430;
          uStack_15c0._4_4_ = (float)((ulong)uStack_6430 >> 0x20);
          local_15a8._0_4_ = (float)local_6448;
          local_15a8._4_4_ = (float)((ulong)local_6448 >> 0x20);
          uStack_15a0._0_4_ = (float)uStack_6440;
          uStack_15a0._4_4_ = (float)((ulong)uStack_6440 >> 0x20);
          local_1588._0_4_ = (float)local_6458;
          local_1588._4_4_ = (float)((ulong)local_6458 >> 0x20);
          uStack_1580._0_4_ = (float)uStack_6450;
          uStack_1580._4_4_ = (float)((ulong)uStack_6450 >> 0x20);
          if (local_6138 <= local_6460 + 3) break;
          local_5600 = local_62c8;
          local_3218 = *(undefined8 *)local_62c8;
          uStack_3210 = *(undefined8 *)(local_62c8 + 2);
          local_5608 = local_62d0;
          local_33c8 = *(undefined8 *)local_62d0;
          uStack_33c0 = *(undefined8 *)(local_62d0 + 2);
          local_5748 = *local_6320;
          local_6498 = CONCAT44(local_5748,local_5748);
          uStack_6490 = CONCAT44(local_5748,local_5748);
          local_5768 = local_6320[1];
          local_64a8 = CONCAT44(local_5768,local_5768);
          uStack_64a0 = CONCAT44(local_5768,local_5768);
          local_5788 = local_6320[2];
          local_64b8 = CONCAT44(local_5788,local_5788);
          uStack_64b0 = CONCAT44(local_5788,local_5788);
          local_57a8 = *local_6328;
          local_64c8 = CONCAT44(local_57a8,local_57a8);
          uStack_64c0 = CONCAT44(local_57a8,local_57a8);
          local_57c8 = local_6328[1];
          local_64d8 = CONCAT44(local_57c8,local_57c8);
          uStack_64d0 = CONCAT44(local_57c8,local_57c8);
          local_57e8 = local_6328[2];
          local_64e8 = CONCAT44(local_57e8,local_57e8);
          uStack_64e0 = CONCAT44(local_57e8,local_57e8);
          local_5808 = *local_6330;
          local_64f8 = CONCAT44(local_5808,local_5808);
          uStack_64f0 = CONCAT44(local_5808,local_5808);
          local_5828 = local_6330[1];
          local_6508 = CONCAT44(local_5828,local_5828);
          uStack_6500 = CONCAT44(local_5828,local_5828);
          local_5848 = local_6330[2];
          local_6518 = CONCAT44(local_5848,local_5848);
          uStack_6510 = CONCAT44(local_5848,local_5848);
          local_2f38 = local_5748 * (float)local_17a8;
          fStack_2f34 = local_5748 * local_17a8._4_4_;
          fStack_2f30 = local_5748 * (float)uStack_17a0;
          fStack_2f2c = local_5748 * uStack_17a0._4_4_;
          local_2f48._0_4_ = (float)local_3218;
          local_2f48._4_4_ = (float)((ulong)local_3218 >> 0x20);
          uStack_2f40._0_4_ = (float)uStack_3210;
          uStack_2f40._4_4_ = (float)((ulong)uStack_3210 >> 0x20);
          local_3248 = CONCAT44(fStack_2f34 + local_2f48._4_4_,local_2f38 + (float)local_2f48);
          uStack_3240 = CONCAT44(fStack_2f2c + uStack_2f40._4_4_,fStack_2f30 + (float)uStack_2f40);
          local_2f18 = local_5768 * (float)local_1788;
          fStack_2f14 = local_5768 * local_1788._4_4_;
          fStack_2f10 = local_5768 * (float)uStack_1780;
          fStack_2f0c = local_5768 * uStack_1780._4_4_;
          fVar38 = local_2f18 + local_2f38 + (float)local_2f48;
          fVar39 = fStack_2f14 + fStack_2f34 + local_2f48._4_4_;
          fVar40 = fStack_2f10 + fStack_2f30 + (float)uStack_2f40;
          fVar41 = fStack_2f0c + fStack_2f2c + uStack_2f40._4_4_;
          local_3278 = CONCAT44(fVar39,fVar38);
          uStack_3270 = CONCAT44(fVar41,fVar40);
          local_2ef8 = local_5788 * (float)local_1768;
          fStack_2ef4 = local_5788 * local_1768._4_4_;
          fStack_2ef0 = local_5788 * (float)uStack_1760;
          fStack_2eec = local_5788 * uStack_1760._4_4_;
          fVar38 = local_2ef8 + fVar38;
          fVar39 = fStack_2ef4 + fVar39;
          fVar40 = fStack_2ef0 + fVar40;
          fVar41 = fStack_2eec + fVar41;
          local_32a8 = CONCAT44(fVar39,fVar38);
          uStack_32a0 = CONCAT44(fVar41,fVar40);
          local_2ed8 = local_57a8 * (float)local_1748;
          fStack_2ed4 = local_57a8 * local_1748._4_4_;
          fStack_2ed0 = local_57a8 * (float)uStack_1740;
          fStack_2ecc = local_57a8 * uStack_1740._4_4_;
          fVar38 = local_2ed8 + fVar38;
          fVar39 = fStack_2ed4 + fVar39;
          fVar40 = fStack_2ed0 + fVar40;
          fVar41 = fStack_2ecc + fVar41;
          local_32d8 = CONCAT44(fVar39,fVar38);
          uStack_32d0 = CONCAT44(fVar41,fVar40);
          local_2eb8 = local_57c8 * (float)local_1728;
          fStack_2eb4 = local_57c8 * local_1728._4_4_;
          fStack_2eb0 = local_57c8 * (float)uStack_1720;
          fStack_2eac = local_57c8 * uStack_1720._4_4_;
          fVar38 = local_2eb8 + fVar38;
          fVar39 = fStack_2eb4 + fVar39;
          fVar40 = fStack_2eb0 + fVar40;
          fVar41 = fStack_2eac + fVar41;
          local_3308 = CONCAT44(fVar39,fVar38);
          uStack_3300 = CONCAT44(fVar41,fVar40);
          local_2e98 = local_57e8 * (float)local_1708;
          fStack_2e94 = local_57e8 * local_1708._4_4_;
          fStack_2e90 = local_57e8 * (float)uStack_1700;
          fStack_2e8c = local_57e8 * uStack_1700._4_4_;
          fVar38 = local_2e98 + fVar38;
          fVar39 = fStack_2e94 + fVar39;
          fVar40 = fStack_2e90 + fVar40;
          fVar41 = fStack_2e8c + fVar41;
          local_3338 = CONCAT44(fVar39,fVar38);
          uStack_3330 = CONCAT44(fVar41,fVar40);
          local_2e78 = local_5808 * (float)local_16e8;
          fStack_2e74 = local_5808 * local_16e8._4_4_;
          fStack_2e70 = local_5808 * (float)uStack_16e0;
          fStack_2e6c = local_5808 * uStack_16e0._4_4_;
          fVar38 = local_2e78 + fVar38;
          fVar39 = fStack_2e74 + fVar39;
          fVar40 = fStack_2e70 + fVar40;
          fVar41 = fStack_2e6c + fVar41;
          local_3368 = CONCAT44(fVar39,fVar38);
          uStack_3360 = CONCAT44(fVar41,fVar40);
          local_2e58 = local_5828 * (float)local_16c8;
          fStack_2e54 = local_5828 * local_16c8._4_4_;
          fStack_2e50 = local_5828 * (float)uStack_16c0;
          fStack_2e4c = local_5828 * uStack_16c0._4_4_;
          fVar38 = local_2e58 + fVar38;
          fVar39 = fStack_2e54 + fVar39;
          fVar40 = fStack_2e50 + fVar40;
          fVar41 = fStack_2e4c + fVar41;
          local_3398 = CONCAT44(fVar39,fVar38);
          uStack_3390 = CONCAT44(fVar41,fVar40);
          local_2e38 = local_5848 * (float)local_16a8;
          fStack_2e34 = local_5848 * local_16a8._4_4_;
          fStack_2e30 = local_5848 * (float)uStack_16a0;
          fStack_2e2c = local_5848 * uStack_16a0._4_4_;
          local_6478 = CONCAT44(fStack_2e34 + fVar39,local_2e38 + fVar38);
          uStack_6470 = CONCAT44(fStack_2e2c + fVar41,fStack_2e30 + fVar40);
          local_2e18 = local_5748 * (float)local_1688;
          fStack_2e14 = local_5748 * local_1688._4_4_;
          fStack_2e10 = local_5748 * (float)uStack_1680;
          fStack_2e0c = local_5748 * uStack_1680._4_4_;
          local_2e28._0_4_ = (float)local_33c8;
          local_2e28._4_4_ = (float)((ulong)local_33c8 >> 0x20);
          uStack_2e20._0_4_ = (float)uStack_33c0;
          uStack_2e20._4_4_ = (float)((ulong)uStack_33c0 >> 0x20);
          local_33f8 = CONCAT44(fStack_2e14 + local_2e28._4_4_,local_2e18 + (float)local_2e28);
          uStack_33f0 = CONCAT44(fStack_2e0c + uStack_2e20._4_4_,fStack_2e10 + (float)uStack_2e20);
          local_2df8 = local_5768 * (float)local_1668;
          fStack_2df4 = local_5768 * local_1668._4_4_;
          fStack_2df0 = local_5768 * (float)uStack_1660;
          fStack_2dec = local_5768 * uStack_1660._4_4_;
          fVar38 = local_2df8 + local_2e18 + (float)local_2e28;
          fVar39 = fStack_2df4 + fStack_2e14 + local_2e28._4_4_;
          fVar40 = fStack_2df0 + fStack_2e10 + (float)uStack_2e20;
          fVar41 = fStack_2dec + fStack_2e0c + uStack_2e20._4_4_;
          local_3428 = CONCAT44(fVar39,fVar38);
          uStack_3420 = CONCAT44(fVar41,fVar40);
          local_2dd8 = local_5788 * (float)local_1648;
          fStack_2dd4 = local_5788 * local_1648._4_4_;
          fStack_2dd0 = local_5788 * (float)uStack_1640;
          fStack_2dcc = local_5788 * uStack_1640._4_4_;
          fVar38 = local_2dd8 + fVar38;
          fVar39 = fStack_2dd4 + fVar39;
          fVar40 = fStack_2dd0 + fVar40;
          fVar41 = fStack_2dcc + fVar41;
          local_3458 = CONCAT44(fVar39,fVar38);
          uStack_3450 = CONCAT44(fVar41,fVar40);
          local_2db8 = local_57a8 * (float)local_1628;
          fStack_2db4 = local_57a8 * local_1628._4_4_;
          fStack_2db0 = local_57a8 * (float)uStack_1620;
          fStack_2dac = local_57a8 * uStack_1620._4_4_;
          fVar38 = local_2db8 + fVar38;
          fVar39 = fStack_2db4 + fVar39;
          fVar40 = fStack_2db0 + fVar40;
          fVar41 = fStack_2dac + fVar41;
          local_3488 = CONCAT44(fVar39,fVar38);
          uStack_3480 = CONCAT44(fVar41,fVar40);
          local_2d98 = local_57c8 * (float)local_1608;
          fStack_2d94 = local_57c8 * local_1608._4_4_;
          fStack_2d90 = local_57c8 * (float)uStack_1600;
          fStack_2d8c = local_57c8 * uStack_1600._4_4_;
          fVar38 = local_2d98 + fVar38;
          fVar39 = fStack_2d94 + fVar39;
          fVar40 = fStack_2d90 + fVar40;
          fVar41 = fStack_2d8c + fVar41;
          local_34b8 = CONCAT44(fVar39,fVar38);
          uStack_34b0 = CONCAT44(fVar41,fVar40);
          local_2d78 = local_57e8 * (float)local_15e8;
          fStack_2d74 = local_57e8 * local_15e8._4_4_;
          fStack_2d70 = local_57e8 * (float)uStack_15e0;
          fStack_2d6c = local_57e8 * uStack_15e0._4_4_;
          fVar38 = local_2d78 + fVar38;
          fVar39 = fStack_2d74 + fVar39;
          fVar40 = fStack_2d70 + fVar40;
          fVar41 = fStack_2d6c + fVar41;
          local_34e8 = CONCAT44(fVar39,fVar38);
          uStack_34e0 = CONCAT44(fVar41,fVar40);
          local_2d58 = local_5808 * (float)local_15c8;
          fStack_2d54 = local_5808 * local_15c8._4_4_;
          fStack_2d50 = local_5808 * (float)uStack_15c0;
          fStack_2d4c = local_5808 * uStack_15c0._4_4_;
          fVar38 = local_2d58 + fVar38;
          fVar39 = fStack_2d54 + fVar39;
          fVar40 = fStack_2d50 + fVar40;
          fVar41 = fStack_2d4c + fVar41;
          local_3518 = CONCAT44(fVar39,fVar38);
          uStack_3510 = CONCAT44(fVar41,fVar40);
          local_2d38 = local_5828 * (float)local_15a8;
          fStack_2d34 = local_5828 * local_15a8._4_4_;
          fStack_2d30 = local_5828 * (float)uStack_15a0;
          fStack_2d2c = local_5828 * uStack_15a0._4_4_;
          fVar38 = local_2d38 + fVar38;
          fVar39 = fStack_2d34 + fVar39;
          fVar40 = fStack_2d30 + fVar40;
          fVar41 = fStack_2d2c + fVar41;
          local_3548 = CONCAT44(fVar39,fVar38);
          uStack_3540 = CONCAT44(fVar41,fVar40);
          local_2d18 = local_5848 * (float)local_1588;
          fStack_2d14 = local_5848 * local_1588._4_4_;
          fStack_2d10 = local_5848 * (float)uStack_1580;
          fStack_2d0c = local_5848 * uStack_1580._4_4_;
          local_6488 = CONCAT44(fStack_2d14 + fVar39,local_2d18 + fVar38);
          uStack_6480 = CONCAT44(fStack_2d0c + fVar41,fStack_2d10 + fVar40);
          local_2f50 = local_62c8;
          *(undefined8 *)local_62c8 = local_6478;
          *(undefined8 *)(local_62c8 + 2) = uStack_6470;
          local_2f70 = local_62d0;
          *(undefined8 *)local_62d0 = local_6488;
          *(undefined8 *)(local_62d0 + 2) = uStack_6480;
          local_5610 = local_62c8 + 4;
          local_3578 = *(undefined8 *)local_5610;
          uStack_3570 = *(undefined8 *)(local_62c8 + 6);
          local_5618 = local_62d0 + 4;
          local_3728 = *(undefined8 *)local_5618;
          uStack_3720 = *(undefined8 *)(local_62d0 + 6);
          local_5868 = local_6320[3];
          local_6548 = CONCAT44(local_5868,local_5868);
          uStack_6540 = CONCAT44(local_5868,local_5868);
          local_5888 = local_6328[3];
          local_6558 = CONCAT44(local_5888,local_5888);
          uStack_6550 = CONCAT44(local_5888,local_5888);
          local_58a8 = local_6330[3];
          local_6568 = CONCAT44(local_58a8,local_58a8);
          uStack_6560 = CONCAT44(local_58a8,local_58a8);
          local_2cf8 = local_5768 * (float)local_17a8;
          fStack_2cf4 = local_5768 * local_17a8._4_4_;
          fStack_2cf0 = local_5768 * (float)uStack_17a0;
          fStack_2cec = local_5768 * uStack_17a0._4_4_;
          local_2d08._0_4_ = (float)local_3578;
          local_2d08._4_4_ = (float)((ulong)local_3578 >> 0x20);
          uStack_2d00._0_4_ = (float)uStack_3570;
          uStack_2d00._4_4_ = (float)((ulong)uStack_3570 >> 0x20);
          local_35a8 = CONCAT44(fStack_2cf4 + local_2d08._4_4_,local_2cf8 + (float)local_2d08);
          uStack_35a0 = CONCAT44(fStack_2cec + uStack_2d00._4_4_,fStack_2cf0 + (float)uStack_2d00);
          local_2cd8 = local_5788 * (float)local_1788;
          fStack_2cd4 = local_5788 * local_1788._4_4_;
          fStack_2cd0 = local_5788 * (float)uStack_1780;
          fStack_2ccc = local_5788 * uStack_1780._4_4_;
          fVar38 = local_2cd8 + local_2cf8 + (float)local_2d08;
          fVar39 = fStack_2cd4 + fStack_2cf4 + local_2d08._4_4_;
          fVar40 = fStack_2cd0 + fStack_2cf0 + (float)uStack_2d00;
          fVar41 = fStack_2ccc + fStack_2cec + uStack_2d00._4_4_;
          local_35d8 = CONCAT44(fVar39,fVar38);
          uStack_35d0 = CONCAT44(fVar41,fVar40);
          local_2cb8 = local_5868 * (float)local_1768;
          fStack_2cb4 = local_5868 * local_1768._4_4_;
          fStack_2cb0 = local_5868 * (float)uStack_1760;
          fStack_2cac = local_5868 * uStack_1760._4_4_;
          fVar38 = local_2cb8 + fVar38;
          fVar39 = fStack_2cb4 + fVar39;
          fVar40 = fStack_2cb0 + fVar40;
          fVar41 = fStack_2cac + fVar41;
          local_3608 = CONCAT44(fVar39,fVar38);
          uStack_3600 = CONCAT44(fVar41,fVar40);
          local_2c98 = local_57c8 * (float)local_1748;
          fStack_2c94 = local_57c8 * local_1748._4_4_;
          fStack_2c90 = local_57c8 * (float)uStack_1740;
          fStack_2c8c = local_57c8 * uStack_1740._4_4_;
          fVar38 = local_2c98 + fVar38;
          fVar39 = fStack_2c94 + fVar39;
          fVar40 = fStack_2c90 + fVar40;
          fVar41 = fStack_2c8c + fVar41;
          local_3638 = CONCAT44(fVar39,fVar38);
          uStack_3630 = CONCAT44(fVar41,fVar40);
          local_2c78 = local_57e8 * (float)local_1728;
          fStack_2c74 = local_57e8 * local_1728._4_4_;
          fStack_2c70 = local_57e8 * (float)uStack_1720;
          fStack_2c6c = local_57e8 * uStack_1720._4_4_;
          fVar38 = local_2c78 + fVar38;
          fVar39 = fStack_2c74 + fVar39;
          fVar40 = fStack_2c70 + fVar40;
          fVar41 = fStack_2c6c + fVar41;
          local_3668 = CONCAT44(fVar39,fVar38);
          uStack_3660 = CONCAT44(fVar41,fVar40);
          local_2c58 = local_5888 * (float)local_1708;
          fStack_2c54 = local_5888 * local_1708._4_4_;
          fStack_2c50 = local_5888 * (float)uStack_1700;
          fStack_2c4c = local_5888 * uStack_1700._4_4_;
          fVar38 = local_2c58 + fVar38;
          fVar39 = fStack_2c54 + fVar39;
          fVar40 = fStack_2c50 + fVar40;
          fVar41 = fStack_2c4c + fVar41;
          local_3698 = CONCAT44(fVar39,fVar38);
          uStack_3690 = CONCAT44(fVar41,fVar40);
          local_2c38 = local_5828 * (float)local_16e8;
          fStack_2c34 = local_5828 * local_16e8._4_4_;
          fStack_2c30 = local_5828 * (float)uStack_16e0;
          fStack_2c2c = local_5828 * uStack_16e0._4_4_;
          fVar38 = local_2c38 + fVar38;
          fVar39 = fStack_2c34 + fVar39;
          fVar40 = fStack_2c30 + fVar40;
          fVar41 = fStack_2c2c + fVar41;
          local_36c8 = CONCAT44(fVar39,fVar38);
          uStack_36c0 = CONCAT44(fVar41,fVar40);
          local_2c18 = local_5848 * (float)local_16c8;
          fStack_2c14 = local_5848 * local_16c8._4_4_;
          fStack_2c10 = local_5848 * (float)uStack_16c0;
          fStack_2c0c = local_5848 * uStack_16c0._4_4_;
          fVar38 = local_2c18 + fVar38;
          fVar39 = fStack_2c14 + fVar39;
          fVar40 = fStack_2c10 + fVar40;
          fVar41 = fStack_2c0c + fVar41;
          local_36f8 = CONCAT44(fVar39,fVar38);
          uStack_36f0 = CONCAT44(fVar41,fVar40);
          local_2bf8 = local_58a8 * (float)local_16a8;
          fStack_2bf4 = local_58a8 * local_16a8._4_4_;
          fStack_2bf0 = local_58a8 * (float)uStack_16a0;
          fStack_2bec = local_58a8 * uStack_16a0._4_4_;
          local_6528 = CONCAT44(fStack_2bf4 + fVar39,local_2bf8 + fVar38);
          uStack_6520 = CONCAT44(fStack_2bec + fVar41,fStack_2bf0 + fVar40);
          local_2bd8 = local_5768 * (float)local_1688;
          fStack_2bd4 = local_5768 * local_1688._4_4_;
          fStack_2bd0 = local_5768 * (float)uStack_1680;
          fStack_2bcc = local_5768 * uStack_1680._4_4_;
          local_2be8._0_4_ = (float)local_3728;
          local_2be8._4_4_ = (float)((ulong)local_3728 >> 0x20);
          uStack_2be0._0_4_ = (float)uStack_3720;
          uStack_2be0._4_4_ = (float)((ulong)uStack_3720 >> 0x20);
          local_3758 = CONCAT44(fStack_2bd4 + local_2be8._4_4_,local_2bd8 + (float)local_2be8);
          uStack_3750 = CONCAT44(fStack_2bcc + uStack_2be0._4_4_,fStack_2bd0 + (float)uStack_2be0);
          local_2bb8 = local_5788 * (float)local_1668;
          fStack_2bb4 = local_5788 * local_1668._4_4_;
          fStack_2bb0 = local_5788 * (float)uStack_1660;
          fStack_2bac = local_5788 * uStack_1660._4_4_;
          fVar38 = local_2bb8 + local_2bd8 + (float)local_2be8;
          fVar39 = fStack_2bb4 + fStack_2bd4 + local_2be8._4_4_;
          fVar40 = fStack_2bb0 + fStack_2bd0 + (float)uStack_2be0;
          fVar41 = fStack_2bac + fStack_2bcc + uStack_2be0._4_4_;
          local_3788 = CONCAT44(fVar39,fVar38);
          uStack_3780 = CONCAT44(fVar41,fVar40);
          local_2b98 = local_5868 * (float)local_1648;
          fStack_2b94 = local_5868 * local_1648._4_4_;
          fStack_2b90 = local_5868 * (float)uStack_1640;
          fStack_2b8c = local_5868 * uStack_1640._4_4_;
          fVar38 = local_2b98 + fVar38;
          fVar39 = fStack_2b94 + fVar39;
          fVar40 = fStack_2b90 + fVar40;
          fVar41 = fStack_2b8c + fVar41;
          local_37b8 = CONCAT44(fVar39,fVar38);
          uStack_37b0 = CONCAT44(fVar41,fVar40);
          local_2b78 = local_57c8 * (float)local_1628;
          fStack_2b74 = local_57c8 * local_1628._4_4_;
          fStack_2b70 = local_57c8 * (float)uStack_1620;
          fStack_2b6c = local_57c8 * uStack_1620._4_4_;
          fVar38 = local_2b78 + fVar38;
          fVar39 = fStack_2b74 + fVar39;
          fVar40 = fStack_2b70 + fVar40;
          fVar41 = fStack_2b6c + fVar41;
          local_37e8 = CONCAT44(fVar39,fVar38);
          uStack_37e0 = CONCAT44(fVar41,fVar40);
          local_2b58 = local_57e8 * (float)local_1608;
          fStack_2b54 = local_57e8 * local_1608._4_4_;
          fStack_2b50 = local_57e8 * (float)uStack_1600;
          fStack_2b4c = local_57e8 * uStack_1600._4_4_;
          fVar38 = local_2b58 + fVar38;
          fVar39 = fStack_2b54 + fVar39;
          fVar40 = fStack_2b50 + fVar40;
          fVar41 = fStack_2b4c + fVar41;
          local_3818 = CONCAT44(fVar39,fVar38);
          uStack_3810 = CONCAT44(fVar41,fVar40);
          local_2b38 = local_5888 * (float)local_15e8;
          fStack_2b34 = local_5888 * local_15e8._4_4_;
          fStack_2b30 = local_5888 * (float)uStack_15e0;
          fStack_2b2c = local_5888 * uStack_15e0._4_4_;
          fVar38 = local_2b38 + fVar38;
          fVar39 = fStack_2b34 + fVar39;
          fVar40 = fStack_2b30 + fVar40;
          fVar41 = fStack_2b2c + fVar41;
          local_3848 = CONCAT44(fVar39,fVar38);
          uStack_3840 = CONCAT44(fVar41,fVar40);
          local_2b18 = local_5828 * (float)local_15c8;
          fStack_2b14 = local_5828 * local_15c8._4_4_;
          fStack_2b10 = local_5828 * (float)uStack_15c0;
          fStack_2b0c = local_5828 * uStack_15c0._4_4_;
          fVar38 = local_2b18 + fVar38;
          fVar39 = fStack_2b14 + fVar39;
          fVar40 = fStack_2b10 + fVar40;
          fVar41 = fStack_2b0c + fVar41;
          local_3878 = CONCAT44(fVar39,fVar38);
          uStack_3870 = CONCAT44(fVar41,fVar40);
          local_2af8 = local_5848 * (float)local_15a8;
          fStack_2af4 = local_5848 * local_15a8._4_4_;
          fStack_2af0 = local_5848 * (float)uStack_15a0;
          fStack_2aec = local_5848 * uStack_15a0._4_4_;
          fVar38 = local_2af8 + fVar38;
          fVar39 = fStack_2af4 + fVar39;
          fVar40 = fStack_2af0 + fVar40;
          fVar41 = fStack_2aec + fVar41;
          local_38a8 = CONCAT44(fVar39,fVar38);
          uStack_38a0 = CONCAT44(fVar41,fVar40);
          local_2ad8 = local_58a8 * (float)local_1588;
          fStack_2ad4 = local_58a8 * local_1588._4_4_;
          fStack_2ad0 = local_58a8 * (float)uStack_1580;
          fStack_2acc = local_58a8 * uStack_1580._4_4_;
          local_6538 = CONCAT44(fStack_2ad4 + fVar39,local_2ad8 + fVar38);
          uStack_6530 = CONCAT44(fStack_2acc + fVar41,fStack_2ad0 + fVar40);
          local_2f90 = local_62c8 + 4;
          *(undefined8 *)local_2f90 = local_6528;
          *(undefined8 *)(local_62c8 + 6) = uStack_6520;
          local_2fb0 = local_62d0 + 4;
          *(undefined8 *)local_2fb0 = local_6538;
          *(undefined8 *)(local_62d0 + 6) = uStack_6530;
          local_5620 = local_62c8 + 8;
          local_38d8 = *(undefined8 *)local_5620;
          uStack_38d0 = *(undefined8 *)(local_62c8 + 10);
          local_5628 = local_62d0 + 8;
          local_3a88 = *(undefined8 *)local_5628;
          uStack_3a80 = *(undefined8 *)(local_62d0 + 10);
          local_58c8 = local_6320[4];
          local_6598 = CONCAT44(local_58c8,local_58c8);
          uStack_6590 = CONCAT44(local_58c8,local_58c8);
          local_58e8 = local_6328[4];
          local_65a8 = CONCAT44(local_58e8,local_58e8);
          uStack_65a0 = CONCAT44(local_58e8,local_58e8);
          local_5908 = local_6330[4];
          local_65b8 = CONCAT44(local_5908,local_5908);
          uStack_65b0 = CONCAT44(local_5908,local_5908);
          local_2ab8 = local_5788 * (float)local_17a8;
          fStack_2ab4 = local_5788 * local_17a8._4_4_;
          fStack_2ab0 = local_5788 * (float)uStack_17a0;
          fStack_2aac = local_5788 * uStack_17a0._4_4_;
          local_2ac8._0_4_ = (float)local_38d8;
          local_2ac8._4_4_ = (float)((ulong)local_38d8 >> 0x20);
          uStack_2ac0._0_4_ = (float)uStack_38d0;
          uStack_2ac0._4_4_ = (float)((ulong)uStack_38d0 >> 0x20);
          local_3908 = CONCAT44(fStack_2ab4 + local_2ac8._4_4_,local_2ab8 + (float)local_2ac8);
          uStack_3900 = CONCAT44(fStack_2aac + uStack_2ac0._4_4_,fStack_2ab0 + (float)uStack_2ac0);
          local_2a98 = local_5868 * (float)local_1788;
          fStack_2a94 = local_5868 * local_1788._4_4_;
          fStack_2a90 = local_5868 * (float)uStack_1780;
          fStack_2a8c = local_5868 * uStack_1780._4_4_;
          fVar38 = local_2a98 + local_2ab8 + (float)local_2ac8;
          fVar39 = fStack_2a94 + fStack_2ab4 + local_2ac8._4_4_;
          fVar40 = fStack_2a90 + fStack_2ab0 + (float)uStack_2ac0;
          fVar41 = fStack_2a8c + fStack_2aac + uStack_2ac0._4_4_;
          local_3938 = CONCAT44(fVar39,fVar38);
          uStack_3930 = CONCAT44(fVar41,fVar40);
          local_2a78 = local_58c8 * (float)local_1768;
          fStack_2a74 = local_58c8 * local_1768._4_4_;
          fStack_2a70 = local_58c8 * (float)uStack_1760;
          fStack_2a6c = local_58c8 * uStack_1760._4_4_;
          fVar38 = local_2a78 + fVar38;
          fVar39 = fStack_2a74 + fVar39;
          fVar40 = fStack_2a70 + fVar40;
          fVar41 = fStack_2a6c + fVar41;
          local_3968 = CONCAT44(fVar39,fVar38);
          uStack_3960 = CONCAT44(fVar41,fVar40);
          local_2a58 = local_57e8 * (float)local_1748;
          fStack_2a54 = local_57e8 * local_1748._4_4_;
          fStack_2a50 = local_57e8 * (float)uStack_1740;
          fStack_2a4c = local_57e8 * uStack_1740._4_4_;
          fVar38 = local_2a58 + fVar38;
          fVar39 = fStack_2a54 + fVar39;
          fVar40 = fStack_2a50 + fVar40;
          fVar41 = fStack_2a4c + fVar41;
          local_3998 = CONCAT44(fVar39,fVar38);
          uStack_3990 = CONCAT44(fVar41,fVar40);
          local_2a38 = local_5888 * (float)local_1728;
          fStack_2a34 = local_5888 * local_1728._4_4_;
          fStack_2a30 = local_5888 * (float)uStack_1720;
          fStack_2a2c = local_5888 * uStack_1720._4_4_;
          fVar38 = local_2a38 + fVar38;
          fVar39 = fStack_2a34 + fVar39;
          fVar40 = fStack_2a30 + fVar40;
          fVar41 = fStack_2a2c + fVar41;
          local_39c8 = CONCAT44(fVar39,fVar38);
          uStack_39c0 = CONCAT44(fVar41,fVar40);
          local_2a18 = local_58e8 * (float)local_1708;
          fStack_2a14 = local_58e8 * local_1708._4_4_;
          fStack_2a10 = local_58e8 * (float)uStack_1700;
          fStack_2a0c = local_58e8 * uStack_1700._4_4_;
          fVar38 = local_2a18 + fVar38;
          fVar39 = fStack_2a14 + fVar39;
          fVar40 = fStack_2a10 + fVar40;
          fVar41 = fStack_2a0c + fVar41;
          local_39f8 = CONCAT44(fVar39,fVar38);
          uStack_39f0 = CONCAT44(fVar41,fVar40);
          local_29f8 = local_5848 * (float)local_16e8;
          fStack_29f4 = local_5848 * local_16e8._4_4_;
          fStack_29f0 = local_5848 * (float)uStack_16e0;
          fStack_29ec = local_5848 * uStack_16e0._4_4_;
          fVar38 = local_29f8 + fVar38;
          fVar39 = fStack_29f4 + fVar39;
          fVar40 = fStack_29f0 + fVar40;
          fVar41 = fStack_29ec + fVar41;
          local_3a28 = CONCAT44(fVar39,fVar38);
          uStack_3a20 = CONCAT44(fVar41,fVar40);
          local_29d8 = local_58a8 * (float)local_16c8;
          fStack_29d4 = local_58a8 * local_16c8._4_4_;
          fStack_29d0 = local_58a8 * (float)uStack_16c0;
          fStack_29cc = local_58a8 * uStack_16c0._4_4_;
          fVar38 = local_29d8 + fVar38;
          fVar39 = fStack_29d4 + fVar39;
          fVar40 = fStack_29d0 + fVar40;
          fVar41 = fStack_29cc + fVar41;
          local_3a58 = CONCAT44(fVar39,fVar38);
          uStack_3a50 = CONCAT44(fVar41,fVar40);
          local_29b8 = local_5908 * (float)local_16a8;
          fStack_29b4 = local_5908 * local_16a8._4_4_;
          fStack_29b0 = local_5908 * (float)uStack_16a0;
          fStack_29ac = local_5908 * uStack_16a0._4_4_;
          local_6578 = CONCAT44(fStack_29b4 + fVar39,local_29b8 + fVar38);
          uStack_6570 = CONCAT44(fStack_29ac + fVar41,fStack_29b0 + fVar40);
          local_2998 = local_5788 * (float)local_1688;
          fStack_2994 = local_5788 * local_1688._4_4_;
          fStack_2990 = local_5788 * (float)uStack_1680;
          fStack_298c = local_5788 * uStack_1680._4_4_;
          local_29a8._0_4_ = (float)local_3a88;
          local_29a8._4_4_ = (float)((ulong)local_3a88 >> 0x20);
          uStack_29a0._0_4_ = (float)uStack_3a80;
          uStack_29a0._4_4_ = (float)((ulong)uStack_3a80 >> 0x20);
          local_3ab8 = CONCAT44(fStack_2994 + local_29a8._4_4_,local_2998 + (float)local_29a8);
          uStack_3ab0 = CONCAT44(fStack_298c + uStack_29a0._4_4_,fStack_2990 + (float)uStack_29a0);
          local_2978 = local_5868 * (float)local_1668;
          fStack_2974 = local_5868 * local_1668._4_4_;
          fStack_2970 = local_5868 * (float)uStack_1660;
          fStack_296c = local_5868 * uStack_1660._4_4_;
          fVar38 = local_2978 + local_2998 + (float)local_29a8;
          fVar39 = fStack_2974 + fStack_2994 + local_29a8._4_4_;
          fVar40 = fStack_2970 + fStack_2990 + (float)uStack_29a0;
          fVar41 = fStack_296c + fStack_298c + uStack_29a0._4_4_;
          local_3ae8 = CONCAT44(fVar39,fVar38);
          uStack_3ae0 = CONCAT44(fVar41,fVar40);
          local_2958 = local_58c8 * (float)local_1648;
          fStack_2954 = local_58c8 * local_1648._4_4_;
          fStack_2950 = local_58c8 * (float)uStack_1640;
          fStack_294c = local_58c8 * uStack_1640._4_4_;
          fVar38 = local_2958 + fVar38;
          fVar39 = fStack_2954 + fVar39;
          fVar40 = fStack_2950 + fVar40;
          fVar41 = fStack_294c + fVar41;
          local_3b18 = CONCAT44(fVar39,fVar38);
          uStack_3b10 = CONCAT44(fVar41,fVar40);
          local_2938 = local_57e8 * (float)local_1628;
          fStack_2934 = local_57e8 * local_1628._4_4_;
          fStack_2930 = local_57e8 * (float)uStack_1620;
          fStack_292c = local_57e8 * uStack_1620._4_4_;
          fVar38 = local_2938 + fVar38;
          fVar39 = fStack_2934 + fVar39;
          fVar40 = fStack_2930 + fVar40;
          fVar41 = fStack_292c + fVar41;
          local_3b48 = CONCAT44(fVar39,fVar38);
          uStack_3b40 = CONCAT44(fVar41,fVar40);
          local_2918 = local_5888 * (float)local_1608;
          fStack_2914 = local_5888 * local_1608._4_4_;
          fStack_2910 = local_5888 * (float)uStack_1600;
          fStack_290c = local_5888 * uStack_1600._4_4_;
          fVar38 = local_2918 + fVar38;
          fVar39 = fStack_2914 + fVar39;
          fVar40 = fStack_2910 + fVar40;
          fVar41 = fStack_290c + fVar41;
          local_3b78 = CONCAT44(fVar39,fVar38);
          uStack_3b70 = CONCAT44(fVar41,fVar40);
          local_28f8 = local_58e8 * (float)local_15e8;
          fStack_28f4 = local_58e8 * local_15e8._4_4_;
          fStack_28f0 = local_58e8 * (float)uStack_15e0;
          fStack_28ec = local_58e8 * uStack_15e0._4_4_;
          fVar38 = local_28f8 + fVar38;
          fVar39 = fStack_28f4 + fVar39;
          fVar40 = fStack_28f0 + fVar40;
          fVar41 = fStack_28ec + fVar41;
          local_3ba8 = CONCAT44(fVar39,fVar38);
          uStack_3ba0 = CONCAT44(fVar41,fVar40);
          local_28d8 = local_5848 * (float)local_15c8;
          fStack_28d4 = local_5848 * local_15c8._4_4_;
          fStack_28d0 = local_5848 * (float)uStack_15c0;
          fStack_28cc = local_5848 * uStack_15c0._4_4_;
          fVar38 = local_28d8 + fVar38;
          fVar39 = fStack_28d4 + fVar39;
          fVar40 = fStack_28d0 + fVar40;
          fVar41 = fStack_28cc + fVar41;
          local_3bd8 = CONCAT44(fVar39,fVar38);
          uStack_3bd0 = CONCAT44(fVar41,fVar40);
          local_28b8 = local_58a8 * (float)local_15a8;
          fStack_28b4 = local_58a8 * local_15a8._4_4_;
          fStack_28b0 = local_58a8 * (float)uStack_15a0;
          fStack_28ac = local_58a8 * uStack_15a0._4_4_;
          fVar38 = local_28b8 + fVar38;
          fVar39 = fStack_28b4 + fVar39;
          fVar40 = fStack_28b0 + fVar40;
          fVar41 = fStack_28ac + fVar41;
          local_3c08 = CONCAT44(fVar39,fVar38);
          uStack_3c00 = CONCAT44(fVar41,fVar40);
          local_2898 = local_5908 * (float)local_1588;
          fStack_2894 = local_5908 * local_1588._4_4_;
          fStack_2890 = local_5908 * (float)uStack_1580;
          fStack_288c = local_5908 * uStack_1580._4_4_;
          local_6588 = CONCAT44(fStack_2894 + fVar39,local_2898 + fVar38);
          uStack_6580 = CONCAT44(fStack_288c + fVar41,fStack_2890 + fVar40);
          local_2fd0 = local_62c8 + 8;
          *(undefined8 *)local_2fd0 = local_6578;
          *(undefined8 *)(local_62c8 + 10) = uStack_6570;
          local_2ff0 = local_62d0 + 8;
          *(undefined8 *)local_2ff0 = local_6588;
          *(undefined8 *)(local_62d0 + 10) = uStack_6580;
          local_5928 = local_6320[5];
          local_65c8 = CONCAT44(local_5928,local_5928);
          uStack_65c0 = CONCAT44(local_5928,local_5928);
          local_5948 = local_6328[5];
          local_65d8 = CONCAT44(local_5948,local_5948);
          uStack_65d0 = CONCAT44(local_5948,local_5948);
          local_5968 = local_6330[5];
          local_65e8 = CONCAT44(local_5968,local_5968);
          uStack_65e0 = CONCAT44(local_5968,local_5968);
          local_5630 = local_62c8 + 0xc;
          local_3c38 = *(undefined8 *)local_5630;
          uStack_3c30 = *(undefined8 *)(local_62c8 + 0xe);
          local_5638 = local_62d0 + 0xc;
          local_3de8 = *(undefined8 *)local_5638;
          uStack_3de0 = *(undefined8 *)(local_62d0 + 0xe);
          local_2878 = local_5868 * (float)local_17a8;
          fStack_2874 = local_5868 * local_17a8._4_4_;
          fStack_2870 = local_5868 * (float)uStack_17a0;
          fStack_286c = local_5868 * uStack_17a0._4_4_;
          local_2888._0_4_ = (float)local_3c38;
          local_2888._4_4_ = (float)((ulong)local_3c38 >> 0x20);
          uStack_2880._0_4_ = (float)uStack_3c30;
          uStack_2880._4_4_ = (float)((ulong)uStack_3c30 >> 0x20);
          local_3c68 = CONCAT44(fStack_2874 + local_2888._4_4_,local_2878 + (float)local_2888);
          uStack_3c60 = CONCAT44(fStack_286c + uStack_2880._4_4_,fStack_2870 + (float)uStack_2880);
          local_2858 = local_58c8 * (float)local_1788;
          fStack_2854 = local_58c8 * local_1788._4_4_;
          fStack_2850 = local_58c8 * (float)uStack_1780;
          fStack_284c = local_58c8 * uStack_1780._4_4_;
          fVar38 = local_2858 + local_2878 + (float)local_2888;
          fVar39 = fStack_2854 + fStack_2874 + local_2888._4_4_;
          fVar40 = fStack_2850 + fStack_2870 + (float)uStack_2880;
          fVar41 = fStack_284c + fStack_286c + uStack_2880._4_4_;
          local_3c98 = CONCAT44(fVar39,fVar38);
          uStack_3c90 = CONCAT44(fVar41,fVar40);
          local_2838 = local_5928 * (float)local_1768;
          fStack_2834 = local_5928 * local_1768._4_4_;
          fStack_2830 = local_5928 * (float)uStack_1760;
          fStack_282c = local_5928 * uStack_1760._4_4_;
          fVar38 = local_2838 + fVar38;
          fVar39 = fStack_2834 + fVar39;
          fVar40 = fStack_2830 + fVar40;
          fVar41 = fStack_282c + fVar41;
          local_3cc8 = CONCAT44(fVar39,fVar38);
          uStack_3cc0 = CONCAT44(fVar41,fVar40);
          local_2818 = local_5888 * (float)local_1748;
          fStack_2814 = local_5888 * local_1748._4_4_;
          fStack_2810 = local_5888 * (float)uStack_1740;
          fStack_280c = local_5888 * uStack_1740._4_4_;
          fVar38 = local_2818 + fVar38;
          fVar39 = fStack_2814 + fVar39;
          fVar40 = fStack_2810 + fVar40;
          fVar41 = fStack_280c + fVar41;
          local_3cf8 = CONCAT44(fVar39,fVar38);
          uStack_3cf0 = CONCAT44(fVar41,fVar40);
          local_27f8 = local_58e8 * (float)local_1728;
          fStack_27f4 = local_58e8 * local_1728._4_4_;
          fStack_27f0 = local_58e8 * (float)uStack_1720;
          fStack_27ec = local_58e8 * uStack_1720._4_4_;
          fVar38 = local_27f8 + fVar38;
          fVar39 = fStack_27f4 + fVar39;
          fVar40 = fStack_27f0 + fVar40;
          fVar41 = fStack_27ec + fVar41;
          local_3d28 = CONCAT44(fVar39,fVar38);
          uStack_3d20 = CONCAT44(fVar41,fVar40);
          local_27d8 = local_5948 * (float)local_1708;
          fStack_27d4 = local_5948 * local_1708._4_4_;
          fStack_27d0 = local_5948 * (float)uStack_1700;
          fStack_27cc = local_5948 * uStack_1700._4_4_;
          fVar38 = local_27d8 + fVar38;
          fVar39 = fStack_27d4 + fVar39;
          fVar40 = fStack_27d0 + fVar40;
          fVar41 = fStack_27cc + fVar41;
          local_3d58 = CONCAT44(fVar39,fVar38);
          uStack_3d50 = CONCAT44(fVar41,fVar40);
          local_27b8 = local_58a8 * (float)local_16e8;
          fStack_27b4 = local_58a8 * local_16e8._4_4_;
          fStack_27b0 = local_58a8 * (float)uStack_16e0;
          fStack_27ac = local_58a8 * uStack_16e0._4_4_;
          fVar38 = local_27b8 + fVar38;
          fVar39 = fStack_27b4 + fVar39;
          fVar40 = fStack_27b0 + fVar40;
          fVar41 = fStack_27ac + fVar41;
          local_3d88 = CONCAT44(fVar39,fVar38);
          uStack_3d80 = CONCAT44(fVar41,fVar40);
          local_2798 = local_5908 * (float)local_16c8;
          fStack_2794 = local_5908 * local_16c8._4_4_;
          fStack_2790 = local_5908 * (float)uStack_16c0;
          fStack_278c = local_5908 * uStack_16c0._4_4_;
          fVar38 = local_2798 + fVar38;
          fVar39 = fStack_2794 + fVar39;
          fVar40 = fStack_2790 + fVar40;
          fVar41 = fStack_278c + fVar41;
          local_3db8 = CONCAT44(fVar39,fVar38);
          uStack_3db0 = CONCAT44(fVar41,fVar40);
          local_2778 = local_5968 * (float)local_16a8;
          fStack_2774 = local_5968 * local_16a8._4_4_;
          fStack_2770 = local_5968 * (float)uStack_16a0;
          fStack_276c = local_5968 * uStack_16a0._4_4_;
          local_65f8 = CONCAT44(fStack_2774 + fVar39,local_2778 + fVar38);
          uStack_65f0 = CONCAT44(fStack_276c + fVar41,fStack_2770 + fVar40);
          local_2758 = local_5868 * (float)local_1688;
          fStack_2754 = local_5868 * local_1688._4_4_;
          fStack_2750 = local_5868 * (float)uStack_1680;
          fStack_274c = local_5868 * uStack_1680._4_4_;
          local_2768._0_4_ = (float)local_3de8;
          local_2768._4_4_ = (float)((ulong)local_3de8 >> 0x20);
          uStack_2760._0_4_ = (float)uStack_3de0;
          uStack_2760._4_4_ = (float)((ulong)uStack_3de0 >> 0x20);
          local_3e18 = CONCAT44(fStack_2754 + local_2768._4_4_,local_2758 + (float)local_2768);
          uStack_3e10 = CONCAT44(fStack_274c + uStack_2760._4_4_,fStack_2750 + (float)uStack_2760);
          local_2738 = local_58c8 * (float)local_1668;
          fStack_2734 = local_58c8 * local_1668._4_4_;
          fStack_2730 = local_58c8 * (float)uStack_1660;
          fStack_272c = local_58c8 * uStack_1660._4_4_;
          fVar38 = local_2738 + local_2758 + (float)local_2768;
          fVar39 = fStack_2734 + fStack_2754 + local_2768._4_4_;
          fVar40 = fStack_2730 + fStack_2750 + (float)uStack_2760;
          fVar41 = fStack_272c + fStack_274c + uStack_2760._4_4_;
          local_3e48 = CONCAT44(fVar39,fVar38);
          uStack_3e40 = CONCAT44(fVar41,fVar40);
          local_2718 = local_5928 * (float)local_1648;
          fStack_2714 = local_5928 * local_1648._4_4_;
          fStack_2710 = local_5928 * (float)uStack_1640;
          fStack_270c = local_5928 * uStack_1640._4_4_;
          fVar38 = local_2718 + fVar38;
          fVar39 = fStack_2714 + fVar39;
          fVar40 = fStack_2710 + fVar40;
          fVar41 = fStack_270c + fVar41;
          local_3e78 = CONCAT44(fVar39,fVar38);
          uStack_3e70 = CONCAT44(fVar41,fVar40);
          local_26f8 = local_5888 * (float)local_1628;
          fStack_26f4 = local_5888 * local_1628._4_4_;
          fStack_26f0 = local_5888 * (float)uStack_1620;
          fStack_26ec = local_5888 * uStack_1620._4_4_;
          fVar38 = local_26f8 + fVar38;
          fVar39 = fStack_26f4 + fVar39;
          fVar40 = fStack_26f0 + fVar40;
          fVar41 = fStack_26ec + fVar41;
          local_3ea8 = CONCAT44(fVar39,fVar38);
          uStack_3ea0 = CONCAT44(fVar41,fVar40);
          local_26d8 = local_58e8 * (float)local_1608;
          fStack_26d4 = local_58e8 * local_1608._4_4_;
          fStack_26d0 = local_58e8 * (float)uStack_1600;
          fStack_26cc = local_58e8 * uStack_1600._4_4_;
          fVar38 = local_26d8 + fVar38;
          fVar39 = fStack_26d4 + fVar39;
          fVar40 = fStack_26d0 + fVar40;
          fVar41 = fStack_26cc + fVar41;
          local_3ed8 = CONCAT44(fVar39,fVar38);
          uStack_3ed0 = CONCAT44(fVar41,fVar40);
          local_26b8 = local_5948 * (float)local_15e8;
          fStack_26b4 = local_5948 * local_15e8._4_4_;
          fStack_26b0 = local_5948 * (float)uStack_15e0;
          fStack_26ac = local_5948 * uStack_15e0._4_4_;
          fVar38 = local_26b8 + fVar38;
          fVar39 = fStack_26b4 + fVar39;
          fVar40 = fStack_26b0 + fVar40;
          fVar41 = fStack_26ac + fVar41;
          local_3f08 = CONCAT44(fVar39,fVar38);
          uStack_3f00 = CONCAT44(fVar41,fVar40);
          local_2698 = local_58a8 * (float)local_15c8;
          fStack_2694 = local_58a8 * local_15c8._4_4_;
          fStack_2690 = local_58a8 * (float)uStack_15c0;
          fStack_268c = local_58a8 * uStack_15c0._4_4_;
          fVar38 = local_2698 + fVar38;
          fVar39 = fStack_2694 + fVar39;
          fVar40 = fStack_2690 + fVar40;
          fVar41 = fStack_268c + fVar41;
          local_3f38 = CONCAT44(fVar39,fVar38);
          uStack_3f30 = CONCAT44(fVar41,fVar40);
          local_2678 = local_5908 * (float)local_15a8;
          fStack_2674 = local_5908 * local_15a8._4_4_;
          fStack_2670 = local_5908 * (float)uStack_15a0;
          fStack_266c = local_5908 * uStack_15a0._4_4_;
          fVar38 = local_2678 + fVar38;
          fVar39 = fStack_2674 + fVar39;
          fVar40 = fStack_2670 + fVar40;
          fVar41 = fStack_266c + fVar41;
          local_3f68 = CONCAT44(fVar39,fVar38);
          uStack_3f60 = CONCAT44(fVar41,fVar40);
          local_2658._0_4_ = local_5968 * (float)local_1588;
          local_2658._4_4_ = local_5968 * local_1588._4_4_;
          local_2658._8_4_ = local_5968 * (float)uStack_1580;
          local_2658._12_4_ = local_5968 * uStack_1580._4_4_;
          local_6608 = CONCAT44(local_2658._4_4_ + fVar39,local_2658._0_4_ + fVar38);
          uStack_6600 = CONCAT44(local_2658._12_4_ + fVar41,local_2658._8_4_ + fVar40);
          local_3010 = local_62c8 + 0xc;
          *(undefined8 *)local_3010 = local_65f8;
          *(undefined8 *)(local_62c8 + 0xe) = uStack_65f0;
          local_3030 = local_62d0 + 0xc;
          *(undefined8 *)local_3030 = local_6608;
          *(undefined8 *)(local_62d0 + 0xe) = uStack_6600;
          local_6320 = local_6320 + 4;
          local_6328 = local_6328 + 4;
          local_6330 = local_6330 + 4;
          local_62c8 = local_62c8 + 0x10;
          local_62d0 = local_62d0 + 0x10;
          local_6460 = local_6460 + 4;
          fStack_5964 = local_5968;
          fStack_5960 = local_5968;
          fStack_595c = local_5968;
          local_594c = local_5968;
          fStack_5944 = local_5948;
          fStack_5940 = local_5948;
          fStack_593c = local_5948;
          local_592c = local_5948;
          fStack_5924 = local_5928;
          fStack_5920 = local_5928;
          fStack_591c = local_5928;
          local_590c = local_5928;
          fStack_5904 = local_5908;
          fStack_5900 = local_5908;
          fStack_58fc = local_5908;
          local_58ec = local_5908;
          fStack_58e4 = local_58e8;
          fStack_58e0 = local_58e8;
          fStack_58dc = local_58e8;
          local_58cc = local_58e8;
          fStack_58c4 = local_58c8;
          fStack_58c0 = local_58c8;
          fStack_58bc = local_58c8;
          local_58ac = local_58c8;
          fStack_58a4 = local_58a8;
          fStack_58a0 = local_58a8;
          fStack_589c = local_58a8;
          local_588c = local_58a8;
          fStack_5884 = local_5888;
          fStack_5880 = local_5888;
          fStack_587c = local_5888;
          local_586c = local_5888;
          fStack_5864 = local_5868;
          fStack_5860 = local_5868;
          fStack_585c = local_5868;
          local_584c = local_5868;
          fStack_5844 = local_5848;
          fStack_5840 = local_5848;
          fStack_583c = local_5848;
          local_582c = local_5848;
          fStack_5824 = local_5828;
          fStack_5820 = local_5828;
          fStack_581c = local_5828;
          local_580c = local_5828;
          fStack_5804 = local_5808;
          fStack_5800 = local_5808;
          fStack_57fc = local_5808;
          local_57ec = local_5808;
          fStack_57e4 = local_57e8;
          fStack_57e0 = local_57e8;
          fStack_57dc = local_57e8;
          local_57cc = local_57e8;
          fStack_57c4 = local_57c8;
          fStack_57c0 = local_57c8;
          fStack_57bc = local_57c8;
          local_57ac = local_57c8;
          fStack_57a4 = local_57a8;
          fStack_57a0 = local_57a8;
          fStack_579c = local_57a8;
          local_578c = local_57a8;
          fStack_5784 = local_5788;
          fStack_5780 = local_5788;
          fStack_577c = local_5788;
          local_576c = local_5788;
          fStack_5764 = local_5768;
          fStack_5760 = local_5768;
          fStack_575c = local_5768;
          local_574c = local_5768;
          fStack_5744 = local_5748;
          fStack_5740 = local_5748;
          fStack_573c = local_5748;
          local_572c = local_5748;
          local_3f58 = local_6458;
          uStack_3f50 = uStack_6450;
          local_3f48 = local_65e8;
          uStack_3f40 = uStack_65e0;
          local_3f28 = local_6448;
          uStack_3f20 = uStack_6440;
          local_3f18 = local_65b8;
          uStack_3f10 = uStack_65b0;
          local_3ef8 = local_6438;
          uStack_3ef0 = uStack_6430;
          local_3ee8 = local_6568;
          uStack_3ee0 = uStack_6560;
          local_3ec8 = local_6428;
          uStack_3ec0 = uStack_6420;
          local_3eb8 = local_65d8;
          uStack_3eb0 = uStack_65d0;
          local_3e98 = local_6418;
          uStack_3e90 = uStack_6410;
          local_3e88 = local_65a8;
          uStack_3e80 = uStack_65a0;
          local_3e68 = local_6408;
          uStack_3e60 = uStack_6400;
          local_3e58 = local_6558;
          uStack_3e50 = uStack_6550;
          local_3e38 = local_63f8;
          uStack_3e30 = uStack_63f0;
          local_3e28 = local_65c8;
          uStack_3e20 = uStack_65c0;
          local_3e08 = local_63e8;
          uStack_3e00 = uStack_63e0;
          local_3df8 = local_6598;
          uStack_3df0 = uStack_6590;
          local_3dd8 = local_63d8;
          uStack_3dd0 = uStack_63d0;
          local_3dc8 = local_6548;
          uStack_3dc0 = uStack_6540;
          local_3da8 = local_63c8;
          uStack_3da0 = uStack_63c0;
          local_3d98 = local_65e8;
          uStack_3d90 = uStack_65e0;
          local_3d78 = local_63b8;
          uStack_3d70 = uStack_63b0;
          local_3d68 = local_65b8;
          uStack_3d60 = uStack_65b0;
          local_3d48 = local_63a8;
          uStack_3d40 = uStack_63a0;
          local_3d38 = local_6568;
          uStack_3d30 = uStack_6560;
          local_3d18 = local_6398;
          uStack_3d10 = uStack_6390;
          local_3d08 = local_65d8;
          uStack_3d00 = uStack_65d0;
          local_3ce8 = local_6388;
          uStack_3ce0 = uStack_6380;
          local_3cd8 = local_65a8;
          uStack_3cd0 = uStack_65a0;
          local_3cb8 = local_6378;
          uStack_3cb0 = uStack_6370;
          local_3ca8 = local_6558;
          uStack_3ca0 = uStack_6550;
          local_3c88 = local_6368;
          uStack_3c80 = uStack_6360;
          local_3c78 = local_65c8;
          uStack_3c70 = uStack_65c0;
          local_3c58 = local_6358;
          uStack_3c50 = uStack_6350;
          local_3c48 = local_6598;
          uStack_3c40 = uStack_6590;
          local_3c28 = local_6348;
          uStack_3c20 = uStack_6340;
          local_3c18 = local_6548;
          uStack_3c10 = uStack_6540;
          local_3bf8 = local_6458;
          uStack_3bf0 = uStack_6450;
          local_3be8 = local_65b8;
          uStack_3be0 = uStack_65b0;
          local_3bc8 = local_6448;
          uStack_3bc0 = uStack_6440;
          local_3bb8 = local_6568;
          uStack_3bb0 = uStack_6560;
          local_3b98 = local_6438;
          uStack_3b90 = uStack_6430;
          local_3b88 = local_6518;
          uStack_3b80 = uStack_6510;
          local_3b68 = local_6428;
          uStack_3b60 = uStack_6420;
          local_3b58 = local_65a8;
          uStack_3b50 = uStack_65a0;
          local_3b38 = local_6418;
          uStack_3b30 = uStack_6410;
          local_3b28 = local_6558;
          uStack_3b20 = uStack_6550;
          local_3b08 = local_6408;
          uStack_3b00 = uStack_6400;
          local_3af8 = local_64e8;
          uStack_3af0 = uStack_64e0;
          local_3ad8 = local_63f8;
          uStack_3ad0 = uStack_63f0;
          local_3ac8 = local_6598;
          uStack_3ac0 = uStack_6590;
          local_3aa8 = local_63e8;
          uStack_3aa0 = uStack_63e0;
          local_3a98 = local_6548;
          uStack_3a90 = uStack_6540;
          local_3a78 = local_63d8;
          uStack_3a70 = uStack_63d0;
          local_3a68 = local_64b8;
          uStack_3a60 = uStack_64b0;
          local_3a48 = local_63c8;
          uStack_3a40 = uStack_63c0;
          local_3a38 = local_65b8;
          uStack_3a30 = uStack_65b0;
          local_3a18 = local_63b8;
          uStack_3a10 = uStack_63b0;
          local_3a08 = local_6568;
          uStack_3a00 = uStack_6560;
          local_39e8 = local_63a8;
          uStack_39e0 = uStack_63a0;
          local_39d8 = local_6518;
          uStack_39d0 = uStack_6510;
          local_39b8 = local_6398;
          uStack_39b0 = uStack_6390;
          local_39a8 = local_65a8;
          uStack_39a0 = uStack_65a0;
          local_3988 = local_6388;
          uStack_3980 = uStack_6380;
          local_3978 = local_6558;
          uStack_3970 = uStack_6550;
          local_3958 = local_6378;
          uStack_3950 = uStack_6370;
          local_3948 = local_64e8;
          uStack_3940 = uStack_64e0;
          local_3928 = local_6368;
          uStack_3920 = uStack_6360;
          local_3918 = local_6598;
          uStack_3910 = uStack_6590;
          local_38f8 = local_6358;
          uStack_38f0 = uStack_6350;
          local_38e8 = local_6548;
          uStack_38e0 = uStack_6540;
          local_38c8 = local_6348;
          uStack_38c0 = uStack_6340;
          local_38b8 = local_64b8;
          uStack_38b0 = uStack_64b0;
          local_3898 = local_6458;
          uStack_3890 = uStack_6450;
          local_3888 = local_6568;
          uStack_3880 = uStack_6560;
          local_3868 = local_6448;
          uStack_3860 = uStack_6440;
          local_3858 = local_6518;
          uStack_3850 = uStack_6510;
          local_3838 = local_6438;
          uStack_3830 = uStack_6430;
          local_3828 = local_6508;
          uStack_3820 = uStack_6500;
          local_3808 = local_6428;
          uStack_3800 = uStack_6420;
          local_37f8 = local_6558;
          uStack_37f0 = uStack_6550;
          local_37d8 = local_6418;
          uStack_37d0 = uStack_6410;
          local_37c8 = local_64e8;
          uStack_37c0 = uStack_64e0;
          local_37a8 = local_6408;
          uStack_37a0 = uStack_6400;
          local_3798 = local_64d8;
          uStack_3790 = uStack_64d0;
          local_3778 = local_63f8;
          uStack_3770 = uStack_63f0;
          local_3768 = local_6548;
          uStack_3760 = uStack_6540;
          local_3748 = local_63e8;
          uStack_3740 = uStack_63e0;
          local_3738 = local_64b8;
          uStack_3730 = uStack_64b0;
          local_3718 = local_63d8;
          uStack_3710 = uStack_63d0;
          local_3708 = local_64a8;
          uStack_3700 = uStack_64a0;
          local_36e8 = local_63c8;
          uStack_36e0 = uStack_63c0;
          local_36d8 = local_6568;
          uStack_36d0 = uStack_6560;
          local_36b8 = local_63b8;
          uStack_36b0 = uStack_63b0;
          local_36a8 = local_6518;
          uStack_36a0 = uStack_6510;
          local_3688 = local_63a8;
          uStack_3680 = uStack_63a0;
          local_3678 = local_6508;
          uStack_3670 = uStack_6500;
          local_3658 = local_6398;
          uStack_3650 = uStack_6390;
          local_3648 = local_6558;
          uStack_3640 = uStack_6550;
          local_3628 = local_6388;
          uStack_3620 = uStack_6380;
          local_3618 = local_64e8;
          uStack_3610 = uStack_64e0;
          local_35f8 = local_6378;
          uStack_35f0 = uStack_6370;
          local_35e8 = local_64d8;
          uStack_35e0 = uStack_64d0;
          local_35c8 = local_6368;
          uStack_35c0 = uStack_6360;
          local_35b8 = local_6548;
          uStack_35b0 = uStack_6540;
          local_3598 = local_6358;
          uStack_3590 = uStack_6350;
          local_3588 = local_64b8;
          uStack_3580 = uStack_64b0;
          local_3568 = local_6348;
          uStack_3560 = uStack_6340;
          local_3558 = local_64a8;
          uStack_3550 = uStack_64a0;
          local_3538 = local_6458;
          uStack_3530 = uStack_6450;
          local_3528 = local_6518;
          uStack_3520 = uStack_6510;
          local_3508 = local_6448;
          uStack_3500 = uStack_6440;
          local_34f8 = local_6508;
          uStack_34f0 = uStack_6500;
          local_34d8 = local_6438;
          uStack_34d0 = uStack_6430;
          local_34c8 = local_64f8;
          uStack_34c0 = uStack_64f0;
          local_34a8 = local_6428;
          uStack_34a0 = uStack_6420;
          local_3498 = local_64e8;
          uStack_3490 = uStack_64e0;
          local_3478 = local_6418;
          uStack_3470 = uStack_6410;
          local_3468 = local_64d8;
          uStack_3460 = uStack_64d0;
          local_3448 = local_6408;
          uStack_3440 = uStack_6400;
          local_3438 = local_64c8;
          uStack_3430 = uStack_64c0;
          local_3418 = local_63f8;
          uStack_3410 = uStack_63f0;
          local_3408 = local_64b8;
          uStack_3400 = uStack_64b0;
          local_33e8 = local_63e8;
          uStack_33e0 = uStack_63e0;
          local_33d8 = local_64a8;
          uStack_33d0 = uStack_64a0;
          local_33b8 = local_63d8;
          uStack_33b0 = uStack_63d0;
          local_33a8 = local_6498;
          uStack_33a0 = uStack_6490;
          local_3388 = local_63c8;
          uStack_3380 = uStack_63c0;
          local_3378 = local_6518;
          uStack_3370 = uStack_6510;
          local_3358 = local_63b8;
          uStack_3350 = uStack_63b0;
          local_3348 = local_6508;
          uStack_3340 = uStack_6500;
          local_3328 = local_63a8;
          uStack_3320 = uStack_63a0;
          local_3318 = local_64f8;
          uStack_3310 = uStack_64f0;
          local_32f8 = local_6398;
          uStack_32f0 = uStack_6390;
          local_32e8 = local_64e8;
          uStack_32e0 = uStack_64e0;
          local_32c8 = local_6388;
          uStack_32c0 = uStack_6380;
          local_32b8 = local_64d8;
          uStack_32b0 = uStack_64d0;
          local_3298 = local_6378;
          uStack_3290 = uStack_6370;
          local_3288 = local_64c8;
          uStack_3280 = uStack_64c0;
          local_3268 = local_6368;
          uStack_3260 = uStack_6360;
          local_3258 = local_64b8;
          uStack_3250 = uStack_64b0;
          local_3238 = local_6358;
          uStack_3230 = uStack_6350;
          local_3228 = local_64a8;
          uStack_3220 = uStack_64a0;
          local_3208 = local_6348;
          uStack_3200 = uStack_6340;
          local_31f8 = local_6498;
          uStack_31f0 = uStack_6490;
          local_3048 = local_6608;
          uStack_3040 = uStack_6600;
          local_3028 = local_65f8;
          uStack_3020 = uStack_65f0;
          local_3008 = local_6588;
          uStack_3000 = uStack_6580;
          local_2fe8 = local_6578;
          uStack_2fe0 = uStack_6570;
          local_2fc8 = local_6538;
          uStack_2fc0 = uStack_6530;
          local_2fa8 = local_6528;
          uStack_2fa0 = uStack_6520;
          local_2f88 = local_6488;
          uStack_2f80 = uStack_6480;
          local_2f68 = local_6478;
          uStack_2f60 = uStack_6470;
          local_2f48 = local_3218;
          uStack_2f40 = uStack_3210;
          local_2f28 = local_3248;
          uStack_2f20 = uStack_3240;
          local_2f08 = local_3278;
          uStack_2f00 = uStack_3270;
          local_2ee8 = local_32a8;
          uStack_2ee0 = uStack_32a0;
          local_2ec8 = local_32d8;
          uStack_2ec0 = uStack_32d0;
          local_2ea8 = local_3308;
          uStack_2ea0 = uStack_3300;
          local_2e88 = local_3338;
          uStack_2e80 = uStack_3330;
          local_2e68 = local_3368;
          uStack_2e60 = uStack_3360;
          local_2e48 = local_3398;
          uStack_2e40 = uStack_3390;
          local_2e28 = local_33c8;
          uStack_2e20 = uStack_33c0;
          local_2e08 = local_33f8;
          uStack_2e00 = uStack_33f0;
          local_2de8 = local_3428;
          uStack_2de0 = uStack_3420;
          local_2dc8 = local_3458;
          uStack_2dc0 = uStack_3450;
          local_2da8 = local_3488;
          uStack_2da0 = uStack_3480;
          local_2d88 = local_34b8;
          uStack_2d80 = uStack_34b0;
          local_2d68 = local_34e8;
          uStack_2d60 = uStack_34e0;
          local_2d48 = local_3518;
          uStack_2d40 = uStack_3510;
          local_2d28 = local_3548;
          uStack_2d20 = uStack_3540;
          local_2d08 = local_3578;
          uStack_2d00 = uStack_3570;
          local_2ce8 = local_35a8;
          uStack_2ce0 = uStack_35a0;
          local_2cc8 = local_35d8;
          uStack_2cc0 = uStack_35d0;
          local_2ca8 = local_3608;
          uStack_2ca0 = uStack_3600;
          local_2c88 = local_3638;
          uStack_2c80 = uStack_3630;
          local_2c68 = local_3668;
          uStack_2c60 = uStack_3660;
          local_2c48 = local_3698;
          uStack_2c40 = uStack_3690;
          local_2c28 = local_36c8;
          uStack_2c20 = uStack_36c0;
          local_2c08 = local_36f8;
          uStack_2c00 = uStack_36f0;
          local_2be8 = local_3728;
          uStack_2be0 = uStack_3720;
          local_2bc8 = local_3758;
          uStack_2bc0 = uStack_3750;
          local_2ba8 = local_3788;
          uStack_2ba0 = uStack_3780;
          local_2b88 = local_37b8;
          uStack_2b80 = uStack_37b0;
          local_2b68 = local_37e8;
          uStack_2b60 = uStack_37e0;
          local_2b48 = local_3818;
          uStack_2b40 = uStack_3810;
          local_2b28 = local_3848;
          uStack_2b20 = uStack_3840;
          local_2b08 = local_3878;
          uStack_2b00 = uStack_3870;
          local_2ae8 = local_38a8;
          uStack_2ae0 = uStack_38a0;
          local_2ac8 = local_38d8;
          uStack_2ac0 = uStack_38d0;
          local_2aa8 = local_3908;
          uStack_2aa0 = uStack_3900;
          local_2a88 = local_3938;
          uStack_2a80 = uStack_3930;
          local_2a68 = local_3968;
          uStack_2a60 = uStack_3960;
          local_2a48 = local_3998;
          uStack_2a40 = uStack_3990;
          local_2a28 = local_39c8;
          uStack_2a20 = uStack_39c0;
          local_2a08 = local_39f8;
          uStack_2a00 = uStack_39f0;
          local_29e8 = local_3a28;
          uStack_29e0 = uStack_3a20;
          local_29c8 = local_3a58;
          uStack_29c0 = uStack_3a50;
          local_29a8 = local_3a88;
          uStack_29a0 = uStack_3a80;
          local_2988 = local_3ab8;
          uStack_2980 = uStack_3ab0;
          local_2968 = local_3ae8;
          uStack_2960 = uStack_3ae0;
          local_2948 = local_3b18;
          uStack_2940 = uStack_3b10;
          local_2928 = local_3b48;
          uStack_2920 = uStack_3b40;
          local_2908 = local_3b78;
          uStack_2900 = uStack_3b70;
          local_28e8 = local_3ba8;
          uStack_28e0 = uStack_3ba0;
          local_28c8 = local_3bd8;
          uStack_28c0 = uStack_3bd0;
          local_28a8 = local_3c08;
          uStack_28a0 = uStack_3c00;
          local_2888 = local_3c38;
          uStack_2880 = uStack_3c30;
          local_2868 = local_3c68;
          uStack_2860 = uStack_3c60;
          local_2848 = local_3c98;
          uStack_2840 = uStack_3c90;
          local_2828 = local_3cc8;
          uStack_2820 = uStack_3cc0;
          local_2808 = local_3cf8;
          uStack_2800 = uStack_3cf0;
          local_27e8 = local_3d28;
          uStack_27e0 = uStack_3d20;
          local_27c8 = local_3d58;
          uStack_27c0 = uStack_3d50;
          local_27a8 = local_3d88;
          uStack_27a0 = uStack_3d80;
          local_2788 = local_3db8;
          uStack_2780 = uStack_3db0;
          local_2768 = local_3de8;
          uStack_2760 = uStack_3de0;
          local_2748 = local_3e18;
          uStack_2740 = uStack_3e10;
          local_2728 = local_3e48;
          uStack_2720 = uStack_3e40;
          local_2708 = local_3e78;
          uStack_2700 = uStack_3e70;
          local_26e8 = local_3ea8;
          uStack_26e0 = uStack_3ea0;
          local_26c8 = local_3ed8;
          uStack_26c0 = uStack_3ed0;
          local_26a8 = local_3f08;
          uStack_26a0 = uStack_3f00;
          local_2688 = local_3f38;
          uStack_2680 = uStack_3f30;
          local_2668 = local_3f68;
          uStack_2660 = uStack_3f60;
          local_17a8 = local_6348;
          uStack_17a0 = uStack_6340;
          local_1798 = local_6498;
          uStack_1790 = uStack_6490;
          local_1788 = local_6358;
          uStack_1780 = uStack_6350;
          local_1778 = local_64a8;
          uStack_1770 = uStack_64a0;
          local_1768 = local_6368;
          uStack_1760 = uStack_6360;
          local_1758 = local_64b8;
          uStack_1750 = uStack_64b0;
          local_1748 = local_6378;
          uStack_1740 = uStack_6370;
          local_1738 = local_64c8;
          uStack_1730 = uStack_64c0;
          local_1728 = local_6388;
          uStack_1720 = uStack_6380;
          local_1718 = local_64d8;
          uStack_1710 = uStack_64d0;
          local_1708 = local_6398;
          uStack_1700 = uStack_6390;
          local_16f8 = local_64e8;
          uStack_16f0 = uStack_64e0;
          local_16e8 = local_63a8;
          uStack_16e0 = uStack_63a0;
          local_16d8 = local_64f8;
          uStack_16d0 = uStack_64f0;
          local_16c8 = local_63b8;
          uStack_16c0 = uStack_63b0;
          local_16b8 = local_6508;
          uStack_16b0 = uStack_6500;
          local_16a8 = local_63c8;
          uStack_16a0 = uStack_63c0;
          local_1698 = local_6518;
          uStack_1690 = uStack_6510;
          local_1688 = local_63d8;
          uStack_1680 = uStack_63d0;
          local_1678 = local_6498;
          uStack_1670 = uStack_6490;
          local_1668 = local_63e8;
          uStack_1660 = uStack_63e0;
          local_1658 = local_64a8;
          uStack_1650 = uStack_64a0;
          local_1648 = local_63f8;
          uStack_1640 = uStack_63f0;
          local_1638 = local_64b8;
          uStack_1630 = uStack_64b0;
          local_1628 = local_6408;
          uStack_1620 = uStack_6400;
          local_1618 = local_64c8;
          uStack_1610 = uStack_64c0;
          local_1608 = local_6418;
          uStack_1600 = uStack_6410;
          local_15f8 = local_64d8;
          uStack_15f0 = uStack_64d0;
          local_15e8 = local_6428;
          uStack_15e0 = uStack_6420;
          local_15d8 = local_64e8;
          uStack_15d0 = uStack_64e0;
          local_15c8 = local_6438;
          uStack_15c0 = uStack_6430;
          local_15b8 = local_64f8;
          uStack_15b0 = uStack_64f0;
          local_15a8 = local_6448;
          uStack_15a0 = uStack_6440;
          local_1598 = local_6508;
          uStack_1590 = uStack_6500;
          local_1588 = local_6458;
          uStack_1580 = uStack_6450;
          local_1578 = local_6518;
          uStack_1570 = uStack_6510;
          local_1568 = local_6348;
          uStack_1560 = uStack_6340;
          local_1558 = local_64a8;
          uStack_1550 = uStack_64a0;
          local_1548 = local_6358;
          uStack_1540 = uStack_6350;
          local_1538 = local_64b8;
          uStack_1530 = uStack_64b0;
          local_1528 = local_6368;
          uStack_1520 = uStack_6360;
          local_1518 = local_6548;
          uStack_1510 = uStack_6540;
          local_1508 = local_6378;
          uStack_1500 = uStack_6370;
          local_14f8 = local_64d8;
          uStack_14f0 = uStack_64d0;
          local_14e8 = local_6388;
          uStack_14e0 = uStack_6380;
          local_14d8 = local_64e8;
          uStack_14d0 = uStack_64e0;
          local_14c8 = local_6398;
          uStack_14c0 = uStack_6390;
          local_14b8 = local_6558;
          uStack_14b0 = uStack_6550;
          local_14a8 = local_63a8;
          uStack_14a0 = uStack_63a0;
          local_1498 = local_6508;
          uStack_1490 = uStack_6500;
          local_1488 = local_63b8;
          uStack_1480 = uStack_63b0;
          local_1478 = local_6518;
          uStack_1470 = uStack_6510;
          local_1468 = local_63c8;
          uStack_1460 = uStack_63c0;
          local_1458 = local_6568;
          uStack_1450 = uStack_6560;
          local_1448 = local_63d8;
          uStack_1440 = uStack_63d0;
          local_1438 = local_64a8;
          uStack_1430 = uStack_64a0;
          local_1428 = local_63e8;
          uStack_1420 = uStack_63e0;
          local_1418 = local_64b8;
          uStack_1410 = uStack_64b0;
          local_1408 = local_63f8;
          uStack_1400 = uStack_63f0;
          local_13f8 = local_6548;
          uStack_13f0 = uStack_6540;
          local_13e8 = local_6408;
          uStack_13e0 = uStack_6400;
          local_13d8 = local_64d8;
          uStack_13d0 = uStack_64d0;
          local_13c8 = local_6418;
          uStack_13c0 = uStack_6410;
          local_13b8 = local_64e8;
          uStack_13b0 = uStack_64e0;
          local_13a8 = local_6428;
          uStack_13a0 = uStack_6420;
          local_1398 = local_6558;
          uStack_1390 = uStack_6550;
          local_1388 = local_6438;
          uStack_1380 = uStack_6430;
          local_1378 = local_6508;
          uStack_1370 = uStack_6500;
          local_1368 = local_6448;
          uStack_1360 = uStack_6440;
          local_1358 = local_6518;
          uStack_1350 = uStack_6510;
          local_1348 = local_6458;
          uStack_1340 = uStack_6450;
          local_1338 = local_6568;
          uStack_1330 = uStack_6560;
          local_1328 = local_6348;
          uStack_1320 = uStack_6340;
          local_1318 = local_64b8;
          uStack_1310 = uStack_64b0;
          local_1308 = local_6358;
          uStack_1300 = uStack_6350;
          local_12f8 = local_6548;
          uStack_12f0 = uStack_6540;
          local_12e8 = local_6368;
          uStack_12e0 = uStack_6360;
          local_12d8 = local_6598;
          uStack_12d0 = uStack_6590;
          local_12c8 = local_6378;
          uStack_12c0 = uStack_6370;
          local_12b8 = local_64e8;
          uStack_12b0 = uStack_64e0;
          local_12a8 = local_6388;
          uStack_12a0 = uStack_6380;
          local_1298 = local_6558;
          uStack_1290 = uStack_6550;
          local_1288 = local_6398;
          uStack_1280 = uStack_6390;
          local_1278 = local_65a8;
          uStack_1270 = uStack_65a0;
          local_1268 = local_63a8;
          uStack_1260 = uStack_63a0;
          local_1258 = local_6518;
          uStack_1250 = uStack_6510;
          local_1248 = local_63b8;
          uStack_1240 = uStack_63b0;
          local_1238 = local_6568;
          uStack_1230 = uStack_6560;
          local_1228 = local_63c8;
          uStack_1220 = uStack_63c0;
          local_1218 = local_65b8;
          uStack_1210 = uStack_65b0;
          local_1208 = local_63d8;
          uStack_1200 = uStack_63d0;
          local_11f8 = local_64b8;
          uStack_11f0 = uStack_64b0;
          local_11e8 = local_63e8;
          uStack_11e0 = uStack_63e0;
          local_11d8 = local_6548;
          uStack_11d0 = uStack_6540;
          local_11c8 = local_63f8;
          uStack_11c0 = uStack_63f0;
          local_11b8 = local_6598;
          uStack_11b0 = uStack_6590;
          local_11a8 = local_6408;
          uStack_11a0 = uStack_6400;
          local_1198 = local_64e8;
          uStack_1190 = uStack_64e0;
          local_1188 = local_6418;
          uStack_1180 = uStack_6410;
          local_1178 = local_6558;
          uStack_1170 = uStack_6550;
          local_1168 = local_6428;
          uStack_1160 = uStack_6420;
          local_1158 = local_65a8;
          uStack_1150 = uStack_65a0;
          local_1148 = local_6438;
          uStack_1140 = uStack_6430;
          local_1138 = local_6518;
          uStack_1130 = uStack_6510;
          local_1128 = local_6448;
          uStack_1120 = uStack_6440;
          local_1118 = local_6568;
          uStack_1110 = uStack_6560;
          local_1108 = local_6458;
          uStack_1100 = uStack_6450;
          local_10f8 = local_65b8;
          uStack_10f0 = uStack_65b0;
          local_10e8 = local_6348;
          uStack_10e0 = uStack_6340;
          local_10d8 = local_6548;
          uStack_10d0 = uStack_6540;
          local_10c8 = local_6358;
          uStack_10c0 = uStack_6350;
          local_10b8 = local_6598;
          uStack_10b0 = uStack_6590;
          local_10a8 = local_6368;
          uStack_10a0 = uStack_6360;
          local_1098 = local_65c8;
          uStack_1090 = uStack_65c0;
          local_1088 = local_6378;
          uStack_1080 = uStack_6370;
          local_1078 = local_6558;
          uStack_1070 = uStack_6550;
          local_1068 = local_6388;
          uStack_1060 = uStack_6380;
          local_1058 = local_65a8;
          uStack_1050 = uStack_65a0;
          local_1048 = local_6398;
          uStack_1040 = uStack_6390;
          local_1038 = local_65d8;
          uStack_1030 = uStack_65d0;
          local_1028 = local_63a8;
          uStack_1020 = uStack_63a0;
          local_1018 = local_6568;
          uStack_1010 = uStack_6560;
          local_1008 = local_63b8;
          uStack_1000 = uStack_63b0;
          local_ff8 = local_65b8;
          uStack_ff0 = uStack_65b0;
          local_fe8 = local_63c8;
          uStack_fe0 = uStack_63c0;
          local_fd8 = local_65e8;
          uStack_fd0 = uStack_65e0;
          local_fc8 = local_63d8;
          uStack_fc0 = uStack_63d0;
          local_fb8 = local_6548;
          uStack_fb0 = uStack_6540;
          local_fa8 = local_63e8;
          uStack_fa0 = uStack_63e0;
          local_f98 = local_6598;
          uStack_f90 = uStack_6590;
          local_f88 = local_63f8;
          uStack_f80 = uStack_63f0;
          local_f78 = local_65c8;
          uStack_f70 = uStack_65c0;
          local_f68 = local_6408;
          uStack_f60 = uStack_6400;
          local_f58 = local_6558;
          uStack_f50 = uStack_6550;
          local_f48 = local_6418;
          uStack_f40 = uStack_6410;
          local_f38 = local_65a8;
          uStack_f30 = uStack_65a0;
          local_f28 = local_6428;
          uStack_f20 = uStack_6420;
          local_f18 = local_65d8;
          uStack_f10 = uStack_65d0;
          local_f08 = local_6438;
          uStack_f00 = uStack_6430;
          local_ef8 = local_6568;
          uStack_ef0 = uStack_6560;
          local_ee8 = local_6448;
          uStack_ee0 = uStack_6440;
          local_ed8 = local_65b8;
          uStack_ed0 = uStack_65b0;
          local_ec8 = local_6458;
          uStack_ec0 = uStack_6450;
          local_eb8 = local_65e8;
          uStack_eb0 = uStack_65e0;
        }
        for (; local_6460 + 1 < local_6138; local_6460 = local_6460 + 2) {
          local_5640 = local_62c8;
          local_3f98 = *(undefined8 *)local_62c8;
          uStack_3f90 = *(undefined8 *)(local_62c8 + 2);
          local_5648 = local_62d0;
          local_4148 = *(undefined8 *)local_62d0;
          uStack_4140 = *(undefined8 *)(local_62d0 + 2);
          local_5988 = *local_6320;
          local_6638 = CONCAT44(local_5988,local_5988);
          uStack_6630 = CONCAT44(local_5988,local_5988);
          local_59a8 = local_6320[1];
          local_6648 = CONCAT44(local_59a8,local_59a8);
          uStack_6640 = CONCAT44(local_59a8,local_59a8);
          local_59c8 = local_6320[2];
          local_6658 = CONCAT44(local_59c8,local_59c8);
          uStack_6650 = CONCAT44(local_59c8,local_59c8);
          local_59e8 = *local_6328;
          local_6668 = CONCAT44(local_59e8,local_59e8);
          uStack_6660 = CONCAT44(local_59e8,local_59e8);
          local_5a08 = local_6328[1];
          local_6678 = CONCAT44(local_5a08,local_5a08);
          uStack_6670 = CONCAT44(local_5a08,local_5a08);
          local_5a28 = local_6328[2];
          local_6688 = CONCAT44(local_5a28,local_5a28);
          uStack_6680 = CONCAT44(local_5a28,local_5a28);
          local_5a48 = *local_6330;
          local_6698 = CONCAT44(local_5a48,local_5a48);
          uStack_6690 = CONCAT44(local_5a48,local_5a48);
          local_5a68 = local_6330[1];
          local_66a8 = CONCAT44(local_5a68,local_5a68);
          uStack_66a0 = CONCAT44(local_5a68,local_5a68);
          local_5a88 = local_6330[2];
          local_66b8 = CONCAT44(local_5a88,local_5a88);
          uStack_66b0 = CONCAT44(local_5a88,local_5a88);
          local_2638 = local_5988 * (float)local_17a8;
          fStack_2634 = local_5988 * local_17a8._4_4_;
          fStack_2630 = local_5988 * (float)uStack_17a0;
          fStack_262c = local_5988 * uStack_17a0._4_4_;
          local_2648._0_4_ = (float)local_3f98;
          local_2648._4_4_ = (float)((ulong)local_3f98 >> 0x20);
          uStack_2640._0_4_ = (float)uStack_3f90;
          uStack_2640._4_4_ = (float)((ulong)uStack_3f90 >> 0x20);
          local_3fc8 = CONCAT44(fStack_2634 + local_2648._4_4_,local_2638 + (float)local_2648);
          uStack_3fc0 = CONCAT44(fStack_262c + uStack_2640._4_4_,fStack_2630 + (float)uStack_2640);
          local_2618 = local_59a8 * (float)local_1788;
          fStack_2614 = local_59a8 * local_1788._4_4_;
          fStack_2610 = local_59a8 * (float)uStack_1780;
          fStack_260c = local_59a8 * uStack_1780._4_4_;
          fVar38 = local_2618 + local_2638 + (float)local_2648;
          fVar39 = fStack_2614 + fStack_2634 + local_2648._4_4_;
          fVar40 = fStack_2610 + fStack_2630 + (float)uStack_2640;
          fVar41 = fStack_260c + fStack_262c + uStack_2640._4_4_;
          local_3ff8 = CONCAT44(fVar39,fVar38);
          uStack_3ff0 = CONCAT44(fVar41,fVar40);
          local_25f8 = local_59c8 * (float)local_1768;
          fStack_25f4 = local_59c8 * local_1768._4_4_;
          fStack_25f0 = local_59c8 * (float)uStack_1760;
          fStack_25ec = local_59c8 * uStack_1760._4_4_;
          fVar38 = local_25f8 + fVar38;
          fVar39 = fStack_25f4 + fVar39;
          fVar40 = fStack_25f0 + fVar40;
          fVar41 = fStack_25ec + fVar41;
          local_4028 = CONCAT44(fVar39,fVar38);
          uStack_4020 = CONCAT44(fVar41,fVar40);
          local_25d8 = local_59e8 * (float)local_1748;
          fStack_25d4 = local_59e8 * local_1748._4_4_;
          fStack_25d0 = local_59e8 * (float)uStack_1740;
          fStack_25cc = local_59e8 * uStack_1740._4_4_;
          fVar38 = local_25d8 + fVar38;
          fVar39 = fStack_25d4 + fVar39;
          fVar40 = fStack_25d0 + fVar40;
          fVar41 = fStack_25cc + fVar41;
          local_4058 = CONCAT44(fVar39,fVar38);
          uStack_4050 = CONCAT44(fVar41,fVar40);
          local_25b8 = local_5a08 * (float)local_1728;
          fStack_25b4 = local_5a08 * local_1728._4_4_;
          fStack_25b0 = local_5a08 * (float)uStack_1720;
          fStack_25ac = local_5a08 * uStack_1720._4_4_;
          fVar38 = local_25b8 + fVar38;
          fVar39 = fStack_25b4 + fVar39;
          fVar40 = fStack_25b0 + fVar40;
          fVar41 = fStack_25ac + fVar41;
          local_4088 = CONCAT44(fVar39,fVar38);
          uStack_4080 = CONCAT44(fVar41,fVar40);
          local_2598 = local_5a28 * (float)local_1708;
          fStack_2594 = local_5a28 * local_1708._4_4_;
          fStack_2590 = local_5a28 * (float)uStack_1700;
          fStack_258c = local_5a28 * uStack_1700._4_4_;
          fVar38 = local_2598 + fVar38;
          fVar39 = fStack_2594 + fVar39;
          fVar40 = fStack_2590 + fVar40;
          fVar41 = fStack_258c + fVar41;
          local_40b8 = CONCAT44(fVar39,fVar38);
          uStack_40b0 = CONCAT44(fVar41,fVar40);
          local_2578 = local_5a48 * (float)local_16e8;
          fStack_2574 = local_5a48 * local_16e8._4_4_;
          fStack_2570 = local_5a48 * (float)uStack_16e0;
          fStack_256c = local_5a48 * uStack_16e0._4_4_;
          fVar38 = local_2578 + fVar38;
          fVar39 = fStack_2574 + fVar39;
          fVar40 = fStack_2570 + fVar40;
          fVar41 = fStack_256c + fVar41;
          local_40e8 = CONCAT44(fVar39,fVar38);
          uStack_40e0 = CONCAT44(fVar41,fVar40);
          local_2558 = local_5a68 * (float)local_16c8;
          fStack_2554 = local_5a68 * local_16c8._4_4_;
          fStack_2550 = local_5a68 * (float)uStack_16c0;
          fStack_254c = local_5a68 * uStack_16c0._4_4_;
          fVar38 = local_2558 + fVar38;
          fVar39 = fStack_2554 + fVar39;
          fVar40 = fStack_2550 + fVar40;
          fVar41 = fStack_254c + fVar41;
          local_4118 = CONCAT44(fVar39,fVar38);
          uStack_4110 = CONCAT44(fVar41,fVar40);
          local_2538 = local_5a88 * (float)local_16a8;
          fStack_2534 = local_5a88 * local_16a8._4_4_;
          fStack_2530 = local_5a88 * (float)uStack_16a0;
          fStack_252c = local_5a88 * uStack_16a0._4_4_;
          local_6618 = CONCAT44(fStack_2534 + fVar39,local_2538 + fVar38);
          uStack_6610 = CONCAT44(fStack_252c + fVar41,fStack_2530 + fVar40);
          local_2518 = local_5988 * (float)local_1688;
          fStack_2514 = local_5988 * local_1688._4_4_;
          fStack_2510 = local_5988 * (float)uStack_1680;
          fStack_250c = local_5988 * uStack_1680._4_4_;
          local_2528._0_4_ = (float)local_4148;
          local_2528._4_4_ = (float)((ulong)local_4148 >> 0x20);
          uStack_2520._0_4_ = (float)uStack_4140;
          uStack_2520._4_4_ = (float)((ulong)uStack_4140 >> 0x20);
          local_4178 = CONCAT44(fStack_2514 + local_2528._4_4_,local_2518 + (float)local_2528);
          uStack_4170 = CONCAT44(fStack_250c + uStack_2520._4_4_,fStack_2510 + (float)uStack_2520);
          local_24f8 = local_59a8 * (float)local_1668;
          fStack_24f4 = local_59a8 * local_1668._4_4_;
          fStack_24f0 = local_59a8 * (float)uStack_1660;
          fStack_24ec = local_59a8 * uStack_1660._4_4_;
          fVar38 = local_24f8 + local_2518 + (float)local_2528;
          fVar39 = fStack_24f4 + fStack_2514 + local_2528._4_4_;
          fVar40 = fStack_24f0 + fStack_2510 + (float)uStack_2520;
          fVar41 = fStack_24ec + fStack_250c + uStack_2520._4_4_;
          local_41a8 = CONCAT44(fVar39,fVar38);
          uStack_41a0 = CONCAT44(fVar41,fVar40);
          local_24d8 = local_59c8 * (float)local_1648;
          fStack_24d4 = local_59c8 * local_1648._4_4_;
          fStack_24d0 = local_59c8 * (float)uStack_1640;
          fStack_24cc = local_59c8 * uStack_1640._4_4_;
          fVar38 = local_24d8 + fVar38;
          fVar39 = fStack_24d4 + fVar39;
          fVar40 = fStack_24d0 + fVar40;
          fVar41 = fStack_24cc + fVar41;
          local_41d8 = CONCAT44(fVar39,fVar38);
          uStack_41d0 = CONCAT44(fVar41,fVar40);
          local_24b8 = local_59e8 * (float)local_1628;
          fStack_24b4 = local_59e8 * local_1628._4_4_;
          fStack_24b0 = local_59e8 * (float)uStack_1620;
          fStack_24ac = local_59e8 * uStack_1620._4_4_;
          fVar38 = local_24b8 + fVar38;
          fVar39 = fStack_24b4 + fVar39;
          fVar40 = fStack_24b0 + fVar40;
          fVar41 = fStack_24ac + fVar41;
          local_4208 = CONCAT44(fVar39,fVar38);
          uStack_4200 = CONCAT44(fVar41,fVar40);
          local_2498 = local_5a08 * (float)local_1608;
          fStack_2494 = local_5a08 * local_1608._4_4_;
          fStack_2490 = local_5a08 * (float)uStack_1600;
          fStack_248c = local_5a08 * uStack_1600._4_4_;
          fVar38 = local_2498 + fVar38;
          fVar39 = fStack_2494 + fVar39;
          fVar40 = fStack_2490 + fVar40;
          fVar41 = fStack_248c + fVar41;
          local_4238 = CONCAT44(fVar39,fVar38);
          uStack_4230 = CONCAT44(fVar41,fVar40);
          local_2478 = local_5a28 * (float)local_15e8;
          fStack_2474 = local_5a28 * local_15e8._4_4_;
          fStack_2470 = local_5a28 * (float)uStack_15e0;
          fStack_246c = local_5a28 * uStack_15e0._4_4_;
          fVar38 = local_2478 + fVar38;
          fVar39 = fStack_2474 + fVar39;
          fVar40 = fStack_2470 + fVar40;
          fVar41 = fStack_246c + fVar41;
          local_4268 = CONCAT44(fVar39,fVar38);
          uStack_4260 = CONCAT44(fVar41,fVar40);
          local_2458 = local_5a48 * (float)local_15c8;
          fStack_2454 = local_5a48 * local_15c8._4_4_;
          fStack_2450 = local_5a48 * (float)uStack_15c0;
          fStack_244c = local_5a48 * uStack_15c0._4_4_;
          fVar38 = local_2458 + fVar38;
          fVar39 = fStack_2454 + fVar39;
          fVar40 = fStack_2450 + fVar40;
          fVar41 = fStack_244c + fVar41;
          local_4298 = CONCAT44(fVar39,fVar38);
          uStack_4290 = CONCAT44(fVar41,fVar40);
          local_2438 = local_5a68 * (float)local_15a8;
          fStack_2434 = local_5a68 * local_15a8._4_4_;
          fStack_2430 = local_5a68 * (float)uStack_15a0;
          fStack_242c = local_5a68 * uStack_15a0._4_4_;
          fVar38 = local_2438 + fVar38;
          fVar39 = fStack_2434 + fVar39;
          fVar40 = fStack_2430 + fVar40;
          fVar41 = fStack_242c + fVar41;
          local_42c8 = CONCAT44(fVar39,fVar38);
          uStack_42c0 = CONCAT44(fVar41,fVar40);
          local_2418 = local_5a88 * (float)local_1588;
          fStack_2414 = local_5a88 * local_1588._4_4_;
          fStack_2410 = local_5a88 * (float)uStack_1580;
          fStack_240c = local_5a88 * uStack_1580._4_4_;
          local_6628 = CONCAT44(fStack_2414 + fVar39,local_2418 + fVar38);
          uStack_6620 = CONCAT44(fStack_240c + fVar41,fStack_2410 + fVar40);
          local_3050 = local_62c8;
          *(undefined8 *)local_62c8 = local_6618;
          *(undefined8 *)(local_62c8 + 2) = uStack_6610;
          local_3070 = local_62d0;
          *(undefined8 *)local_62d0 = local_6628;
          *(undefined8 *)(local_62d0 + 2) = uStack_6620;
          local_5650 = local_62c8 + 4;
          local_42f8 = *(undefined8 *)local_5650;
          uStack_42f0 = *(undefined8 *)(local_62c8 + 6);
          local_5658 = local_62d0 + 4;
          local_44a8 = *(undefined8 *)local_5658;
          uStack_44a0 = *(undefined8 *)(local_62d0 + 6);
          local_5aa8 = local_6320[3];
          local_66e8 = CONCAT44(local_5aa8,local_5aa8);
          uStack_66e0 = CONCAT44(local_5aa8,local_5aa8);
          local_5ac8 = local_6328[3];
          local_66f8 = CONCAT44(local_5ac8,local_5ac8);
          uStack_66f0 = CONCAT44(local_5ac8,local_5ac8);
          local_5ae8 = local_6330[3];
          local_6708 = CONCAT44(local_5ae8,local_5ae8);
          uStack_6700 = CONCAT44(local_5ae8,local_5ae8);
          local_23f8 = local_59a8 * (float)local_17a8;
          fStack_23f4 = local_59a8 * local_17a8._4_4_;
          fStack_23f0 = local_59a8 * (float)uStack_17a0;
          fStack_23ec = local_59a8 * uStack_17a0._4_4_;
          local_2408._0_4_ = (float)local_42f8;
          local_2408._4_4_ = (float)((ulong)local_42f8 >> 0x20);
          uStack_2400._0_4_ = (float)uStack_42f0;
          uStack_2400._4_4_ = (float)((ulong)uStack_42f0 >> 0x20);
          local_4328 = CONCAT44(fStack_23f4 + local_2408._4_4_,local_23f8 + (float)local_2408);
          uStack_4320 = CONCAT44(fStack_23ec + uStack_2400._4_4_,fStack_23f0 + (float)uStack_2400);
          local_23d8 = local_59c8 * (float)local_1788;
          fStack_23d4 = local_59c8 * local_1788._4_4_;
          fStack_23d0 = local_59c8 * (float)uStack_1780;
          fStack_23cc = local_59c8 * uStack_1780._4_4_;
          fVar38 = local_23d8 + local_23f8 + (float)local_2408;
          fVar39 = fStack_23d4 + fStack_23f4 + local_2408._4_4_;
          fVar40 = fStack_23d0 + fStack_23f0 + (float)uStack_2400;
          fVar41 = fStack_23cc + fStack_23ec + uStack_2400._4_4_;
          local_4358 = CONCAT44(fVar39,fVar38);
          uStack_4350 = CONCAT44(fVar41,fVar40);
          local_23b8 = local_5aa8 * (float)local_1768;
          fStack_23b4 = local_5aa8 * local_1768._4_4_;
          fStack_23b0 = local_5aa8 * (float)uStack_1760;
          fStack_23ac = local_5aa8 * uStack_1760._4_4_;
          fVar38 = local_23b8 + fVar38;
          fVar39 = fStack_23b4 + fVar39;
          fVar40 = fStack_23b0 + fVar40;
          fVar41 = fStack_23ac + fVar41;
          local_4388 = CONCAT44(fVar39,fVar38);
          uStack_4380 = CONCAT44(fVar41,fVar40);
          local_2398 = local_5a08 * (float)local_1748;
          fStack_2394 = local_5a08 * local_1748._4_4_;
          fStack_2390 = local_5a08 * (float)uStack_1740;
          fStack_238c = local_5a08 * uStack_1740._4_4_;
          fVar38 = local_2398 + fVar38;
          fVar39 = fStack_2394 + fVar39;
          fVar40 = fStack_2390 + fVar40;
          fVar41 = fStack_238c + fVar41;
          local_43b8 = CONCAT44(fVar39,fVar38);
          uStack_43b0 = CONCAT44(fVar41,fVar40);
          local_2378 = local_5a28 * (float)local_1728;
          fStack_2374 = local_5a28 * local_1728._4_4_;
          fStack_2370 = local_5a28 * (float)uStack_1720;
          fStack_236c = local_5a28 * uStack_1720._4_4_;
          fVar38 = local_2378 + fVar38;
          fVar39 = fStack_2374 + fVar39;
          fVar40 = fStack_2370 + fVar40;
          fVar41 = fStack_236c + fVar41;
          local_43e8 = CONCAT44(fVar39,fVar38);
          uStack_43e0 = CONCAT44(fVar41,fVar40);
          local_2358 = local_5ac8 * (float)local_1708;
          fStack_2354 = local_5ac8 * local_1708._4_4_;
          fStack_2350 = local_5ac8 * (float)uStack_1700;
          fStack_234c = local_5ac8 * uStack_1700._4_4_;
          fVar38 = local_2358 + fVar38;
          fVar39 = fStack_2354 + fVar39;
          fVar40 = fStack_2350 + fVar40;
          fVar41 = fStack_234c + fVar41;
          local_4418 = CONCAT44(fVar39,fVar38);
          uStack_4410 = CONCAT44(fVar41,fVar40);
          local_2338 = local_5a68 * (float)local_16e8;
          fStack_2334 = local_5a68 * local_16e8._4_4_;
          fStack_2330 = local_5a68 * (float)uStack_16e0;
          fStack_232c = local_5a68 * uStack_16e0._4_4_;
          fVar38 = local_2338 + fVar38;
          fVar39 = fStack_2334 + fVar39;
          fVar40 = fStack_2330 + fVar40;
          fVar41 = fStack_232c + fVar41;
          local_4448 = CONCAT44(fVar39,fVar38);
          uStack_4440 = CONCAT44(fVar41,fVar40);
          local_2318 = local_5a88 * (float)local_16c8;
          fStack_2314 = local_5a88 * local_16c8._4_4_;
          fStack_2310 = local_5a88 * (float)uStack_16c0;
          fStack_230c = local_5a88 * uStack_16c0._4_4_;
          fVar38 = local_2318 + fVar38;
          fVar39 = fStack_2314 + fVar39;
          fVar40 = fStack_2310 + fVar40;
          fVar41 = fStack_230c + fVar41;
          local_4478 = CONCAT44(fVar39,fVar38);
          uStack_4470 = CONCAT44(fVar41,fVar40);
          local_22f8 = local_5ae8 * (float)local_16a8;
          fStack_22f4 = local_5ae8 * local_16a8._4_4_;
          fStack_22f0 = local_5ae8 * (float)uStack_16a0;
          fStack_22ec = local_5ae8 * uStack_16a0._4_4_;
          local_66c8 = CONCAT44(fStack_22f4 + fVar39,local_22f8 + fVar38);
          uStack_66c0 = CONCAT44(fStack_22ec + fVar41,fStack_22f0 + fVar40);
          local_22d8 = local_59a8 * (float)local_1688;
          fStack_22d4 = local_59a8 * local_1688._4_4_;
          fStack_22d0 = local_59a8 * (float)uStack_1680;
          fStack_22cc = local_59a8 * uStack_1680._4_4_;
          local_22e8._0_4_ = (float)local_44a8;
          local_22e8._4_4_ = (float)((ulong)local_44a8 >> 0x20);
          uStack_22e0._0_4_ = (float)uStack_44a0;
          uStack_22e0._4_4_ = (float)((ulong)uStack_44a0 >> 0x20);
          local_44d8 = CONCAT44(fStack_22d4 + local_22e8._4_4_,local_22d8 + (float)local_22e8);
          uStack_44d0 = CONCAT44(fStack_22cc + uStack_22e0._4_4_,fStack_22d0 + (float)uStack_22e0);
          local_22b8 = local_59c8 * (float)local_1668;
          fStack_22b4 = local_59c8 * local_1668._4_4_;
          fStack_22b0 = local_59c8 * (float)uStack_1660;
          fStack_22ac = local_59c8 * uStack_1660._4_4_;
          fVar38 = local_22b8 + local_22d8 + (float)local_22e8;
          fVar39 = fStack_22b4 + fStack_22d4 + local_22e8._4_4_;
          fVar40 = fStack_22b0 + fStack_22d0 + (float)uStack_22e0;
          fVar41 = fStack_22ac + fStack_22cc + uStack_22e0._4_4_;
          local_4508 = CONCAT44(fVar39,fVar38);
          uStack_4500 = CONCAT44(fVar41,fVar40);
          local_2298 = local_5aa8 * (float)local_1648;
          fStack_2294 = local_5aa8 * local_1648._4_4_;
          fStack_2290 = local_5aa8 * (float)uStack_1640;
          fStack_228c = local_5aa8 * uStack_1640._4_4_;
          fVar38 = local_2298 + fVar38;
          fVar39 = fStack_2294 + fVar39;
          fVar40 = fStack_2290 + fVar40;
          fVar41 = fStack_228c + fVar41;
          local_4538 = CONCAT44(fVar39,fVar38);
          uStack_4530 = CONCAT44(fVar41,fVar40);
          local_2278 = local_5a08 * (float)local_1628;
          fStack_2274 = local_5a08 * local_1628._4_4_;
          fStack_2270 = local_5a08 * (float)uStack_1620;
          fStack_226c = local_5a08 * uStack_1620._4_4_;
          fVar38 = local_2278 + fVar38;
          fVar39 = fStack_2274 + fVar39;
          fVar40 = fStack_2270 + fVar40;
          fVar41 = fStack_226c + fVar41;
          local_4568 = CONCAT44(fVar39,fVar38);
          uStack_4560 = CONCAT44(fVar41,fVar40);
          local_2258 = local_5a28 * (float)local_1608;
          fStack_2254 = local_5a28 * local_1608._4_4_;
          fStack_2250 = local_5a28 * (float)uStack_1600;
          fStack_224c = local_5a28 * uStack_1600._4_4_;
          fVar38 = local_2258 + fVar38;
          fVar39 = fStack_2254 + fVar39;
          fVar40 = fStack_2250 + fVar40;
          fVar41 = fStack_224c + fVar41;
          local_4598 = CONCAT44(fVar39,fVar38);
          uStack_4590 = CONCAT44(fVar41,fVar40);
          local_2238 = local_5ac8 * (float)local_15e8;
          fStack_2234 = local_5ac8 * local_15e8._4_4_;
          fStack_2230 = local_5ac8 * (float)uStack_15e0;
          fStack_222c = local_5ac8 * uStack_15e0._4_4_;
          fVar38 = local_2238 + fVar38;
          fVar39 = fStack_2234 + fVar39;
          fVar40 = fStack_2230 + fVar40;
          fVar41 = fStack_222c + fVar41;
          local_45c8 = CONCAT44(fVar39,fVar38);
          uStack_45c0 = CONCAT44(fVar41,fVar40);
          local_2218 = local_5a68 * (float)local_15c8;
          fStack_2214 = local_5a68 * local_15c8._4_4_;
          fStack_2210 = local_5a68 * (float)uStack_15c0;
          fStack_220c = local_5a68 * uStack_15c0._4_4_;
          fVar38 = local_2218 + fVar38;
          fVar39 = fStack_2214 + fVar39;
          fVar40 = fStack_2210 + fVar40;
          fVar41 = fStack_220c + fVar41;
          local_45f8 = CONCAT44(fVar39,fVar38);
          uStack_45f0 = CONCAT44(fVar41,fVar40);
          local_21f8 = local_5a88 * (float)local_15a8;
          fStack_21f4 = local_5a88 * local_15a8._4_4_;
          fStack_21f0 = local_5a88 * (float)uStack_15a0;
          fStack_21ec = local_5a88 * uStack_15a0._4_4_;
          fVar38 = local_21f8 + fVar38;
          fVar39 = fStack_21f4 + fVar39;
          fVar40 = fStack_21f0 + fVar40;
          fVar41 = fStack_21ec + fVar41;
          local_4628 = CONCAT44(fVar39,fVar38);
          uStack_4620 = CONCAT44(fVar41,fVar40);
          local_21d8._0_4_ = local_5ae8 * (float)local_1588;
          local_21d8._4_4_ = local_5ae8 * local_1588._4_4_;
          local_21d8._8_4_ = local_5ae8 * (float)uStack_1580;
          local_21d8._12_4_ = local_5ae8 * uStack_1580._4_4_;
          local_66d8 = CONCAT44(local_21d8._4_4_ + fVar39,local_21d8._0_4_ + fVar38);
          uStack_66d0 = CONCAT44(local_21d8._12_4_ + fVar41,local_21d8._8_4_ + fVar40);
          local_3090 = local_62c8 + 4;
          *(undefined8 *)local_3090 = local_66c8;
          *(undefined8 *)(local_62c8 + 6) = uStack_66c0;
          local_30b0 = local_62d0 + 4;
          *(undefined8 *)local_30b0 = local_66d8;
          *(undefined8 *)(local_62d0 + 6) = uStack_66d0;
          local_6320 = local_6320 + 2;
          local_6328 = local_6328 + 2;
          local_6330 = local_6330 + 2;
          local_62c8 = local_62c8 + 8;
          local_62d0 = local_62d0 + 8;
          fStack_5ae4 = local_5ae8;
          fStack_5ae0 = local_5ae8;
          fStack_5adc = local_5ae8;
          local_5acc = local_5ae8;
          fStack_5ac4 = local_5ac8;
          fStack_5ac0 = local_5ac8;
          fStack_5abc = local_5ac8;
          local_5aac = local_5ac8;
          fStack_5aa4 = local_5aa8;
          fStack_5aa0 = local_5aa8;
          fStack_5a9c = local_5aa8;
          local_5a8c = local_5aa8;
          fStack_5a84 = local_5a88;
          fStack_5a80 = local_5a88;
          fStack_5a7c = local_5a88;
          local_5a6c = local_5a88;
          fStack_5a64 = local_5a68;
          fStack_5a60 = local_5a68;
          fStack_5a5c = local_5a68;
          local_5a4c = local_5a68;
          fStack_5a44 = local_5a48;
          fStack_5a40 = local_5a48;
          fStack_5a3c = local_5a48;
          local_5a2c = local_5a48;
          fStack_5a24 = local_5a28;
          fStack_5a20 = local_5a28;
          fStack_5a1c = local_5a28;
          local_5a0c = local_5a28;
          fStack_5a04 = local_5a08;
          fStack_5a00 = local_5a08;
          fStack_59fc = local_5a08;
          local_59ec = local_5a08;
          fStack_59e4 = local_59e8;
          fStack_59e0 = local_59e8;
          fStack_59dc = local_59e8;
          local_59cc = local_59e8;
          fStack_59c4 = local_59c8;
          fStack_59c0 = local_59c8;
          fStack_59bc = local_59c8;
          local_59ac = local_59c8;
          fStack_59a4 = local_59a8;
          fStack_59a0 = local_59a8;
          fStack_599c = local_59a8;
          local_598c = local_59a8;
          fStack_5984 = local_5988;
          fStack_5980 = local_5988;
          fStack_597c = local_5988;
          local_596c = local_5988;
          local_4618 = local_6458;
          uStack_4610 = uStack_6450;
          local_4608 = local_6708;
          uStack_4600 = uStack_6700;
          local_45e8 = local_6448;
          uStack_45e0 = uStack_6440;
          local_45d8 = local_66b8;
          uStack_45d0 = uStack_66b0;
          local_45b8 = local_6438;
          uStack_45b0 = uStack_6430;
          local_45a8 = local_66a8;
          uStack_45a0 = uStack_66a0;
          local_4588 = local_6428;
          uStack_4580 = uStack_6420;
          local_4578 = local_66f8;
          uStack_4570 = uStack_66f0;
          local_4558 = local_6418;
          uStack_4550 = uStack_6410;
          local_4548 = local_6688;
          uStack_4540 = uStack_6680;
          local_4528 = local_6408;
          uStack_4520 = uStack_6400;
          local_4518 = local_6678;
          uStack_4510 = uStack_6670;
          local_44f8 = local_63f8;
          uStack_44f0 = uStack_63f0;
          local_44e8 = local_66e8;
          uStack_44e0 = uStack_66e0;
          local_44c8 = local_63e8;
          uStack_44c0 = uStack_63e0;
          local_44b8 = local_6658;
          uStack_44b0 = uStack_6650;
          local_4498 = local_63d8;
          uStack_4490 = uStack_63d0;
          local_4488 = local_6648;
          uStack_4480 = uStack_6640;
          local_4468 = local_63c8;
          uStack_4460 = uStack_63c0;
          local_4458 = local_6708;
          uStack_4450 = uStack_6700;
          local_4438 = local_63b8;
          uStack_4430 = uStack_63b0;
          local_4428 = local_66b8;
          uStack_4420 = uStack_66b0;
          local_4408 = local_63a8;
          uStack_4400 = uStack_63a0;
          local_43f8 = local_66a8;
          uStack_43f0 = uStack_66a0;
          local_43d8 = local_6398;
          uStack_43d0 = uStack_6390;
          local_43c8 = local_66f8;
          uStack_43c0 = uStack_66f0;
          local_43a8 = local_6388;
          uStack_43a0 = uStack_6380;
          local_4398 = local_6688;
          uStack_4390 = uStack_6680;
          local_4378 = local_6378;
          uStack_4370 = uStack_6370;
          local_4368 = local_6678;
          uStack_4360 = uStack_6670;
          local_4348 = local_6368;
          uStack_4340 = uStack_6360;
          local_4338 = local_66e8;
          uStack_4330 = uStack_66e0;
          local_4318 = local_6358;
          uStack_4310 = uStack_6350;
          local_4308 = local_6658;
          uStack_4300 = uStack_6650;
          local_42e8 = local_6348;
          uStack_42e0 = uStack_6340;
          local_42d8 = local_6648;
          uStack_42d0 = uStack_6640;
          local_42b8 = local_6458;
          uStack_42b0 = uStack_6450;
          local_42a8 = local_66b8;
          uStack_42a0 = uStack_66b0;
          local_4288 = local_6448;
          uStack_4280 = uStack_6440;
          local_4278 = local_66a8;
          uStack_4270 = uStack_66a0;
          local_4258 = local_6438;
          uStack_4250 = uStack_6430;
          local_4248 = local_6698;
          uStack_4240 = uStack_6690;
          local_4228 = local_6428;
          uStack_4220 = uStack_6420;
          local_4218 = local_6688;
          uStack_4210 = uStack_6680;
          local_41f8 = local_6418;
          uStack_41f0 = uStack_6410;
          local_41e8 = local_6678;
          uStack_41e0 = uStack_6670;
          local_41c8 = local_6408;
          uStack_41c0 = uStack_6400;
          local_41b8 = local_6668;
          uStack_41b0 = uStack_6660;
          local_4198 = local_63f8;
          uStack_4190 = uStack_63f0;
          local_4188 = local_6658;
          uStack_4180 = uStack_6650;
          local_4168 = local_63e8;
          uStack_4160 = uStack_63e0;
          local_4158 = local_6648;
          uStack_4150 = uStack_6640;
          local_4138 = local_63d8;
          uStack_4130 = uStack_63d0;
          local_4128 = local_6638;
          uStack_4120 = uStack_6630;
          local_4108 = local_63c8;
          uStack_4100 = uStack_63c0;
          local_40f8 = local_66b8;
          uStack_40f0 = uStack_66b0;
          local_40d8 = local_63b8;
          uStack_40d0 = uStack_63b0;
          local_40c8 = local_66a8;
          uStack_40c0 = uStack_66a0;
          local_40a8 = local_63a8;
          uStack_40a0 = uStack_63a0;
          local_4098 = local_6698;
          uStack_4090 = uStack_6690;
          local_4078 = local_6398;
          uStack_4070 = uStack_6390;
          local_4068 = local_6688;
          uStack_4060 = uStack_6680;
          local_4048 = local_6388;
          uStack_4040 = uStack_6380;
          local_4038 = local_6678;
          uStack_4030 = uStack_6670;
          local_4018 = local_6378;
          uStack_4010 = uStack_6370;
          local_4008 = local_6668;
          uStack_4000 = uStack_6660;
          local_3fe8 = local_6368;
          uStack_3fe0 = uStack_6360;
          local_3fd8 = local_6658;
          uStack_3fd0 = uStack_6650;
          local_3fb8 = local_6358;
          uStack_3fb0 = uStack_6350;
          local_3fa8 = local_6648;
          uStack_3fa0 = uStack_6640;
          local_3f88 = local_6348;
          uStack_3f80 = uStack_6340;
          local_3f78 = local_6638;
          uStack_3f70 = uStack_6630;
          local_30c8 = local_66d8;
          uStack_30c0 = uStack_66d0;
          local_30a8 = local_66c8;
          uStack_30a0 = uStack_66c0;
          local_3088 = local_6628;
          uStack_3080 = uStack_6620;
          local_3068 = local_6618;
          uStack_3060 = uStack_6610;
          local_2648 = local_3f98;
          uStack_2640 = uStack_3f90;
          local_2628 = local_3fc8;
          uStack_2620 = uStack_3fc0;
          local_2608 = local_3ff8;
          uStack_2600 = uStack_3ff0;
          local_25e8 = local_4028;
          uStack_25e0 = uStack_4020;
          local_25c8 = local_4058;
          uStack_25c0 = uStack_4050;
          local_25a8 = local_4088;
          uStack_25a0 = uStack_4080;
          local_2588 = local_40b8;
          uStack_2580 = uStack_40b0;
          local_2568 = local_40e8;
          uStack_2560 = uStack_40e0;
          local_2548 = local_4118;
          uStack_2540 = uStack_4110;
          local_2528 = local_4148;
          uStack_2520 = uStack_4140;
          local_2508 = local_4178;
          uStack_2500 = uStack_4170;
          local_24e8 = local_41a8;
          uStack_24e0 = uStack_41a0;
          local_24c8 = local_41d8;
          uStack_24c0 = uStack_41d0;
          local_24a8 = local_4208;
          uStack_24a0 = uStack_4200;
          local_2488 = local_4238;
          uStack_2480 = uStack_4230;
          local_2468 = local_4268;
          uStack_2460 = uStack_4260;
          local_2448 = local_4298;
          uStack_2440 = uStack_4290;
          local_2428 = local_42c8;
          uStack_2420 = uStack_42c0;
          local_2408 = local_42f8;
          uStack_2400 = uStack_42f0;
          local_23e8 = local_4328;
          uStack_23e0 = uStack_4320;
          local_23c8 = local_4358;
          uStack_23c0 = uStack_4350;
          local_23a8 = local_4388;
          uStack_23a0 = uStack_4380;
          local_2388 = local_43b8;
          uStack_2380 = uStack_43b0;
          local_2368 = local_43e8;
          uStack_2360 = uStack_43e0;
          local_2348 = local_4418;
          uStack_2340 = uStack_4410;
          local_2328 = local_4448;
          uStack_2320 = uStack_4440;
          local_2308 = local_4478;
          uStack_2300 = uStack_4470;
          local_22e8 = local_44a8;
          uStack_22e0 = uStack_44a0;
          local_22c8 = local_44d8;
          uStack_22c0 = uStack_44d0;
          local_22a8 = local_4508;
          uStack_22a0 = uStack_4500;
          local_2288 = local_4538;
          uStack_2280 = uStack_4530;
          local_2268 = local_4568;
          uStack_2260 = uStack_4560;
          local_2248 = local_4598;
          uStack_2240 = uStack_4590;
          local_2228 = local_45c8;
          uStack_2220 = uStack_45c0;
          local_2208 = local_45f8;
          uStack_2200 = uStack_45f0;
          local_21e8 = local_4628;
          uStack_21e0 = uStack_4620;
          local_ea8 = local_6348;
          uStack_ea0 = uStack_6340;
          local_e98 = local_6638;
          uStack_e90 = uStack_6630;
          local_e88 = local_6358;
          uStack_e80 = uStack_6350;
          local_e78 = local_6648;
          uStack_e70 = uStack_6640;
          local_e68 = local_6368;
          uStack_e60 = uStack_6360;
          local_e58 = local_6658;
          uStack_e50 = uStack_6650;
          local_e48 = local_6378;
          uStack_e40 = uStack_6370;
          local_e38 = local_6668;
          uStack_e30 = uStack_6660;
          local_e28 = local_6388;
          uStack_e20 = uStack_6380;
          local_e18 = local_6678;
          uStack_e10 = uStack_6670;
          local_e08 = local_6398;
          uStack_e00 = uStack_6390;
          local_df8 = local_6688;
          uStack_df0 = uStack_6680;
          local_de8 = local_63a8;
          uStack_de0 = uStack_63a0;
          local_dd8 = local_6698;
          uStack_dd0 = uStack_6690;
          local_dc8 = local_63b8;
          uStack_dc0 = uStack_63b0;
          local_db8 = local_66a8;
          uStack_db0 = uStack_66a0;
          local_da8 = local_63c8;
          uStack_da0 = uStack_63c0;
          local_d98 = local_66b8;
          uStack_d90 = uStack_66b0;
          local_d88 = local_63d8;
          uStack_d80 = uStack_63d0;
          local_d78 = local_6638;
          uStack_d70 = uStack_6630;
          local_d68 = local_63e8;
          uStack_d60 = uStack_63e0;
          local_d58 = local_6648;
          uStack_d50 = uStack_6640;
          local_d48 = local_63f8;
          uStack_d40 = uStack_63f0;
          local_d38 = local_6658;
          uStack_d30 = uStack_6650;
          local_d28 = local_6408;
          uStack_d20 = uStack_6400;
          local_d18 = local_6668;
          uStack_d10 = uStack_6660;
          local_d08 = local_6418;
          uStack_d00 = uStack_6410;
          local_cf8 = local_6678;
          uStack_cf0 = uStack_6670;
          local_ce8 = local_6428;
          uStack_ce0 = uStack_6420;
          local_cd8 = local_6688;
          uStack_cd0 = uStack_6680;
          local_cc8 = local_6438;
          uStack_cc0 = uStack_6430;
          local_cb8 = local_6698;
          uStack_cb0 = uStack_6690;
          local_ca8 = local_6448;
          uStack_ca0 = uStack_6440;
          local_c98 = local_66a8;
          uStack_c90 = uStack_66a0;
          local_c88 = local_6458;
          uStack_c80 = uStack_6450;
          local_c78 = local_66b8;
          uStack_c70 = uStack_66b0;
          local_c68 = local_6348;
          uStack_c60 = uStack_6340;
          local_c58 = local_6648;
          uStack_c50 = uStack_6640;
          local_c48 = local_6358;
          uStack_c40 = uStack_6350;
          local_c38 = local_6658;
          uStack_c30 = uStack_6650;
          local_c28 = local_6368;
          uStack_c20 = uStack_6360;
          local_c18 = local_66e8;
          uStack_c10 = uStack_66e0;
          local_c08 = local_6378;
          uStack_c00 = uStack_6370;
          local_bf8 = local_6678;
          uStack_bf0 = uStack_6670;
          local_be8 = local_6388;
          uStack_be0 = uStack_6380;
          local_bd8 = local_6688;
          uStack_bd0 = uStack_6680;
          local_bc8 = local_6398;
          uStack_bc0 = uStack_6390;
          local_bb8 = local_66f8;
          uStack_bb0 = uStack_66f0;
          local_ba8 = local_63a8;
          uStack_ba0 = uStack_63a0;
          local_b98 = local_66a8;
          uStack_b90 = uStack_66a0;
          local_b88 = local_63b8;
          uStack_b80 = uStack_63b0;
          local_b78 = local_66b8;
          uStack_b70 = uStack_66b0;
          local_b68 = local_63c8;
          uStack_b60 = uStack_63c0;
          local_b58 = local_6708;
          uStack_b50 = uStack_6700;
          local_b48 = local_63d8;
          uStack_b40 = uStack_63d0;
          local_b38 = local_6648;
          uStack_b30 = uStack_6640;
          local_b28 = local_63e8;
          uStack_b20 = uStack_63e0;
          local_b18 = local_6658;
          uStack_b10 = uStack_6650;
          local_b08 = local_63f8;
          uStack_b00 = uStack_63f0;
          local_af8 = local_66e8;
          uStack_af0 = uStack_66e0;
          local_ae8 = local_6408;
          uStack_ae0 = uStack_6400;
          local_ad8 = local_6678;
          uStack_ad0 = uStack_6670;
          local_ac8 = local_6418;
          uStack_ac0 = uStack_6410;
          local_ab8 = local_6688;
          uStack_ab0 = uStack_6680;
          local_aa8 = local_6428;
          uStack_aa0 = uStack_6420;
          local_a98 = local_66f8;
          uStack_a90 = uStack_66f0;
          local_a88 = local_6438;
          uStack_a80 = uStack_6430;
          local_a78 = local_66a8;
          uStack_a70 = uStack_66a0;
          local_a68 = local_6448;
          uStack_a60 = uStack_6440;
          local_a58 = local_66b8;
          uStack_a50 = uStack_66b0;
          local_a48 = local_6458;
          uStack_a40 = uStack_6450;
          local_a38 = local_6708;
          uStack_a30 = uStack_6700;
        }
        for (; local_6460 < local_6138; local_6460 = local_6460 + 1) {
          local_5660 = local_62c8;
          local_4658 = *(undefined8 *)local_62c8;
          uStack_4650 = *(undefined8 *)(local_62c8 + 2);
          local_5668 = local_62d0;
          local_4808 = *(undefined8 *)local_62d0;
          uStack_4800 = *(undefined8 *)(local_62d0 + 2);
          local_5b08 = *local_6320;
          local_6738 = CONCAT44(local_5b08,local_5b08);
          uStack_6730 = CONCAT44(local_5b08,local_5b08);
          local_5b28 = local_6320[1];
          local_6748 = CONCAT44(local_5b28,local_5b28);
          uStack_6740 = CONCAT44(local_5b28,local_5b28);
          local_5b48 = local_6320[2];
          local_6758 = CONCAT44(local_5b48,local_5b48);
          uStack_6750 = CONCAT44(local_5b48,local_5b48);
          local_5b68 = *local_6328;
          local_6768 = CONCAT44(local_5b68,local_5b68);
          uStack_6760 = CONCAT44(local_5b68,local_5b68);
          local_5b88 = local_6328[1];
          local_6778 = CONCAT44(local_5b88,local_5b88);
          uStack_6770 = CONCAT44(local_5b88,local_5b88);
          local_5ba8 = local_6328[2];
          local_6788 = CONCAT44(local_5ba8,local_5ba8);
          uStack_6780 = CONCAT44(local_5ba8,local_5ba8);
          local_5bc8 = *local_6330;
          local_6798 = CONCAT44(local_5bc8,local_5bc8);
          uStack_6790 = CONCAT44(local_5bc8,local_5bc8);
          local_5be8 = local_6330[1];
          local_67a8 = CONCAT44(local_5be8,local_5be8);
          uStack_67a0 = CONCAT44(local_5be8,local_5be8);
          local_5c08 = local_6330[2];
          local_67b8 = CONCAT44(local_5c08,local_5c08);
          uStack_67b0 = CONCAT44(local_5c08,local_5c08);
          local_21b8 = local_5b08 * (float)local_17a8;
          fStack_21b4 = local_5b08 * local_17a8._4_4_;
          fStack_21b0 = local_5b08 * (float)uStack_17a0;
          fStack_21ac = local_5b08 * uStack_17a0._4_4_;
          local_21c8._0_4_ = (float)local_4658;
          local_21c8._4_4_ = (float)((ulong)local_4658 >> 0x20);
          uStack_21c0._0_4_ = (float)uStack_4650;
          uStack_21c0._4_4_ = (float)((ulong)uStack_4650 >> 0x20);
          local_4688 = CONCAT44(fStack_21b4 + local_21c8._4_4_,local_21b8 + (float)local_21c8);
          uStack_4680 = CONCAT44(fStack_21ac + uStack_21c0._4_4_,fStack_21b0 + (float)uStack_21c0);
          local_2198 = local_5b28 * (float)local_1788;
          fStack_2194 = local_5b28 * local_1788._4_4_;
          fStack_2190 = local_5b28 * (float)uStack_1780;
          fStack_218c = local_5b28 * uStack_1780._4_4_;
          fVar38 = local_2198 + local_21b8 + (float)local_21c8;
          fVar39 = fStack_2194 + fStack_21b4 + local_21c8._4_4_;
          fVar40 = fStack_2190 + fStack_21b0 + (float)uStack_21c0;
          fVar41 = fStack_218c + fStack_21ac + uStack_21c0._4_4_;
          local_46b8 = CONCAT44(fVar39,fVar38);
          uStack_46b0 = CONCAT44(fVar41,fVar40);
          local_2178 = local_5b48 * (float)local_1768;
          fStack_2174 = local_5b48 * local_1768._4_4_;
          fStack_2170 = local_5b48 * (float)uStack_1760;
          fStack_216c = local_5b48 * uStack_1760._4_4_;
          fVar38 = local_2178 + fVar38;
          fVar39 = fStack_2174 + fVar39;
          fVar40 = fStack_2170 + fVar40;
          fVar41 = fStack_216c + fVar41;
          local_46e8 = CONCAT44(fVar39,fVar38);
          uStack_46e0 = CONCAT44(fVar41,fVar40);
          local_2158 = local_5b68 * (float)local_1748;
          fStack_2154 = local_5b68 * local_1748._4_4_;
          fStack_2150 = local_5b68 * (float)uStack_1740;
          fStack_214c = local_5b68 * uStack_1740._4_4_;
          fVar38 = local_2158 + fVar38;
          fVar39 = fStack_2154 + fVar39;
          fVar40 = fStack_2150 + fVar40;
          fVar41 = fStack_214c + fVar41;
          local_4718 = CONCAT44(fVar39,fVar38);
          uStack_4710 = CONCAT44(fVar41,fVar40);
          local_2138 = local_5b88 * (float)local_1728;
          fStack_2134 = local_5b88 * local_1728._4_4_;
          fStack_2130 = local_5b88 * (float)uStack_1720;
          fStack_212c = local_5b88 * uStack_1720._4_4_;
          fVar38 = local_2138 + fVar38;
          fVar39 = fStack_2134 + fVar39;
          fVar40 = fStack_2130 + fVar40;
          fVar41 = fStack_212c + fVar41;
          local_4748 = CONCAT44(fVar39,fVar38);
          uStack_4740 = CONCAT44(fVar41,fVar40);
          local_2118 = local_5ba8 * (float)local_1708;
          fStack_2114 = local_5ba8 * local_1708._4_4_;
          fStack_2110 = local_5ba8 * (float)uStack_1700;
          fStack_210c = local_5ba8 * uStack_1700._4_4_;
          fVar38 = local_2118 + fVar38;
          fVar39 = fStack_2114 + fVar39;
          fVar40 = fStack_2110 + fVar40;
          fVar41 = fStack_210c + fVar41;
          local_4778 = CONCAT44(fVar39,fVar38);
          uStack_4770 = CONCAT44(fVar41,fVar40);
          local_20f8 = local_5bc8 * (float)local_16e8;
          fStack_20f4 = local_5bc8 * local_16e8._4_4_;
          fStack_20f0 = local_5bc8 * (float)uStack_16e0;
          fStack_20ec = local_5bc8 * uStack_16e0._4_4_;
          fVar38 = local_20f8 + fVar38;
          fVar39 = fStack_20f4 + fVar39;
          fVar40 = fStack_20f0 + fVar40;
          fVar41 = fStack_20ec + fVar41;
          local_47a8 = CONCAT44(fVar39,fVar38);
          uStack_47a0 = CONCAT44(fVar41,fVar40);
          local_20d8 = local_5be8 * (float)local_16c8;
          fStack_20d4 = local_5be8 * local_16c8._4_4_;
          fStack_20d0 = local_5be8 * (float)uStack_16c0;
          fStack_20cc = local_5be8 * uStack_16c0._4_4_;
          fVar38 = local_20d8 + fVar38;
          fVar39 = fStack_20d4 + fVar39;
          fVar40 = fStack_20d0 + fVar40;
          fVar41 = fStack_20cc + fVar41;
          local_47d8 = CONCAT44(fVar39,fVar38);
          uStack_47d0 = CONCAT44(fVar41,fVar40);
          local_20b8 = local_5c08 * (float)local_16a8;
          fStack_20b4 = local_5c08 * local_16a8._4_4_;
          fStack_20b0 = local_5c08 * (float)uStack_16a0;
          fStack_20ac = local_5c08 * uStack_16a0._4_4_;
          local_6718 = CONCAT44(fStack_20b4 + fVar39,local_20b8 + fVar38);
          uStack_6710 = CONCAT44(fStack_20ac + fVar41,fStack_20b0 + fVar40);
          local_2098 = local_5b08 * (float)local_1688;
          fStack_2094 = local_5b08 * local_1688._4_4_;
          fStack_2090 = local_5b08 * (float)uStack_1680;
          fStack_208c = local_5b08 * uStack_1680._4_4_;
          local_20a8._0_4_ = (float)local_4808;
          local_20a8._4_4_ = (float)((ulong)local_4808 >> 0x20);
          uStack_20a0._0_4_ = (float)uStack_4800;
          uStack_20a0._4_4_ = (float)((ulong)uStack_4800 >> 0x20);
          local_4838 = CONCAT44(fStack_2094 + local_20a8._4_4_,local_2098 + (float)local_20a8);
          uStack_4830 = CONCAT44(fStack_208c + uStack_20a0._4_4_,fStack_2090 + (float)uStack_20a0);
          local_2078 = local_5b28 * (float)local_1668;
          fStack_2074 = local_5b28 * local_1668._4_4_;
          fStack_2070 = local_5b28 * (float)uStack_1660;
          fStack_206c = local_5b28 * uStack_1660._4_4_;
          fVar38 = local_2078 + local_2098 + (float)local_20a8;
          fVar39 = fStack_2074 + fStack_2094 + local_20a8._4_4_;
          fVar40 = fStack_2070 + fStack_2090 + (float)uStack_20a0;
          fVar41 = fStack_206c + fStack_208c + uStack_20a0._4_4_;
          local_4868 = CONCAT44(fVar39,fVar38);
          uStack_4860 = CONCAT44(fVar41,fVar40);
          local_2058 = local_5b48 * (float)local_1648;
          fStack_2054 = local_5b48 * local_1648._4_4_;
          fStack_2050 = local_5b48 * (float)uStack_1640;
          fStack_204c = local_5b48 * uStack_1640._4_4_;
          fVar38 = local_2058 + fVar38;
          fVar39 = fStack_2054 + fVar39;
          fVar40 = fStack_2050 + fVar40;
          fVar41 = fStack_204c + fVar41;
          local_4898 = CONCAT44(fVar39,fVar38);
          uStack_4890 = CONCAT44(fVar41,fVar40);
          local_2038 = local_5b68 * (float)local_1628;
          fStack_2034 = local_5b68 * local_1628._4_4_;
          fStack_2030 = local_5b68 * (float)uStack_1620;
          fStack_202c = local_5b68 * uStack_1620._4_4_;
          fVar38 = local_2038 + fVar38;
          fVar39 = fStack_2034 + fVar39;
          fVar40 = fStack_2030 + fVar40;
          fVar41 = fStack_202c + fVar41;
          local_48c8 = CONCAT44(fVar39,fVar38);
          uStack_48c0 = CONCAT44(fVar41,fVar40);
          local_2018 = local_5b88 * (float)local_1608;
          fStack_2014 = local_5b88 * local_1608._4_4_;
          fStack_2010 = local_5b88 * (float)uStack_1600;
          fStack_200c = local_5b88 * uStack_1600._4_4_;
          fVar38 = local_2018 + fVar38;
          fVar39 = fStack_2014 + fVar39;
          fVar40 = fStack_2010 + fVar40;
          fVar41 = fStack_200c + fVar41;
          local_48f8 = CONCAT44(fVar39,fVar38);
          uStack_48f0 = CONCAT44(fVar41,fVar40);
          local_1ff8 = local_5ba8 * (float)local_15e8;
          fStack_1ff4 = local_5ba8 * local_15e8._4_4_;
          fStack_1ff0 = local_5ba8 * (float)uStack_15e0;
          fStack_1fec = local_5ba8 * uStack_15e0._4_4_;
          fVar38 = local_1ff8 + fVar38;
          fVar39 = fStack_1ff4 + fVar39;
          fVar40 = fStack_1ff0 + fVar40;
          fVar41 = fStack_1fec + fVar41;
          local_4928 = CONCAT44(fVar39,fVar38);
          uStack_4920 = CONCAT44(fVar41,fVar40);
          local_1fd8 = local_5bc8 * (float)local_15c8;
          fStack_1fd4 = local_5bc8 * local_15c8._4_4_;
          fStack_1fd0 = local_5bc8 * (float)uStack_15c0;
          fStack_1fcc = local_5bc8 * uStack_15c0._4_4_;
          fVar38 = local_1fd8 + fVar38;
          fVar39 = fStack_1fd4 + fVar39;
          fVar40 = fStack_1fd0 + fVar40;
          fVar41 = fStack_1fcc + fVar41;
          local_4958 = CONCAT44(fVar39,fVar38);
          uStack_4950 = CONCAT44(fVar41,fVar40);
          local_1fb8 = local_5be8 * (float)local_15a8;
          fStack_1fb4 = local_5be8 * local_15a8._4_4_;
          fStack_1fb0 = local_5be8 * (float)uStack_15a0;
          fStack_1fac = local_5be8 * uStack_15a0._4_4_;
          fVar38 = local_1fb8 + fVar38;
          fVar39 = fStack_1fb4 + fVar39;
          fVar40 = fStack_1fb0 + fVar40;
          fVar41 = fStack_1fac + fVar41;
          local_4988 = CONCAT44(fVar39,fVar38);
          uStack_4980 = CONCAT44(fVar41,fVar40);
          local_1f98._0_4_ = local_5c08 * (float)local_1588;
          local_1f98._4_4_ = local_5c08 * local_1588._4_4_;
          local_1f98._8_4_ = local_5c08 * (float)uStack_1580;
          local_1f98._12_4_ = local_5c08 * uStack_1580._4_4_;
          local_6728 = CONCAT44(local_1f98._4_4_ + fVar39,local_1f98._0_4_ + fVar38);
          uStack_6720 = CONCAT44(local_1f98._12_4_ + fVar41,local_1f98._8_4_ + fVar40);
          local_30d0 = local_62c8;
          *(undefined8 *)local_62c8 = local_6718;
          *(undefined8 *)(local_62c8 + 2) = uStack_6710;
          local_30f0 = local_62d0;
          *(undefined8 *)local_62d0 = local_6728;
          *(undefined8 *)(local_62d0 + 2) = uStack_6720;
          local_6320 = local_6320 + 1;
          local_6328 = local_6328 + 1;
          local_6330 = local_6330 + 1;
          local_62c8 = local_62c8 + 4;
          local_62d0 = local_62d0 + 4;
          fStack_5c04 = local_5c08;
          fStack_5c00 = local_5c08;
          fStack_5bfc = local_5c08;
          local_5bec = local_5c08;
          fStack_5be4 = local_5be8;
          fStack_5be0 = local_5be8;
          fStack_5bdc = local_5be8;
          local_5bcc = local_5be8;
          fStack_5bc4 = local_5bc8;
          fStack_5bc0 = local_5bc8;
          fStack_5bbc = local_5bc8;
          local_5bac = local_5bc8;
          fStack_5ba4 = local_5ba8;
          fStack_5ba0 = local_5ba8;
          fStack_5b9c = local_5ba8;
          local_5b8c = local_5ba8;
          fStack_5b84 = local_5b88;
          fStack_5b80 = local_5b88;
          fStack_5b7c = local_5b88;
          local_5b6c = local_5b88;
          fStack_5b64 = local_5b68;
          fStack_5b60 = local_5b68;
          fStack_5b5c = local_5b68;
          local_5b4c = local_5b68;
          fStack_5b44 = local_5b48;
          fStack_5b40 = local_5b48;
          fStack_5b3c = local_5b48;
          local_5b2c = local_5b48;
          fStack_5b24 = local_5b28;
          fStack_5b20 = local_5b28;
          fStack_5b1c = local_5b28;
          local_5b0c = local_5b28;
          fStack_5b04 = local_5b08;
          fStack_5b00 = local_5b08;
          fStack_5afc = local_5b08;
          local_5aec = local_5b08;
          local_4978 = local_6458;
          uStack_4970 = uStack_6450;
          local_4968 = local_67b8;
          uStack_4960 = uStack_67b0;
          local_4948 = local_6448;
          uStack_4940 = uStack_6440;
          local_4938 = local_67a8;
          uStack_4930 = uStack_67a0;
          local_4918 = local_6438;
          uStack_4910 = uStack_6430;
          local_4908 = local_6798;
          uStack_4900 = uStack_6790;
          local_48e8 = local_6428;
          uStack_48e0 = uStack_6420;
          local_48d8 = local_6788;
          uStack_48d0 = uStack_6780;
          local_48b8 = local_6418;
          uStack_48b0 = uStack_6410;
          local_48a8 = local_6778;
          uStack_48a0 = uStack_6770;
          local_4888 = local_6408;
          uStack_4880 = uStack_6400;
          local_4878 = local_6768;
          uStack_4870 = uStack_6760;
          local_4858 = local_63f8;
          uStack_4850 = uStack_63f0;
          local_4848 = local_6758;
          uStack_4840 = uStack_6750;
          local_4828 = local_63e8;
          uStack_4820 = uStack_63e0;
          local_4818 = local_6748;
          uStack_4810 = uStack_6740;
          local_47f8 = local_63d8;
          uStack_47f0 = uStack_63d0;
          local_47e8 = local_6738;
          uStack_47e0 = uStack_6730;
          local_47c8 = local_63c8;
          uStack_47c0 = uStack_63c0;
          local_47b8 = local_67b8;
          uStack_47b0 = uStack_67b0;
          local_4798 = local_63b8;
          uStack_4790 = uStack_63b0;
          local_4788 = local_67a8;
          uStack_4780 = uStack_67a0;
          local_4768 = local_63a8;
          uStack_4760 = uStack_63a0;
          local_4758 = local_6798;
          uStack_4750 = uStack_6790;
          local_4738 = local_6398;
          uStack_4730 = uStack_6390;
          local_4728 = local_6788;
          uStack_4720 = uStack_6780;
          local_4708 = local_6388;
          uStack_4700 = uStack_6380;
          local_46f8 = local_6778;
          uStack_46f0 = uStack_6770;
          local_46d8 = local_6378;
          uStack_46d0 = uStack_6370;
          local_46c8 = local_6768;
          uStack_46c0 = uStack_6760;
          local_46a8 = local_6368;
          uStack_46a0 = uStack_6360;
          local_4698 = local_6758;
          uStack_4690 = uStack_6750;
          local_4678 = local_6358;
          uStack_4670 = uStack_6350;
          local_4668 = local_6748;
          uStack_4660 = uStack_6740;
          local_4648 = local_6348;
          uStack_4640 = uStack_6340;
          local_4638 = local_6738;
          uStack_4630 = uStack_6730;
          local_3108 = local_6728;
          uStack_3100 = uStack_6720;
          local_30e8 = local_6718;
          uStack_30e0 = uStack_6710;
          local_21c8 = local_4658;
          uStack_21c0 = uStack_4650;
          local_21a8 = local_4688;
          uStack_21a0 = uStack_4680;
          local_2188 = local_46b8;
          uStack_2180 = uStack_46b0;
          local_2168 = local_46e8;
          uStack_2160 = uStack_46e0;
          local_2148 = local_4718;
          uStack_2140 = uStack_4710;
          local_2128 = local_4748;
          uStack_2120 = uStack_4740;
          local_2108 = local_4778;
          uStack_2100 = uStack_4770;
          local_20e8 = local_47a8;
          uStack_20e0 = uStack_47a0;
          local_20c8 = local_47d8;
          uStack_20c0 = uStack_47d0;
          local_20a8 = local_4808;
          uStack_20a0 = uStack_4800;
          local_2088 = local_4838;
          uStack_2080 = uStack_4830;
          local_2068 = local_4868;
          uStack_2060 = uStack_4860;
          local_2048 = local_4898;
          uStack_2040 = uStack_4890;
          local_2028 = local_48c8;
          uStack_2020 = uStack_48c0;
          local_2008 = local_48f8;
          uStack_2000 = uStack_48f0;
          local_1fe8 = local_4928;
          uStack_1fe0 = uStack_4920;
          local_1fc8 = local_4958;
          uStack_1fc0 = uStack_4950;
          local_1fa8 = local_4988;
          uStack_1fa0 = uStack_4980;
          local_a28 = local_6348;
          uStack_a20 = uStack_6340;
          local_a18 = local_6738;
          uStack_a10 = uStack_6730;
          local_a08 = local_6358;
          uStack_a00 = uStack_6350;
          local_9f8 = local_6748;
          uStack_9f0 = uStack_6740;
          local_9e8 = local_6368;
          uStack_9e0 = uStack_6360;
          local_9d8 = local_6758;
          uStack_9d0 = uStack_6750;
          local_9c8 = local_6378;
          uStack_9c0 = uStack_6370;
          local_9b8 = local_6768;
          uStack_9b0 = uStack_6760;
          local_9a8 = local_6388;
          uStack_9a0 = uStack_6380;
          local_998 = local_6778;
          uStack_990 = uStack_6770;
          local_988 = local_6398;
          uStack_980 = uStack_6390;
          local_978 = local_6788;
          uStack_970 = uStack_6780;
          local_968 = local_63a8;
          uStack_960 = uStack_63a0;
          local_958 = local_6798;
          uStack_950 = uStack_6790;
          local_948 = local_63b8;
          uStack_940 = uStack_63b0;
          local_938 = local_67a8;
          uStack_930 = uStack_67a0;
          local_928 = local_63c8;
          uStack_920 = uStack_63c0;
          local_918 = local_67b8;
          uStack_910 = uStack_67b0;
          local_908 = local_63d8;
          uStack_900 = uStack_63d0;
          local_8f8 = local_6738;
          uStack_8f0 = uStack_6730;
          local_8e8 = local_63e8;
          uStack_8e0 = uStack_63e0;
          local_8d8 = local_6748;
          uStack_8d0 = uStack_6740;
          local_8c8 = local_63f8;
          uStack_8c0 = uStack_63f0;
          local_8b8 = local_6758;
          uStack_8b0 = uStack_6750;
          local_8a8 = local_6408;
          uStack_8a0 = uStack_6400;
          local_898 = local_6768;
          uStack_890 = uStack_6760;
          local_888 = local_6418;
          uStack_880 = uStack_6410;
          local_878 = local_6778;
          uStack_870 = uStack_6770;
          local_868 = local_6428;
          uStack_860 = uStack_6420;
          local_858 = local_6788;
          uStack_850 = uStack_6780;
          local_848 = local_6438;
          uStack_840 = uStack_6430;
          local_838 = local_6798;
          uStack_830 = uStack_6790;
          local_828 = local_6448;
          uStack_820 = uStack_6440;
          local_818 = local_67a8;
          uStack_810 = uStack_67a0;
          local_808 = local_6458;
          uStack_800 = uStack_6450;
          local_7f8 = local_67b8;
          uStack_7f0 = uStack_67b0;
        }
        local_6320 = local_6320 + 2;
        local_6328 = local_6328 + 2;
        local_6330 = local_6330 + 2;
        local_17a8 = uVar1;
        uStack_17a0 = uVar2;
        local_1788 = uVar3;
        uStack_1780 = uVar4;
        local_1768 = uVar5;
        uStack_1760 = uVar6;
        local_1748 = uVar7;
        uStack_1740 = uVar8;
        local_1728 = uVar9;
        uStack_1720 = uVar10;
        local_1708 = uVar11;
        uStack_1700 = uVar12;
        local_16e8 = uVar13;
        uStack_16e0 = uVar14;
        local_16c8 = uVar15;
        uStack_16c0 = uVar16;
        local_16a8 = uVar17;
        uStack_16a0 = uVar18;
        local_1688 = uVar19;
        uStack_1680 = uVar20;
        local_1668 = uVar21;
        uStack_1660 = uVar22;
        local_1648 = uVar23;
        uStack_1640 = uVar24;
        local_1628 = uVar25;
        uStack_1620 = uVar26;
        local_1608 = uVar27;
        uStack_1600 = uVar28;
        local_15e8 = uVar29;
        uStack_15e0 = uVar30;
        local_15c8 = uVar31;
        uStack_15c0 = uVar32;
        local_15a8 = uVar33;
        uStack_15a0 = uVar34;
        local_1588 = uVar35;
        uStack_1580 = uVar36;
      }
      local_6220 = local_6220 + 0x24;
      local_6270 = local_6270 + 0x24;
      Mat::~Mat((Mat *)0x34070f);
    }
    Mat::~Mat((Mat *)0x340732);
    Mat::~Mat((Mat *)0x34073f);
  }
  for (local_67bc = local_6150; local_67bc < local_6140; local_67bc = local_67bc + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffff87ac,in_stack_ffffffffffff87a8),
                 (int)in_stack_ffffffffffff87a4);
    if (local_6148 == (float *)0x0) {
      local_5c0c = 0;
      local_5c28 = 0;
      uStack_5c24 = 0;
      uStack_5c20 = 0;
      uStack_5c1c = 0;
      local_7488 = 0;
      uStack_7480 = 0;
    }
    else {
      local_5670 = local_6148 + (local_67bc << 2);
      local_7488 = *(undefined8 *)local_5670;
      uStack_7480 = *(undefined8 *)(local_5670 + 2);
    }
    local_6818 = local_7488;
    uStack_6810 = uStack_7480;
    _v_01[1] = in_stack_ffffffffffff8794;
    _v_01[0] = in_stack_ffffffffffff8790;
    _v_01[2] = in_stack_ffffffffffff8798;
    _v_01[3] = in_stack_ffffffffffff879c;
    Mat::fill<float__vector(4)>
              ((Mat *)CONCAT44(in_stack_ffffffffffff87a4,in_stack_ffffffffffff87a0),_v_01);
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffff87ac,in_stack_ffffffffffff87a8),
                 (int)in_stack_ffffffffffff87a4);
    pfVar37 = Mat::operator_cast_to_float_(&local_6868);
    Mat::~Mat((Mat *)0x340894);
    local_6820 = pfVar37;
    for (local_686c = 0; local_686c < local_6134; local_686c = local_686c + 1) {
      local_6878 = Mat::row(&local_6808,0);
      Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffff87ac,in_stack_ffffffffffff87a8),
                   (int)in_stack_ffffffffffff87a4);
      local_68c8 = Mat::row(&local_68c0,0);
      local_68d0 = Mat::row(&local_68c0,1);
      local_68d8 = Mat::row(&local_68c0,2);
      local_5678 = local_6820;
      uVar1 = *(undefined8 *)local_6820;
      uVar2 = *(undefined8 *)(local_6820 + 2);
      local_5680 = local_6820 + 4;
      uVar3 = *(undefined8 *)local_5680;
      uVar4 = *(undefined8 *)(local_6820 + 6);
      local_5688 = local_6820 + 8;
      uVar5 = *(undefined8 *)local_5688;
      uVar6 = *(undefined8 *)(local_6820 + 10);
      local_5690 = local_6820 + 0xc;
      uVar7 = *(undefined8 *)local_5690;
      uVar8 = *(undefined8 *)(local_6820 + 0xe);
      local_5698 = local_6820 + 0x10;
      uVar9 = *(undefined8 *)local_5698;
      uVar10 = *(undefined8 *)(local_6820 + 0x12);
      local_56a0 = local_6820 + 0x14;
      uVar11 = *(undefined8 *)local_56a0;
      uVar12 = *(undefined8 *)(local_6820 + 0x16);
      local_56a8 = local_6820 + 0x18;
      uVar13 = *(undefined8 *)local_56a8;
      uVar14 = *(undefined8 *)(local_6820 + 0x1a);
      local_56b0 = local_6820 + 0x1c;
      uVar15 = *(undefined8 *)local_56b0;
      uVar16 = *(undefined8 *)(local_6820 + 0x1e);
      local_56b8 = local_6820 + 0x20;
      uVar17 = *(undefined8 *)local_56b8;
      uVar18 = *(undefined8 *)(local_6820 + 0x22);
      for (local_696c = 0; local_696c < local_613c; local_696c = local_696c + 1) {
        local_6970 = 0;
        while( true ) {
          uVar36 = uStack_6e0;
          uVar35 = local_6e8;
          uVar34 = uStack_700;
          uVar33 = local_708;
          uVar32 = uStack_720;
          uVar31 = local_728;
          uVar30 = uStack_740;
          uVar29 = local_748;
          uVar28 = uStack_760;
          uVar27 = local_768;
          uVar26 = uStack_780;
          uVar25 = local_788;
          uVar24 = uStack_7a0;
          uVar23 = local_7a8;
          uVar22 = uStack_7c0;
          uVar21 = local_7c8;
          uVar20 = uStack_7e0;
          uVar19 = local_7e8;
          local_7e8._0_4_ = (float)uVar1;
          local_7e8._4_4_ = (float)((ulong)uVar1 >> 0x20);
          uStack_7e0._0_4_ = (float)uVar2;
          uStack_7e0._4_4_ = (float)((ulong)uVar2 >> 0x20);
          local_7c8._0_4_ = (float)uVar3;
          local_7c8._4_4_ = (float)((ulong)uVar3 >> 0x20);
          uStack_7c0._0_4_ = (float)uVar4;
          uStack_7c0._4_4_ = (float)((ulong)uVar4 >> 0x20);
          local_7a8._0_4_ = (float)uVar5;
          local_7a8._4_4_ = (float)((ulong)uVar5 >> 0x20);
          uStack_7a0._0_4_ = (float)uVar6;
          uStack_7a0._4_4_ = (float)((ulong)uVar6 >> 0x20);
          local_788._0_4_ = (float)uVar7;
          local_788._4_4_ = (float)((ulong)uVar7 >> 0x20);
          uStack_780._0_4_ = (float)uVar8;
          uStack_780._4_4_ = (float)((ulong)uVar8 >> 0x20);
          local_768._0_4_ = (float)uVar9;
          local_768._4_4_ = (float)((ulong)uVar9 >> 0x20);
          uStack_760._0_4_ = (float)uVar10;
          uStack_760._4_4_ = (float)((ulong)uVar10 >> 0x20);
          local_748._0_4_ = (float)uVar11;
          local_748._4_4_ = (float)((ulong)uVar11 >> 0x20);
          uStack_740._0_4_ = (float)uVar12;
          uStack_740._4_4_ = (float)((ulong)uVar12 >> 0x20);
          local_728._0_4_ = (float)uVar13;
          local_728._4_4_ = (float)((ulong)uVar13 >> 0x20);
          uStack_720._0_4_ = (float)uVar14;
          uStack_720._4_4_ = (float)((ulong)uVar14 >> 0x20);
          local_708._0_4_ = (float)uVar15;
          local_708._4_4_ = (float)((ulong)uVar15 >> 0x20);
          uStack_700._0_4_ = (float)uVar16;
          uStack_700._4_4_ = (float)((ulong)uVar16 >> 0x20);
          local_6e8._0_4_ = (float)uVar17;
          local_6e8._4_4_ = (float)((ulong)uVar17 >> 0x20);
          uStack_6e0._0_4_ = (float)uVar18;
          uStack_6e0._4_4_ = (float)((ulong)uVar18 >> 0x20);
          if (local_6138 <= local_6970 + 3) break;
          local_56c0 = local_6878;
          local_49b8 = *(undefined8 *)local_6878;
          uStack_49b0 = *(undefined8 *)(local_6878 + 2);
          local_5c48 = *local_68c8;
          local_4998 = CONCAT44(local_5c48,local_5c48);
          uStack_4990 = CONCAT44(local_5c48,local_5c48);
          local_5c68 = local_68c8[1];
          local_4b48 = CONCAT44(local_5c68,local_5c68);
          uStack_4b40 = CONCAT44(local_5c68,local_5c68);
          local_5c88 = local_68c8[2];
          local_4cf8 = CONCAT44(local_5c88,local_5c88);
          uStack_4cf0 = CONCAT44(local_5c88,local_5c88);
          local_5ca8 = *local_68d0;
          local_4a28 = CONCAT44(local_5ca8,local_5ca8);
          uStack_4a20 = CONCAT44(local_5ca8,local_5ca8);
          local_5cc8 = local_68d0[1];
          local_4bd8 = CONCAT44(local_5cc8,local_5cc8);
          uStack_4bd0 = CONCAT44(local_5cc8,local_5cc8);
          local_5ce8 = local_68d0[2];
          local_4d88 = CONCAT44(local_5ce8,local_5ce8);
          uStack_4d80 = CONCAT44(local_5ce8,local_5ce8);
          local_5d08 = *local_68d8;
          local_4ab8 = CONCAT44(local_5d08,local_5d08);
          uStack_4ab0 = CONCAT44(local_5d08,local_5d08);
          local_5d28 = local_68d8[1];
          local_4c68 = CONCAT44(local_5d28,local_5d28);
          uStack_4c60 = CONCAT44(local_5d28,local_5d28);
          local_5d48 = local_68d8[2];
          local_4e18 = CONCAT44(local_5d48,local_5d48);
          uStack_4e10 = CONCAT44(local_5d48,local_5d48);
          local_1f78 = local_5c48 * (float)local_7e8;
          fStack_1f74 = local_5c48 * local_7e8._4_4_;
          fStack_1f70 = local_5c48 * (float)uStack_7e0;
          fStack_1f6c = local_5c48 * uStack_7e0._4_4_;
          local_1f88._0_4_ = (float)local_49b8;
          local_1f88._4_4_ = (float)((ulong)local_49b8 >> 0x20);
          uStack_1f80._0_4_ = (float)uStack_49b0;
          uStack_1f80._4_4_ = (float)((ulong)uStack_49b0 >> 0x20);
          local_49e8 = CONCAT44(fStack_1f74 + local_1f88._4_4_,local_1f78 + (float)local_1f88);
          uStack_49e0 = CONCAT44(fStack_1f6c + uStack_1f80._4_4_,fStack_1f70 + (float)uStack_1f80);
          local_1f58 = local_5c68 * (float)local_7c8;
          fStack_1f54 = local_5c68 * local_7c8._4_4_;
          fStack_1f50 = local_5c68 * (float)uStack_7c0;
          fStack_1f4c = local_5c68 * uStack_7c0._4_4_;
          fVar38 = local_1f58 + local_1f78 + (float)local_1f88;
          fVar39 = fStack_1f54 + fStack_1f74 + local_1f88._4_4_;
          fVar40 = fStack_1f50 + fStack_1f70 + (float)uStack_1f80;
          fVar41 = fStack_1f4c + fStack_1f6c + uStack_1f80._4_4_;
          local_4a18 = CONCAT44(fVar39,fVar38);
          uStack_4a10 = CONCAT44(fVar41,fVar40);
          local_1f38 = local_5c88 * (float)local_7a8;
          fStack_1f34 = local_5c88 * local_7a8._4_4_;
          fStack_1f30 = local_5c88 * (float)uStack_7a0;
          fStack_1f2c = local_5c88 * uStack_7a0._4_4_;
          fVar38 = local_1f38 + fVar38;
          fVar39 = fStack_1f34 + fVar39;
          fVar40 = fStack_1f30 + fVar40;
          fVar41 = fStack_1f2c + fVar41;
          local_4a48 = CONCAT44(fVar39,fVar38);
          uStack_4a40 = CONCAT44(fVar41,fVar40);
          local_1f18 = local_5ca8 * (float)local_788;
          fStack_1f14 = local_5ca8 * local_788._4_4_;
          fStack_1f10 = local_5ca8 * (float)uStack_780;
          fStack_1f0c = local_5ca8 * uStack_780._4_4_;
          fVar38 = local_1f18 + fVar38;
          fVar39 = fStack_1f14 + fVar39;
          fVar40 = fStack_1f10 + fVar40;
          fVar41 = fStack_1f0c + fVar41;
          local_4a78 = CONCAT44(fVar39,fVar38);
          uStack_4a70 = CONCAT44(fVar41,fVar40);
          local_1ef8 = local_5cc8 * (float)local_768;
          fStack_1ef4 = local_5cc8 * local_768._4_4_;
          fStack_1ef0 = local_5cc8 * (float)uStack_760;
          fStack_1eec = local_5cc8 * uStack_760._4_4_;
          fVar38 = local_1ef8 + fVar38;
          fVar39 = fStack_1ef4 + fVar39;
          fVar40 = fStack_1ef0 + fVar40;
          fVar41 = fStack_1eec + fVar41;
          local_4aa8 = CONCAT44(fVar39,fVar38);
          uStack_4aa0 = CONCAT44(fVar41,fVar40);
          local_1ed8 = local_5ce8 * (float)local_748;
          fStack_1ed4 = local_5ce8 * local_748._4_4_;
          fStack_1ed0 = local_5ce8 * (float)uStack_740;
          fStack_1ecc = local_5ce8 * uStack_740._4_4_;
          fVar38 = local_1ed8 + fVar38;
          fVar39 = fStack_1ed4 + fVar39;
          fVar40 = fStack_1ed0 + fVar40;
          fVar41 = fStack_1ecc + fVar41;
          local_4ad8 = CONCAT44(fVar39,fVar38);
          uStack_4ad0 = CONCAT44(fVar41,fVar40);
          local_1eb8 = local_5d08 * (float)local_728;
          fStack_1eb4 = local_5d08 * local_728._4_4_;
          fStack_1eb0 = local_5d08 * (float)uStack_720;
          fStack_1eac = local_5d08 * uStack_720._4_4_;
          fVar38 = local_1eb8 + fVar38;
          fVar39 = fStack_1eb4 + fVar39;
          fVar40 = fStack_1eb0 + fVar40;
          fVar41 = fStack_1eac + fVar41;
          local_4b08 = CONCAT44(fVar39,fVar38);
          uStack_4b00 = CONCAT44(fVar41,fVar40);
          local_1e98 = local_5d28 * (float)local_708;
          fStack_1e94 = local_5d28 * local_708._4_4_;
          fStack_1e90 = local_5d28 * (float)uStack_700;
          fStack_1e8c = local_5d28 * uStack_700._4_4_;
          fVar38 = local_1e98 + fVar38;
          fVar39 = fStack_1e94 + fVar39;
          fVar40 = fStack_1e90 + fVar40;
          fVar41 = fStack_1e8c + fVar41;
          local_4b38 = CONCAT44(fVar39,fVar38);
          uStack_4b30 = CONCAT44(fVar41,fVar40);
          local_1e78 = local_5d48 * (float)local_6e8;
          fStack_1e74 = local_5d48 * local_6e8._4_4_;
          fStack_1e70 = local_5d48 * (float)uStack_6e0;
          fStack_1e6c = local_5d48 * uStack_6e0._4_4_;
          local_3128 = CONCAT44(fStack_1e74 + fVar39,local_1e78 + fVar38);
          uStack_3120 = CONCAT44(fStack_1e6c + fVar41,fStack_1e70 + fVar40);
          local_56c8 = local_6878 + 4;
          local_4b68 = *(undefined8 *)local_56c8;
          uStack_4b60 = *(undefined8 *)(local_6878 + 6);
          local_5d68 = local_68c8[3];
          local_4ea8 = CONCAT44(local_5d68,local_5d68);
          uStack_4ea0 = CONCAT44(local_5d68,local_5d68);
          local_5d88 = local_68d0[3];
          local_4f38 = CONCAT44(local_5d88,local_5d88);
          uStack_4f30 = CONCAT44(local_5d88,local_5d88);
          local_5da8 = local_68d8[3];
          local_4fc8 = CONCAT44(local_5da8,local_5da8);
          uStack_4fc0 = CONCAT44(local_5da8,local_5da8);
          local_3110 = local_6878;
          *(undefined8 *)local_6878 = local_3128;
          *(undefined8 *)(local_6878 + 2) = uStack_3120;
          local_1e58 = local_5c68 * (float)local_7e8;
          fStack_1e54 = local_5c68 * local_7e8._4_4_;
          fStack_1e50 = local_5c68 * (float)uStack_7e0;
          fStack_1e4c = local_5c68 * uStack_7e0._4_4_;
          local_1e68._0_4_ = (float)local_4b68;
          local_1e68._4_4_ = (float)((ulong)local_4b68 >> 0x20);
          uStack_1e60._0_4_ = (float)uStack_4b60;
          uStack_1e60._4_4_ = (float)((ulong)uStack_4b60 >> 0x20);
          local_4b98 = CONCAT44(fStack_1e54 + local_1e68._4_4_,local_1e58 + (float)local_1e68);
          uStack_4b90 = CONCAT44(fStack_1e4c + uStack_1e60._4_4_,fStack_1e50 + (float)uStack_1e60);
          local_1e38 = local_5c88 * (float)local_7c8;
          fStack_1e34 = local_5c88 * local_7c8._4_4_;
          fStack_1e30 = local_5c88 * (float)uStack_7c0;
          fStack_1e2c = local_5c88 * uStack_7c0._4_4_;
          fVar38 = local_1e38 + local_1e58 + (float)local_1e68;
          fVar39 = fStack_1e34 + fStack_1e54 + local_1e68._4_4_;
          fVar40 = fStack_1e30 + fStack_1e50 + (float)uStack_1e60;
          fVar41 = fStack_1e2c + fStack_1e4c + uStack_1e60._4_4_;
          local_4bc8 = CONCAT44(fVar39,fVar38);
          uStack_4bc0 = CONCAT44(fVar41,fVar40);
          local_1e18 = local_5d68 * (float)local_7a8;
          fStack_1e14 = local_5d68 * local_7a8._4_4_;
          fStack_1e10 = local_5d68 * (float)uStack_7a0;
          fStack_1e0c = local_5d68 * uStack_7a0._4_4_;
          fVar38 = local_1e18 + fVar38;
          fVar39 = fStack_1e14 + fVar39;
          fVar40 = fStack_1e10 + fVar40;
          fVar41 = fStack_1e0c + fVar41;
          local_4bf8 = CONCAT44(fVar39,fVar38);
          uStack_4bf0 = CONCAT44(fVar41,fVar40);
          local_1df8 = local_5cc8 * (float)local_788;
          fStack_1df4 = local_5cc8 * local_788._4_4_;
          fStack_1df0 = local_5cc8 * (float)uStack_780;
          fStack_1dec = local_5cc8 * uStack_780._4_4_;
          fVar38 = local_1df8 + fVar38;
          fVar39 = fStack_1df4 + fVar39;
          fVar40 = fStack_1df0 + fVar40;
          fVar41 = fStack_1dec + fVar41;
          local_4c28 = CONCAT44(fVar39,fVar38);
          uStack_4c20 = CONCAT44(fVar41,fVar40);
          local_1dd8 = local_5ce8 * (float)local_768;
          fStack_1dd4 = local_5ce8 * local_768._4_4_;
          fStack_1dd0 = local_5ce8 * (float)uStack_760;
          fStack_1dcc = local_5ce8 * uStack_760._4_4_;
          fVar38 = local_1dd8 + fVar38;
          fVar39 = fStack_1dd4 + fVar39;
          fVar40 = fStack_1dd0 + fVar40;
          fVar41 = fStack_1dcc + fVar41;
          local_4c58 = CONCAT44(fVar39,fVar38);
          uStack_4c50 = CONCAT44(fVar41,fVar40);
          local_1db8 = local_5d88 * (float)local_748;
          fStack_1db4 = local_5d88 * local_748._4_4_;
          fStack_1db0 = local_5d88 * (float)uStack_740;
          fStack_1dac = local_5d88 * uStack_740._4_4_;
          fVar38 = local_1db8 + fVar38;
          fVar39 = fStack_1db4 + fVar39;
          fVar40 = fStack_1db0 + fVar40;
          fVar41 = fStack_1dac + fVar41;
          local_4c88 = CONCAT44(fVar39,fVar38);
          uStack_4c80 = CONCAT44(fVar41,fVar40);
          local_1d98 = local_5d28 * (float)local_728;
          fStack_1d94 = local_5d28 * local_728._4_4_;
          fStack_1d90 = local_5d28 * (float)uStack_720;
          fStack_1d8c = local_5d28 * uStack_720._4_4_;
          fVar38 = local_1d98 + fVar38;
          fVar39 = fStack_1d94 + fVar39;
          fVar40 = fStack_1d90 + fVar40;
          fVar41 = fStack_1d8c + fVar41;
          local_4cb8 = CONCAT44(fVar39,fVar38);
          uStack_4cb0 = CONCAT44(fVar41,fVar40);
          local_1d78 = local_5d48 * (float)local_708;
          fStack_1d74 = local_5d48 * local_708._4_4_;
          fStack_1d70 = local_5d48 * (float)uStack_700;
          fStack_1d6c = local_5d48 * uStack_700._4_4_;
          fVar38 = local_1d78 + fVar38;
          fVar39 = fStack_1d74 + fVar39;
          fVar40 = fStack_1d70 + fVar40;
          fVar41 = fStack_1d6c + fVar41;
          local_4ce8 = CONCAT44(fVar39,fVar38);
          uStack_4ce0 = CONCAT44(fVar41,fVar40);
          local_1d58 = local_5da8 * (float)local_6e8;
          fStack_1d54 = local_5da8 * local_6e8._4_4_;
          fStack_1d50 = local_5da8 * (float)uStack_6e0;
          fStack_1d4c = local_5da8 * uStack_6e0._4_4_;
          local_3148 = CONCAT44(fStack_1d54 + fVar39,local_1d58 + fVar38);
          uStack_3140 = CONCAT44(fStack_1d4c + fVar41,fStack_1d50 + fVar40);
          local_56d0 = local_6878 + 8;
          local_4d18 = *(undefined8 *)local_56d0;
          uStack_4d10 = *(undefined8 *)(local_6878 + 10);
          local_5dc8 = local_68c8[4];
          local_4ed8 = CONCAT44(local_5dc8,local_5dc8);
          uStack_4ed0 = CONCAT44(local_5dc8,local_5dc8);
          local_5de8 = local_68d0[4];
          local_4f68 = CONCAT44(local_5de8,local_5de8);
          uStack_4f60 = CONCAT44(local_5de8,local_5de8);
          local_5e08 = local_68d8[4];
          local_4ff8 = CONCAT44(local_5e08,local_5e08);
          uStack_4ff0 = CONCAT44(local_5e08,local_5e08);
          local_3130 = local_6878 + 4;
          *(undefined8 *)local_3130 = local_3148;
          *(undefined8 *)(local_6878 + 6) = uStack_3140;
          local_1d38 = local_5c88 * (float)local_7e8;
          fStack_1d34 = local_5c88 * local_7e8._4_4_;
          fStack_1d30 = local_5c88 * (float)uStack_7e0;
          fStack_1d2c = local_5c88 * uStack_7e0._4_4_;
          local_1d48._0_4_ = (float)local_4d18;
          local_1d48._4_4_ = (float)((ulong)local_4d18 >> 0x20);
          uStack_1d40._0_4_ = (float)uStack_4d10;
          uStack_1d40._4_4_ = (float)((ulong)uStack_4d10 >> 0x20);
          local_4d48 = CONCAT44(fStack_1d34 + local_1d48._4_4_,local_1d38 + (float)local_1d48);
          uStack_4d40 = CONCAT44(fStack_1d2c + uStack_1d40._4_4_,fStack_1d30 + (float)uStack_1d40);
          local_1d18 = local_5d68 * (float)local_7c8;
          fStack_1d14 = local_5d68 * local_7c8._4_4_;
          fStack_1d10 = local_5d68 * (float)uStack_7c0;
          fStack_1d0c = local_5d68 * uStack_7c0._4_4_;
          fVar38 = local_1d18 + local_1d38 + (float)local_1d48;
          fVar39 = fStack_1d14 + fStack_1d34 + local_1d48._4_4_;
          fVar40 = fStack_1d10 + fStack_1d30 + (float)uStack_1d40;
          fVar41 = fStack_1d0c + fStack_1d2c + uStack_1d40._4_4_;
          local_4d78 = CONCAT44(fVar39,fVar38);
          uStack_4d70 = CONCAT44(fVar41,fVar40);
          local_1cf8 = local_5dc8 * (float)local_7a8;
          fStack_1cf4 = local_5dc8 * local_7a8._4_4_;
          fStack_1cf0 = local_5dc8 * (float)uStack_7a0;
          fStack_1cec = local_5dc8 * uStack_7a0._4_4_;
          fVar38 = local_1cf8 + fVar38;
          fVar39 = fStack_1cf4 + fVar39;
          fVar40 = fStack_1cf0 + fVar40;
          fVar41 = fStack_1cec + fVar41;
          local_4da8 = CONCAT44(fVar39,fVar38);
          uStack_4da0 = CONCAT44(fVar41,fVar40);
          local_1cd8 = local_5ce8 * (float)local_788;
          fStack_1cd4 = local_5ce8 * local_788._4_4_;
          fStack_1cd0 = local_5ce8 * (float)uStack_780;
          fStack_1ccc = local_5ce8 * uStack_780._4_4_;
          fVar38 = local_1cd8 + fVar38;
          fVar39 = fStack_1cd4 + fVar39;
          fVar40 = fStack_1cd0 + fVar40;
          fVar41 = fStack_1ccc + fVar41;
          local_4dd8 = CONCAT44(fVar39,fVar38);
          uStack_4dd0 = CONCAT44(fVar41,fVar40);
          local_1cb8 = local_5d88 * (float)local_768;
          fStack_1cb4 = local_5d88 * local_768._4_4_;
          fStack_1cb0 = local_5d88 * (float)uStack_760;
          fStack_1cac = local_5d88 * uStack_760._4_4_;
          fVar38 = local_1cb8 + fVar38;
          fVar39 = fStack_1cb4 + fVar39;
          fVar40 = fStack_1cb0 + fVar40;
          fVar41 = fStack_1cac + fVar41;
          local_4e08 = CONCAT44(fVar39,fVar38);
          uStack_4e00 = CONCAT44(fVar41,fVar40);
          local_1c98 = local_5de8 * (float)local_748;
          fStack_1c94 = local_5de8 * local_748._4_4_;
          fStack_1c90 = local_5de8 * (float)uStack_740;
          fStack_1c8c = local_5de8 * uStack_740._4_4_;
          fVar38 = local_1c98 + fVar38;
          fVar39 = fStack_1c94 + fVar39;
          fVar40 = fStack_1c90 + fVar40;
          fVar41 = fStack_1c8c + fVar41;
          local_4e38 = CONCAT44(fVar39,fVar38);
          uStack_4e30 = CONCAT44(fVar41,fVar40);
          local_1c78 = local_5d48 * (float)local_728;
          fStack_1c74 = local_5d48 * local_728._4_4_;
          fStack_1c70 = local_5d48 * (float)uStack_720;
          fStack_1c6c = local_5d48 * uStack_720._4_4_;
          fVar38 = local_1c78 + fVar38;
          fVar39 = fStack_1c74 + fVar39;
          fVar40 = fStack_1c70 + fVar40;
          fVar41 = fStack_1c6c + fVar41;
          local_4e68 = CONCAT44(fVar39,fVar38);
          uStack_4e60 = CONCAT44(fVar41,fVar40);
          local_1c58 = local_5da8 * (float)local_708;
          fStack_1c54 = local_5da8 * local_708._4_4_;
          fStack_1c50 = local_5da8 * (float)uStack_700;
          fStack_1c4c = local_5da8 * uStack_700._4_4_;
          fVar38 = local_1c58 + fVar38;
          fVar39 = fStack_1c54 + fVar39;
          fVar40 = fStack_1c50 + fVar40;
          fVar41 = fStack_1c4c + fVar41;
          local_4e98 = CONCAT44(fVar39,fVar38);
          uStack_4e90 = CONCAT44(fVar41,fVar40);
          local_1c38 = local_5e08 * (float)local_6e8;
          fStack_1c34 = local_5e08 * local_6e8._4_4_;
          fStack_1c30 = local_5e08 * (float)uStack_6e0;
          fStack_1c2c = local_5e08 * uStack_6e0._4_4_;
          local_3168 = CONCAT44(fStack_1c34 + fVar39,local_1c38 + fVar38);
          uStack_3160 = CONCAT44(fStack_1c2c + fVar41,fStack_1c30 + fVar40);
          local_56d8 = local_6878 + 0xc;
          local_4ec8 = *(undefined8 *)local_56d8;
          uStack_4ec0 = *(undefined8 *)(local_6878 + 0xe);
          local_5e28 = local_68c8[5];
          local_4f08 = CONCAT44(local_5e28,local_5e28);
          uStack_4f00 = CONCAT44(local_5e28,local_5e28);
          local_5e48 = local_68d0[5];
          local_4f98 = CONCAT44(local_5e48,local_5e48);
          uStack_4f90 = CONCAT44(local_5e48,local_5e48);
          local_5e68 = local_68d8[5];
          local_5028 = CONCAT44(local_5e68,local_5e68);
          uStack_5020 = CONCAT44(local_5e68,local_5e68);
          local_3150 = local_6878 + 8;
          *(undefined8 *)local_3150 = local_3168;
          *(undefined8 *)(local_6878 + 10) = uStack_3160;
          local_1c18 = local_5d68 * (float)local_7e8;
          fStack_1c14 = local_5d68 * local_7e8._4_4_;
          fStack_1c10 = local_5d68 * (float)uStack_7e0;
          fStack_1c0c = local_5d68 * uStack_7e0._4_4_;
          local_1c28._0_4_ = (float)local_4ec8;
          local_1c28._4_4_ = (float)((ulong)local_4ec8 >> 0x20);
          uStack_1c20._0_4_ = (float)uStack_4ec0;
          uStack_1c20._4_4_ = (float)((ulong)uStack_4ec0 >> 0x20);
          local_4ef8 = CONCAT44(fStack_1c14 + local_1c28._4_4_,local_1c18 + (float)local_1c28);
          uStack_4ef0 = CONCAT44(fStack_1c0c + uStack_1c20._4_4_,fStack_1c10 + (float)uStack_1c20);
          local_1bf8 = local_5dc8 * (float)local_7c8;
          fStack_1bf4 = local_5dc8 * local_7c8._4_4_;
          fStack_1bf0 = local_5dc8 * (float)uStack_7c0;
          fStack_1bec = local_5dc8 * uStack_7c0._4_4_;
          fVar38 = local_1bf8 + local_1c18 + (float)local_1c28;
          fVar39 = fStack_1bf4 + fStack_1c14 + local_1c28._4_4_;
          fVar40 = fStack_1bf0 + fStack_1c10 + (float)uStack_1c20;
          fVar41 = fStack_1bec + fStack_1c0c + uStack_1c20._4_4_;
          local_4f28 = CONCAT44(fVar39,fVar38);
          uStack_4f20 = CONCAT44(fVar41,fVar40);
          local_1bd8 = local_5e28 * (float)local_7a8;
          fStack_1bd4 = local_5e28 * local_7a8._4_4_;
          fStack_1bd0 = local_5e28 * (float)uStack_7a0;
          fStack_1bcc = local_5e28 * uStack_7a0._4_4_;
          fVar38 = local_1bd8 + fVar38;
          fVar39 = fStack_1bd4 + fVar39;
          fVar40 = fStack_1bd0 + fVar40;
          fVar41 = fStack_1bcc + fVar41;
          local_4f58 = CONCAT44(fVar39,fVar38);
          uStack_4f50 = CONCAT44(fVar41,fVar40);
          local_1bb8 = local_5d88 * (float)local_788;
          fStack_1bb4 = local_5d88 * local_788._4_4_;
          fStack_1bb0 = local_5d88 * (float)uStack_780;
          fStack_1bac = local_5d88 * uStack_780._4_4_;
          fVar38 = local_1bb8 + fVar38;
          fVar39 = fStack_1bb4 + fVar39;
          fVar40 = fStack_1bb0 + fVar40;
          fVar41 = fStack_1bac + fVar41;
          local_4f88 = CONCAT44(fVar39,fVar38);
          uStack_4f80 = CONCAT44(fVar41,fVar40);
          local_1b98 = local_5de8 * (float)local_768;
          fStack_1b94 = local_5de8 * local_768._4_4_;
          fStack_1b90 = local_5de8 * (float)uStack_760;
          fStack_1b8c = local_5de8 * uStack_760._4_4_;
          fVar38 = local_1b98 + fVar38;
          fVar39 = fStack_1b94 + fVar39;
          fVar40 = fStack_1b90 + fVar40;
          fVar41 = fStack_1b8c + fVar41;
          local_4fb8 = CONCAT44(fVar39,fVar38);
          uStack_4fb0 = CONCAT44(fVar41,fVar40);
          local_1b78 = local_5e48 * (float)local_748;
          fStack_1b74 = local_5e48 * local_748._4_4_;
          fStack_1b70 = local_5e48 * (float)uStack_740;
          fStack_1b6c = local_5e48 * uStack_740._4_4_;
          fVar38 = local_1b78 + fVar38;
          fVar39 = fStack_1b74 + fVar39;
          fVar40 = fStack_1b70 + fVar40;
          fVar41 = fStack_1b6c + fVar41;
          local_4fe8 = CONCAT44(fVar39,fVar38);
          uStack_4fe0 = CONCAT44(fVar41,fVar40);
          local_1b58 = local_5da8 * (float)local_728;
          fStack_1b54 = local_5da8 * local_728._4_4_;
          fStack_1b50 = local_5da8 * (float)uStack_720;
          fStack_1b4c = local_5da8 * uStack_720._4_4_;
          fVar38 = local_1b58 + fVar38;
          fVar39 = fStack_1b54 + fVar39;
          fVar40 = fStack_1b50 + fVar40;
          fVar41 = fStack_1b4c + fVar41;
          local_5018 = CONCAT44(fVar39,fVar38);
          uStack_5010 = CONCAT44(fVar41,fVar40);
          local_1b38 = local_5e08 * (float)local_708;
          fStack_1b34 = local_5e08 * local_708._4_4_;
          fStack_1b30 = local_5e08 * (float)uStack_700;
          fStack_1b2c = local_5e08 * uStack_700._4_4_;
          fVar38 = local_1b38 + fVar38;
          fVar39 = fStack_1b34 + fVar39;
          fVar40 = fStack_1b30 + fVar40;
          fVar41 = fStack_1b2c + fVar41;
          local_5048 = CONCAT44(fVar39,fVar38);
          uStack_5040 = CONCAT44(fVar41,fVar40);
          local_1b18._0_4_ = local_5e68 * (float)local_6e8;
          local_1b18._4_4_ = local_5e68 * local_6e8._4_4_;
          local_1b18._8_4_ = local_5e68 * (float)uStack_6e0;
          local_1b18._12_4_ = local_5e68 * uStack_6e0._4_4_;
          local_3188 = CONCAT44(local_1b18._4_4_ + fVar39,local_1b18._0_4_ + fVar38);
          uStack_3180 = CONCAT44(local_1b18._12_4_ + fVar41,local_1b18._8_4_ + fVar40);
          local_3170 = local_6878 + 0xc;
          *(undefined8 *)local_3170 = local_3188;
          *(undefined8 *)(local_6878 + 0xe) = uStack_3180;
          local_68c8 = local_68c8 + 4;
          local_68d0 = local_68d0 + 4;
          local_68d8 = local_68d8 + 4;
          local_6878 = local_6878 + 0x10;
          local_6970 = local_6970 + 4;
          fStack_5e64 = local_5e68;
          fStack_5e60 = local_5e68;
          fStack_5e5c = local_5e68;
          local_5e4c = local_5e68;
          fStack_5e44 = local_5e48;
          fStack_5e40 = local_5e48;
          fStack_5e3c = local_5e48;
          local_5e2c = local_5e48;
          fStack_5e24 = local_5e28;
          fStack_5e20 = local_5e28;
          fStack_5e1c = local_5e28;
          local_5e0c = local_5e28;
          fStack_5e04 = local_5e08;
          fStack_5e00 = local_5e08;
          fStack_5dfc = local_5e08;
          local_5dec = local_5e08;
          fStack_5de4 = local_5de8;
          fStack_5de0 = local_5de8;
          fStack_5ddc = local_5de8;
          local_5dcc = local_5de8;
          fStack_5dc4 = local_5dc8;
          fStack_5dc0 = local_5dc8;
          fStack_5dbc = local_5dc8;
          local_5dac = local_5dc8;
          fStack_5da4 = local_5da8;
          fStack_5da0 = local_5da8;
          fStack_5d9c = local_5da8;
          local_5d8c = local_5da8;
          fStack_5d84 = local_5d88;
          fStack_5d80 = local_5d88;
          fStack_5d7c = local_5d88;
          local_5d6c = local_5d88;
          fStack_5d64 = local_5d68;
          fStack_5d60 = local_5d68;
          fStack_5d5c = local_5d68;
          local_5d4c = local_5d68;
          fStack_5d44 = local_5d48;
          fStack_5d40 = local_5d48;
          fStack_5d3c = local_5d48;
          local_5d2c = local_5d48;
          fStack_5d24 = local_5d28;
          fStack_5d20 = local_5d28;
          fStack_5d1c = local_5d28;
          local_5d0c = local_5d28;
          fStack_5d04 = local_5d08;
          fStack_5d00 = local_5d08;
          fStack_5cfc = local_5d08;
          local_5cec = local_5d08;
          fStack_5ce4 = local_5ce8;
          fStack_5ce0 = local_5ce8;
          fStack_5cdc = local_5ce8;
          local_5ccc = local_5ce8;
          fStack_5cc4 = local_5cc8;
          fStack_5cc0 = local_5cc8;
          fStack_5cbc = local_5cc8;
          local_5cac = local_5cc8;
          fStack_5ca4 = local_5ca8;
          fStack_5ca0 = local_5ca8;
          fStack_5c9c = local_5ca8;
          local_5c8c = local_5ca8;
          fStack_5c84 = local_5c88;
          fStack_5c80 = local_5c88;
          fStack_5c7c = local_5c88;
          local_5c6c = local_5c88;
          fStack_5c64 = local_5c68;
          fStack_5c60 = local_5c68;
          fStack_5c5c = local_5c68;
          local_5c4c = local_5c68;
          fStack_5c44 = local_5c48;
          fStack_5c40 = local_5c48;
          fStack_5c3c = local_5c48;
          local_5c2c = local_5c48;
          local_5038 = uVar17;
          uStack_5030 = uVar18;
          local_5008 = uVar15;
          uStack_5000 = uVar16;
          local_4fd8 = uVar13;
          uStack_4fd0 = uVar14;
          local_4fa8 = uVar11;
          uStack_4fa0 = uVar12;
          local_4f78 = uVar9;
          uStack_4f70 = uVar10;
          local_4f48 = uVar7;
          uStack_4f40 = uVar8;
          local_4f18 = uVar5;
          uStack_4f10 = uVar6;
          local_4ee8 = uVar3;
          uStack_4ee0 = uVar4;
          local_4eb8 = uVar1;
          uStack_4eb0 = uVar2;
          local_4e88 = uVar17;
          uStack_4e80 = uVar18;
          local_4e78 = local_4ff8;
          uStack_4e70 = uStack_4ff0;
          local_4e58 = uVar15;
          uStack_4e50 = uVar16;
          local_4e48 = local_4fc8;
          uStack_4e40 = uStack_4fc0;
          local_4e28 = uVar13;
          uStack_4e20 = uVar14;
          local_4df8 = uVar11;
          uStack_4df0 = uVar12;
          local_4de8 = local_4f68;
          uStack_4de0 = uStack_4f60;
          local_4dc8 = uVar9;
          uStack_4dc0 = uVar10;
          local_4db8 = local_4f38;
          uStack_4db0 = uStack_4f30;
          local_4d98 = uVar7;
          uStack_4d90 = uVar8;
          local_4d68 = uVar5;
          uStack_4d60 = uVar6;
          local_4d58 = local_4ed8;
          uStack_4d50 = uStack_4ed0;
          local_4d38 = uVar3;
          uStack_4d30 = uVar4;
          local_4d28 = local_4ea8;
          uStack_4d20 = uStack_4ea0;
          local_4d08 = uVar1;
          uStack_4d00 = uVar2;
          local_4cd8 = uVar17;
          uStack_4cd0 = uVar18;
          local_4cc8 = local_4fc8;
          uStack_4cc0 = uStack_4fc0;
          local_4ca8 = uVar15;
          uStack_4ca0 = uVar16;
          local_4c98 = local_4e18;
          uStack_4c90 = uStack_4e10;
          local_4c78 = uVar13;
          uStack_4c70 = uVar14;
          local_4c48 = uVar11;
          uStack_4c40 = uVar12;
          local_4c38 = local_4f38;
          uStack_4c30 = uStack_4f30;
          local_4c18 = uVar9;
          uStack_4c10 = uVar10;
          local_4c08 = local_4d88;
          uStack_4c00 = uStack_4d80;
          local_4be8 = uVar7;
          uStack_4be0 = uVar8;
          local_4bb8 = uVar5;
          uStack_4bb0 = uVar6;
          local_4ba8 = local_4ea8;
          uStack_4ba0 = uStack_4ea0;
          local_4b88 = uVar3;
          uStack_4b80 = uVar4;
          local_4b78 = local_4cf8;
          uStack_4b70 = uStack_4cf0;
          local_4b58 = uVar1;
          uStack_4b50 = uVar2;
          local_4b28 = uVar17;
          uStack_4b20 = uVar18;
          local_4b18 = local_4e18;
          uStack_4b10 = uStack_4e10;
          local_4af8 = uVar15;
          uStack_4af0 = uVar16;
          local_4ae8 = local_4c68;
          uStack_4ae0 = uStack_4c60;
          local_4ac8 = uVar13;
          uStack_4ac0 = uVar14;
          local_4a98 = uVar11;
          uStack_4a90 = uVar12;
          local_4a88 = local_4d88;
          uStack_4a80 = uStack_4d80;
          local_4a68 = uVar9;
          uStack_4a60 = uVar10;
          local_4a58 = local_4bd8;
          uStack_4a50 = uStack_4bd0;
          local_4a38 = uVar7;
          uStack_4a30 = uVar8;
          local_4a08 = uVar5;
          uStack_4a00 = uVar6;
          local_49f8 = local_4cf8;
          uStack_49f0 = uStack_4cf0;
          local_49d8 = uVar3;
          uStack_49d0 = uVar4;
          local_49c8 = local_4b48;
          uStack_49c0 = uStack_4b40;
          local_49a8 = uVar1;
          uStack_49a0 = uVar2;
          local_1f88 = local_49b8;
          uStack_1f80 = uStack_49b0;
          local_1f68 = local_49e8;
          uStack_1f60 = uStack_49e0;
          local_1f48 = local_4a18;
          uStack_1f40 = uStack_4a10;
          local_1f28 = local_4a48;
          uStack_1f20 = uStack_4a40;
          local_1f08 = local_4a78;
          uStack_1f00 = uStack_4a70;
          local_1ee8 = local_4aa8;
          uStack_1ee0 = uStack_4aa0;
          local_1ec8 = local_4ad8;
          uStack_1ec0 = uStack_4ad0;
          local_1ea8 = local_4b08;
          uStack_1ea0 = uStack_4b00;
          local_1e88 = local_4b38;
          uStack_1e80 = uStack_4b30;
          local_1e68 = local_4b68;
          uStack_1e60 = uStack_4b60;
          local_1e48 = local_4b98;
          uStack_1e40 = uStack_4b90;
          local_1e28 = local_4bc8;
          uStack_1e20 = uStack_4bc0;
          local_1e08 = local_4bf8;
          uStack_1e00 = uStack_4bf0;
          local_1de8 = local_4c28;
          uStack_1de0 = uStack_4c20;
          local_1dc8 = local_4c58;
          uStack_1dc0 = uStack_4c50;
          local_1da8 = local_4c88;
          uStack_1da0 = uStack_4c80;
          local_1d88 = local_4cb8;
          uStack_1d80 = uStack_4cb0;
          local_1d68 = local_4ce8;
          uStack_1d60 = uStack_4ce0;
          local_1d48 = local_4d18;
          uStack_1d40 = uStack_4d10;
          local_1d28 = local_4d48;
          uStack_1d20 = uStack_4d40;
          local_1d08 = local_4d78;
          uStack_1d00 = uStack_4d70;
          local_1ce8 = local_4da8;
          uStack_1ce0 = uStack_4da0;
          local_1cc8 = local_4dd8;
          uStack_1cc0 = uStack_4dd0;
          local_1ca8 = local_4e08;
          uStack_1ca0 = uStack_4e00;
          local_1c88 = local_4e38;
          uStack_1c80 = uStack_4e30;
          local_1c68 = local_4e68;
          uStack_1c60 = uStack_4e60;
          local_1c48 = local_4e98;
          uStack_1c40 = uStack_4e90;
          local_1c28 = local_4ec8;
          uStack_1c20 = uStack_4ec0;
          local_1c08 = local_4ef8;
          uStack_1c00 = uStack_4ef0;
          local_1be8 = local_4f28;
          uStack_1be0 = uStack_4f20;
          local_1bc8 = local_4f58;
          uStack_1bc0 = uStack_4f50;
          local_1ba8 = local_4f88;
          uStack_1ba0 = uStack_4f80;
          local_1b88 = local_4fb8;
          uStack_1b80 = uStack_4fb0;
          local_1b68 = local_4fe8;
          uStack_1b60 = uStack_4fe0;
          local_1b48 = local_5018;
          uStack_1b40 = uStack_5010;
          local_1b28 = local_5048;
          uStack_1b20 = uStack_5040;
          local_7e8 = uVar1;
          uStack_7e0 = uVar2;
          local_7d8 = local_4998;
          uStack_7d0 = uStack_4990;
          local_7c8 = uVar3;
          uStack_7c0 = uVar4;
          local_7b8 = local_4b48;
          uStack_7b0 = uStack_4b40;
          local_7a8 = uVar5;
          uStack_7a0 = uVar6;
          local_798 = local_4cf8;
          uStack_790 = uStack_4cf0;
          local_788 = uVar7;
          uStack_780 = uVar8;
          local_778 = local_4a28;
          uStack_770 = uStack_4a20;
          local_768 = uVar9;
          uStack_760 = uVar10;
          local_758 = local_4bd8;
          uStack_750 = uStack_4bd0;
          local_748 = uVar11;
          uStack_740 = uVar12;
          local_738 = local_4d88;
          uStack_730 = uStack_4d80;
          local_728 = uVar13;
          uStack_720 = uVar14;
          local_718 = local_4ab8;
          uStack_710 = uStack_4ab0;
          local_708 = uVar15;
          uStack_700 = uVar16;
          local_6f8 = local_4c68;
          uStack_6f0 = uStack_4c60;
          local_6e8 = uVar17;
          uStack_6e0 = uVar18;
          local_6d8 = local_4e18;
          uStack_6d0 = uStack_4e10;
          local_6c8 = uVar1;
          uStack_6c0 = uVar2;
          local_6b8 = local_4b48;
          uStack_6b0 = uStack_4b40;
          local_6a8 = uVar3;
          uStack_6a0 = uVar4;
          local_698 = local_4cf8;
          uStack_690 = uStack_4cf0;
          local_688 = uVar5;
          uStack_680 = uVar6;
          local_678 = local_4ea8;
          uStack_670 = uStack_4ea0;
          local_668 = uVar7;
          uStack_660 = uVar8;
          local_658 = local_4bd8;
          uStack_650 = uStack_4bd0;
          local_648 = uVar9;
          uStack_640 = uVar10;
          local_638 = local_4d88;
          uStack_630 = uStack_4d80;
          local_628 = uVar11;
          uStack_620 = uVar12;
          local_618 = local_4f38;
          uStack_610 = uStack_4f30;
          local_608 = uVar13;
          uStack_600 = uVar14;
          local_5f8 = local_4c68;
          uStack_5f0 = uStack_4c60;
          local_5e8 = uVar15;
          uStack_5e0 = uVar16;
          local_5d8 = local_4e18;
          uStack_5d0 = uStack_4e10;
          local_5c8 = uVar17;
          uStack_5c0 = uVar18;
          local_5b8 = local_4fc8;
          uStack_5b0 = uStack_4fc0;
          local_5a8 = uVar1;
          uStack_5a0 = uVar2;
          local_598 = local_4cf8;
          uStack_590 = uStack_4cf0;
          local_588 = uVar3;
          uStack_580 = uVar4;
          local_578 = local_4ea8;
          uStack_570 = uStack_4ea0;
          local_568 = uVar5;
          uStack_560 = uVar6;
          local_558 = local_4ed8;
          uStack_550 = uStack_4ed0;
          local_548 = uVar7;
          uStack_540 = uVar8;
          local_538 = local_4d88;
          uStack_530 = uStack_4d80;
          local_528 = uVar9;
          uStack_520 = uVar10;
          local_518 = local_4f38;
          uStack_510 = uStack_4f30;
          local_508 = uVar11;
          uStack_500 = uVar12;
          local_4f8 = local_4f68;
          uStack_4f0 = uStack_4f60;
          local_4e8 = uVar13;
          uStack_4e0 = uVar14;
          local_4d8 = local_4e18;
          uStack_4d0 = uStack_4e10;
          local_4c8 = uVar15;
          uStack_4c0 = uVar16;
          local_4b8 = local_4fc8;
          uStack_4b0 = uStack_4fc0;
          local_4a8 = uVar17;
          uStack_4a0 = uVar18;
          local_498 = local_4ff8;
          uStack_490 = uStack_4ff0;
          local_488 = uVar1;
          uStack_480 = uVar2;
          local_478 = local_4ea8;
          uStack_470 = uStack_4ea0;
          local_468 = uVar3;
          uStack_460 = uVar4;
          local_458 = local_4ed8;
          uStack_450 = uStack_4ed0;
          local_448 = uVar5;
          uStack_440 = uVar6;
          local_438 = local_4f08;
          uStack_430 = uStack_4f00;
          local_428 = uVar7;
          uStack_420 = uVar8;
          local_418 = local_4f38;
          uStack_410 = uStack_4f30;
          local_408 = uVar9;
          uStack_400 = uVar10;
          local_3f8 = local_4f68;
          uStack_3f0 = uStack_4f60;
          local_3e8 = uVar11;
          uStack_3e0 = uVar12;
          local_3d8 = local_4f98;
          uStack_3d0 = uStack_4f90;
          local_3c8 = uVar13;
          uStack_3c0 = uVar14;
          local_3b8 = local_4fc8;
          uStack_3b0 = uStack_4fc0;
          local_3a8 = uVar15;
          uStack_3a0 = uVar16;
          local_398 = local_4ff8;
          uStack_390 = uStack_4ff0;
          local_388 = uVar17;
          uStack_380 = uVar18;
          local_378 = local_5028;
          uStack_370 = uStack_5020;
        }
        for (; local_6970 + 1 < local_6138; local_6970 = local_6970 + 2) {
          local_56e0 = local_6878;
          local_5078 = *(undefined8 *)local_6878;
          uStack_5070 = *(undefined8 *)(local_6878 + 2);
          local_5e88 = *local_68c8;
          local_5058 = CONCAT44(local_5e88,local_5e88);
          uStack_5050 = CONCAT44(local_5e88,local_5e88);
          local_5ea8 = local_68c8[1];
          local_5208 = CONCAT44(local_5ea8,local_5ea8);
          uStack_5200 = CONCAT44(local_5ea8,local_5ea8);
          local_5ec8 = local_68c8[2];
          local_5238 = CONCAT44(local_5ec8,local_5ec8);
          uStack_5230 = CONCAT44(local_5ec8,local_5ec8);
          local_5ee8 = *local_68d0;
          local_50e8 = CONCAT44(local_5ee8,local_5ee8);
          uStack_50e0 = CONCAT44(local_5ee8,local_5ee8);
          local_5f08 = local_68d0[1];
          local_5298 = CONCAT44(local_5f08,local_5f08);
          uStack_5290 = CONCAT44(local_5f08,local_5f08);
          local_5f28 = local_68d0[2];
          local_52c8 = CONCAT44(local_5f28,local_5f28);
          uStack_52c0 = CONCAT44(local_5f28,local_5f28);
          local_5f48 = *local_68d8;
          local_5178 = CONCAT44(local_5f48,local_5f48);
          uStack_5170 = CONCAT44(local_5f48,local_5f48);
          local_5f68 = local_68d8[1];
          local_5328 = CONCAT44(local_5f68,local_5f68);
          uStack_5320 = CONCAT44(local_5f68,local_5f68);
          local_5f88 = local_68d8[2];
          local_5358 = CONCAT44(local_5f88,local_5f88);
          uStack_5350 = CONCAT44(local_5f88,local_5f88);
          local_1af8 = local_5e88 * (float)local_7e8;
          fStack_1af4 = local_5e88 * local_7e8._4_4_;
          fStack_1af0 = local_5e88 * (float)uStack_7e0;
          fStack_1aec = local_5e88 * uStack_7e0._4_4_;
          local_1b08._0_4_ = (float)local_5078;
          local_1b08._4_4_ = (float)((ulong)local_5078 >> 0x20);
          uStack_1b00._0_4_ = (float)uStack_5070;
          uStack_1b00._4_4_ = (float)((ulong)uStack_5070 >> 0x20);
          local_50a8 = CONCAT44(fStack_1af4 + local_1b08._4_4_,local_1af8 + (float)local_1b08);
          uStack_50a0 = CONCAT44(fStack_1aec + uStack_1b00._4_4_,fStack_1af0 + (float)uStack_1b00);
          local_1ad8 = local_5ea8 * (float)local_7c8;
          fStack_1ad4 = local_5ea8 * local_7c8._4_4_;
          fStack_1ad0 = local_5ea8 * (float)uStack_7c0;
          fStack_1acc = local_5ea8 * uStack_7c0._4_4_;
          fVar38 = local_1ad8 + local_1af8 + (float)local_1b08;
          fVar39 = fStack_1ad4 + fStack_1af4 + local_1b08._4_4_;
          fVar40 = fStack_1ad0 + fStack_1af0 + (float)uStack_1b00;
          fVar41 = fStack_1acc + fStack_1aec + uStack_1b00._4_4_;
          local_50d8 = CONCAT44(fVar39,fVar38);
          uStack_50d0 = CONCAT44(fVar41,fVar40);
          local_1ab8 = local_5ec8 * (float)local_7a8;
          fStack_1ab4 = local_5ec8 * local_7a8._4_4_;
          fStack_1ab0 = local_5ec8 * (float)uStack_7a0;
          fStack_1aac = local_5ec8 * uStack_7a0._4_4_;
          fVar38 = local_1ab8 + fVar38;
          fVar39 = fStack_1ab4 + fVar39;
          fVar40 = fStack_1ab0 + fVar40;
          fVar41 = fStack_1aac + fVar41;
          local_5108 = CONCAT44(fVar39,fVar38);
          uStack_5100 = CONCAT44(fVar41,fVar40);
          local_1a98 = local_5ee8 * (float)local_788;
          fStack_1a94 = local_5ee8 * local_788._4_4_;
          fStack_1a90 = local_5ee8 * (float)uStack_780;
          fStack_1a8c = local_5ee8 * uStack_780._4_4_;
          fVar38 = local_1a98 + fVar38;
          fVar39 = fStack_1a94 + fVar39;
          fVar40 = fStack_1a90 + fVar40;
          fVar41 = fStack_1a8c + fVar41;
          local_5138 = CONCAT44(fVar39,fVar38);
          uStack_5130 = CONCAT44(fVar41,fVar40);
          local_1a78 = local_5f08 * (float)local_768;
          fStack_1a74 = local_5f08 * local_768._4_4_;
          fStack_1a70 = local_5f08 * (float)uStack_760;
          fStack_1a6c = local_5f08 * uStack_760._4_4_;
          fVar38 = local_1a78 + fVar38;
          fVar39 = fStack_1a74 + fVar39;
          fVar40 = fStack_1a70 + fVar40;
          fVar41 = fStack_1a6c + fVar41;
          local_5168 = CONCAT44(fVar39,fVar38);
          uStack_5160 = CONCAT44(fVar41,fVar40);
          local_1a58 = local_5f28 * (float)local_748;
          fStack_1a54 = local_5f28 * local_748._4_4_;
          fStack_1a50 = local_5f28 * (float)uStack_740;
          fStack_1a4c = local_5f28 * uStack_740._4_4_;
          fVar38 = local_1a58 + fVar38;
          fVar39 = fStack_1a54 + fVar39;
          fVar40 = fStack_1a50 + fVar40;
          fVar41 = fStack_1a4c + fVar41;
          local_5198 = CONCAT44(fVar39,fVar38);
          uStack_5190 = CONCAT44(fVar41,fVar40);
          local_1a38 = local_5f48 * (float)local_728;
          fStack_1a34 = local_5f48 * local_728._4_4_;
          fStack_1a30 = local_5f48 * (float)uStack_720;
          fStack_1a2c = local_5f48 * uStack_720._4_4_;
          fVar38 = local_1a38 + fVar38;
          fVar39 = fStack_1a34 + fVar39;
          fVar40 = fStack_1a30 + fVar40;
          fVar41 = fStack_1a2c + fVar41;
          local_51c8 = CONCAT44(fVar39,fVar38);
          uStack_51c0 = CONCAT44(fVar41,fVar40);
          local_1a18 = local_5f68 * (float)local_708;
          fStack_1a14 = local_5f68 * local_708._4_4_;
          fStack_1a10 = local_5f68 * (float)uStack_700;
          fStack_1a0c = local_5f68 * uStack_700._4_4_;
          fVar38 = local_1a18 + fVar38;
          fVar39 = fStack_1a14 + fVar39;
          fVar40 = fStack_1a10 + fVar40;
          fVar41 = fStack_1a0c + fVar41;
          local_51f8 = CONCAT44(fVar39,fVar38);
          uStack_51f0 = CONCAT44(fVar41,fVar40);
          local_19f8 = local_5f88 * (float)local_6e8;
          fStack_19f4 = local_5f88 * local_6e8._4_4_;
          fStack_19f0 = local_5f88 * (float)uStack_6e0;
          fStack_19ec = local_5f88 * uStack_6e0._4_4_;
          local_31a8 = CONCAT44(fStack_19f4 + fVar39,local_19f8 + fVar38);
          uStack_31a0 = CONCAT44(fStack_19ec + fVar41,fStack_19f0 + fVar40);
          local_56e8 = local_6878 + 4;
          local_5228 = *(undefined8 *)local_56e8;
          uStack_5220 = *(undefined8 *)(local_6878 + 6);
          local_5fa8 = local_68c8[3];
          local_5268 = CONCAT44(local_5fa8,local_5fa8);
          uStack_5260 = CONCAT44(local_5fa8,local_5fa8);
          local_5fc8 = local_68d0[3];
          local_52f8 = CONCAT44(local_5fc8,local_5fc8);
          uStack_52f0 = CONCAT44(local_5fc8,local_5fc8);
          local_5fe8 = local_68d8[3];
          local_5388 = CONCAT44(local_5fe8,local_5fe8);
          uStack_5380 = CONCAT44(local_5fe8,local_5fe8);
          local_3190 = local_6878;
          *(undefined8 *)local_6878 = local_31a8;
          *(undefined8 *)(local_6878 + 2) = uStack_31a0;
          local_19d8 = local_5ea8 * (float)local_7e8;
          fStack_19d4 = local_5ea8 * local_7e8._4_4_;
          fStack_19d0 = local_5ea8 * (float)uStack_7e0;
          fStack_19cc = local_5ea8 * uStack_7e0._4_4_;
          local_19e8._0_4_ = (float)local_5228;
          local_19e8._4_4_ = (float)((ulong)local_5228 >> 0x20);
          uStack_19e0._0_4_ = (float)uStack_5220;
          uStack_19e0._4_4_ = (float)((ulong)uStack_5220 >> 0x20);
          local_5258 = CONCAT44(fStack_19d4 + local_19e8._4_4_,local_19d8 + (float)local_19e8);
          uStack_5250 = CONCAT44(fStack_19cc + uStack_19e0._4_4_,fStack_19d0 + (float)uStack_19e0);
          local_19b8 = local_5ec8 * (float)local_7c8;
          fStack_19b4 = local_5ec8 * local_7c8._4_4_;
          fStack_19b0 = local_5ec8 * (float)uStack_7c0;
          fStack_19ac = local_5ec8 * uStack_7c0._4_4_;
          fVar38 = local_19b8 + local_19d8 + (float)local_19e8;
          fVar39 = fStack_19b4 + fStack_19d4 + local_19e8._4_4_;
          fVar40 = fStack_19b0 + fStack_19d0 + (float)uStack_19e0;
          fVar41 = fStack_19ac + fStack_19cc + uStack_19e0._4_4_;
          local_5288 = CONCAT44(fVar39,fVar38);
          uStack_5280 = CONCAT44(fVar41,fVar40);
          local_1998 = local_5fa8 * (float)local_7a8;
          fStack_1994 = local_5fa8 * local_7a8._4_4_;
          fStack_1990 = local_5fa8 * (float)uStack_7a0;
          fStack_198c = local_5fa8 * uStack_7a0._4_4_;
          fVar38 = local_1998 + fVar38;
          fVar39 = fStack_1994 + fVar39;
          fVar40 = fStack_1990 + fVar40;
          fVar41 = fStack_198c + fVar41;
          local_52b8 = CONCAT44(fVar39,fVar38);
          uStack_52b0 = CONCAT44(fVar41,fVar40);
          local_1978 = local_5f08 * (float)local_788;
          fStack_1974 = local_5f08 * local_788._4_4_;
          fStack_1970 = local_5f08 * (float)uStack_780;
          fStack_196c = local_5f08 * uStack_780._4_4_;
          fVar38 = local_1978 + fVar38;
          fVar39 = fStack_1974 + fVar39;
          fVar40 = fStack_1970 + fVar40;
          fVar41 = fStack_196c + fVar41;
          local_52e8 = CONCAT44(fVar39,fVar38);
          uStack_52e0 = CONCAT44(fVar41,fVar40);
          local_1958 = local_5f28 * (float)local_768;
          fStack_1954 = local_5f28 * local_768._4_4_;
          fStack_1950 = local_5f28 * (float)uStack_760;
          fStack_194c = local_5f28 * uStack_760._4_4_;
          fVar38 = local_1958 + fVar38;
          fVar39 = fStack_1954 + fVar39;
          fVar40 = fStack_1950 + fVar40;
          fVar41 = fStack_194c + fVar41;
          local_5318 = CONCAT44(fVar39,fVar38);
          uStack_5310 = CONCAT44(fVar41,fVar40);
          local_1938 = local_5fc8 * (float)local_748;
          fStack_1934 = local_5fc8 * local_748._4_4_;
          fStack_1930 = local_5fc8 * (float)uStack_740;
          fStack_192c = local_5fc8 * uStack_740._4_4_;
          fVar38 = local_1938 + fVar38;
          fVar39 = fStack_1934 + fVar39;
          fVar40 = fStack_1930 + fVar40;
          fVar41 = fStack_192c + fVar41;
          local_5348 = CONCAT44(fVar39,fVar38);
          uStack_5340 = CONCAT44(fVar41,fVar40);
          local_1918 = local_5f68 * (float)local_728;
          fStack_1914 = local_5f68 * local_728._4_4_;
          fStack_1910 = local_5f68 * (float)uStack_720;
          fStack_190c = local_5f68 * uStack_720._4_4_;
          fVar38 = local_1918 + fVar38;
          fVar39 = fStack_1914 + fVar39;
          fVar40 = fStack_1910 + fVar40;
          fVar41 = fStack_190c + fVar41;
          local_5378 = CONCAT44(fVar39,fVar38);
          uStack_5370 = CONCAT44(fVar41,fVar40);
          local_18f8 = local_5f88 * (float)local_708;
          fStack_18f4 = local_5f88 * local_708._4_4_;
          fStack_18f0 = local_5f88 * (float)uStack_700;
          fStack_18ec = local_5f88 * uStack_700._4_4_;
          fVar38 = local_18f8 + fVar38;
          fVar39 = fStack_18f4 + fVar39;
          fVar40 = fStack_18f0 + fVar40;
          fVar41 = fStack_18ec + fVar41;
          local_53a8 = CONCAT44(fVar39,fVar38);
          uStack_53a0 = CONCAT44(fVar41,fVar40);
          local_18d8._0_4_ = local_5fe8 * (float)local_6e8;
          local_18d8._4_4_ = local_5fe8 * local_6e8._4_4_;
          local_18d8._8_4_ = local_5fe8 * (float)uStack_6e0;
          local_18d8._12_4_ = local_5fe8 * uStack_6e0._4_4_;
          local_31c8 = CONCAT44(local_18d8._4_4_ + fVar39,local_18d8._0_4_ + fVar38);
          uStack_31c0 = CONCAT44(local_18d8._12_4_ + fVar41,local_18d8._8_4_ + fVar40);
          local_31b0 = local_6878 + 4;
          *(undefined8 *)local_31b0 = local_31c8;
          *(undefined8 *)(local_6878 + 6) = uStack_31c0;
          local_68c8 = local_68c8 + 2;
          local_68d0 = local_68d0 + 2;
          local_68d8 = local_68d8 + 2;
          local_6878 = local_6878 + 8;
          fStack_5fe4 = local_5fe8;
          fStack_5fe0 = local_5fe8;
          fStack_5fdc = local_5fe8;
          local_5fcc = local_5fe8;
          fStack_5fc4 = local_5fc8;
          fStack_5fc0 = local_5fc8;
          fStack_5fbc = local_5fc8;
          local_5fac = local_5fc8;
          fStack_5fa4 = local_5fa8;
          fStack_5fa0 = local_5fa8;
          fStack_5f9c = local_5fa8;
          local_5f8c = local_5fa8;
          fStack_5f84 = local_5f88;
          fStack_5f80 = local_5f88;
          fStack_5f7c = local_5f88;
          local_5f6c = local_5f88;
          fStack_5f64 = local_5f68;
          fStack_5f60 = local_5f68;
          fStack_5f5c = local_5f68;
          local_5f4c = local_5f68;
          fStack_5f44 = local_5f48;
          fStack_5f40 = local_5f48;
          fStack_5f3c = local_5f48;
          local_5f2c = local_5f48;
          fStack_5f24 = local_5f28;
          fStack_5f20 = local_5f28;
          fStack_5f1c = local_5f28;
          local_5f0c = local_5f28;
          fStack_5f04 = local_5f08;
          fStack_5f00 = local_5f08;
          fStack_5efc = local_5f08;
          local_5eec = local_5f08;
          fStack_5ee4 = local_5ee8;
          fStack_5ee0 = local_5ee8;
          fStack_5edc = local_5ee8;
          local_5ecc = local_5ee8;
          fStack_5ec4 = local_5ec8;
          fStack_5ec0 = local_5ec8;
          fStack_5ebc = local_5ec8;
          local_5eac = local_5ec8;
          fStack_5ea4 = local_5ea8;
          fStack_5ea0 = local_5ea8;
          fStack_5e9c = local_5ea8;
          local_5e8c = local_5ea8;
          fStack_5e84 = local_5e88;
          fStack_5e80 = local_5e88;
          fStack_5e7c = local_5e88;
          local_5e6c = local_5e88;
          local_5398 = uVar17;
          uStack_5390 = uVar18;
          local_5368 = uVar15;
          uStack_5360 = uVar16;
          local_5338 = uVar13;
          uStack_5330 = uVar14;
          local_5308 = uVar11;
          uStack_5300 = uVar12;
          local_52d8 = uVar9;
          uStack_52d0 = uVar10;
          local_52a8 = uVar7;
          uStack_52a0 = uVar8;
          local_5278 = uVar5;
          uStack_5270 = uVar6;
          local_5248 = uVar3;
          uStack_5240 = uVar4;
          local_5218 = uVar1;
          uStack_5210 = uVar2;
          local_51e8 = uVar17;
          uStack_51e0 = uVar18;
          local_51d8 = local_5358;
          uStack_51d0 = uStack_5350;
          local_51b8 = uVar15;
          uStack_51b0 = uVar16;
          local_51a8 = local_5328;
          uStack_51a0 = uStack_5320;
          local_5188 = uVar13;
          uStack_5180 = uVar14;
          local_5158 = uVar11;
          uStack_5150 = uVar12;
          local_5148 = local_52c8;
          uStack_5140 = uStack_52c0;
          local_5128 = uVar9;
          uStack_5120 = uVar10;
          local_5118 = local_5298;
          uStack_5110 = uStack_5290;
          local_50f8 = uVar7;
          uStack_50f0 = uVar8;
          local_50c8 = uVar5;
          uStack_50c0 = uVar6;
          local_50b8 = local_5238;
          uStack_50b0 = uStack_5230;
          local_5098 = uVar3;
          uStack_5090 = uVar4;
          local_5088 = local_5208;
          uStack_5080 = uStack_5200;
          local_5068 = uVar1;
          uStack_5060 = uVar2;
          local_1b08 = local_5078;
          uStack_1b00 = uStack_5070;
          local_1ae8 = local_50a8;
          uStack_1ae0 = uStack_50a0;
          local_1ac8 = local_50d8;
          uStack_1ac0 = uStack_50d0;
          local_1aa8 = local_5108;
          uStack_1aa0 = uStack_5100;
          local_1a88 = local_5138;
          uStack_1a80 = uStack_5130;
          local_1a68 = local_5168;
          uStack_1a60 = uStack_5160;
          local_1a48 = local_5198;
          uStack_1a40 = uStack_5190;
          local_1a28 = local_51c8;
          uStack_1a20 = uStack_51c0;
          local_1a08 = local_51f8;
          uStack_1a00 = uStack_51f0;
          local_19e8 = local_5228;
          uStack_19e0 = uStack_5220;
          local_19c8 = local_5258;
          uStack_19c0 = uStack_5250;
          local_19a8 = local_5288;
          uStack_19a0 = uStack_5280;
          local_1988 = local_52b8;
          uStack_1980 = uStack_52b0;
          local_1968 = local_52e8;
          uStack_1960 = uStack_52e0;
          local_1948 = local_5318;
          uStack_1940 = uStack_5310;
          local_1928 = local_5348;
          uStack_1920 = uStack_5340;
          local_1908 = local_5378;
          uStack_1900 = uStack_5370;
          local_18e8 = local_53a8;
          uStack_18e0 = uStack_53a0;
          local_368 = uVar1;
          uStack_360 = uVar2;
          local_358 = local_5058;
          uStack_350 = uStack_5050;
          local_348 = uVar3;
          uStack_340 = uVar4;
          local_338 = local_5208;
          uStack_330 = uStack_5200;
          local_328 = uVar5;
          uStack_320 = uVar6;
          local_318 = local_5238;
          uStack_310 = uStack_5230;
          local_308 = uVar7;
          uStack_300 = uVar8;
          local_2f8 = local_50e8;
          uStack_2f0 = uStack_50e0;
          local_2e8 = uVar9;
          uStack_2e0 = uVar10;
          local_2d8 = local_5298;
          uStack_2d0 = uStack_5290;
          local_2c8 = uVar11;
          uStack_2c0 = uVar12;
          local_2b8 = local_52c8;
          uStack_2b0 = uStack_52c0;
          local_2a8 = uVar13;
          uStack_2a0 = uVar14;
          local_298 = local_5178;
          uStack_290 = uStack_5170;
          local_288 = uVar15;
          uStack_280 = uVar16;
          local_278 = local_5328;
          uStack_270 = uStack_5320;
          local_268 = uVar17;
          uStack_260 = uVar18;
          local_258 = local_5358;
          uStack_250 = uStack_5350;
          local_248 = uVar1;
          uStack_240 = uVar2;
          local_238 = local_5208;
          uStack_230 = uStack_5200;
          local_228 = uVar3;
          uStack_220 = uVar4;
          local_218 = local_5238;
          uStack_210 = uStack_5230;
          local_208 = uVar5;
          uStack_200 = uVar6;
          local_1f8 = local_5268;
          uStack_1f0 = uStack_5260;
          local_1e8 = uVar7;
          uStack_1e0 = uVar8;
          local_1d8 = local_5298;
          uStack_1d0 = uStack_5290;
          local_1c8 = uVar9;
          uStack_1c0 = uVar10;
          local_1b8 = local_52c8;
          uStack_1b0 = uStack_52c0;
          local_1a8 = uVar11;
          uStack_1a0 = uVar12;
          local_198 = local_52f8;
          uStack_190 = uStack_52f0;
          local_188 = uVar13;
          uStack_180 = uVar14;
          local_178 = local_5328;
          uStack_170 = uStack_5320;
          local_168 = uVar15;
          uStack_160 = uVar16;
          local_158 = local_5358;
          uStack_150 = uStack_5350;
          local_148 = uVar17;
          uStack_140 = uVar18;
          local_138 = local_5388;
          uStack_130 = uStack_5380;
        }
        for (; local_6970 < local_6138; local_6970 = local_6970 + 1) {
          local_56f0 = local_6878;
          local_53d8 = *(undefined8 *)local_6878;
          uStack_53d0 = *(undefined8 *)(local_6878 + 2);
          local_6008 = *local_68c8;
          local_53b8 = CONCAT44(local_6008,local_6008);
          uStack_53b0 = CONCAT44(local_6008,local_6008);
          local_6028 = local_68c8[1];
          local_53e8 = CONCAT44(local_6028,local_6028);
          uStack_53e0 = CONCAT44(local_6028,local_6028);
          local_6048 = local_68c8[2];
          local_5418 = CONCAT44(local_6048,local_6048);
          uStack_5410 = CONCAT44(local_6048,local_6048);
          local_6068 = *local_68d0;
          local_5448 = CONCAT44(local_6068,local_6068);
          uStack_5440 = CONCAT44(local_6068,local_6068);
          local_6088 = local_68d0[1];
          local_5478 = CONCAT44(local_6088,local_6088);
          uStack_5470 = CONCAT44(local_6088,local_6088);
          local_60a8 = local_68d0[2];
          local_54a8 = CONCAT44(local_60a8,local_60a8);
          uStack_54a0 = CONCAT44(local_60a8,local_60a8);
          local_60c8 = *local_68d8;
          local_54d8 = CONCAT44(local_60c8,local_60c8);
          uStack_54d0 = CONCAT44(local_60c8,local_60c8);
          local_60e8 = local_68d8[1];
          local_5508 = CONCAT44(local_60e8,local_60e8);
          uStack_5500 = CONCAT44(local_60e8,local_60e8);
          local_6108 = local_68d8[2];
          local_5538 = CONCAT44(local_6108,local_6108);
          uStack_5530 = CONCAT44(local_6108,local_6108);
          local_18b8 = local_6008 * (float)local_7e8;
          fStack_18b4 = local_6008 * local_7e8._4_4_;
          fStack_18b0 = local_6008 * (float)uStack_7e0;
          fStack_18ac = local_6008 * uStack_7e0._4_4_;
          local_18c8._0_4_ = (float)local_53d8;
          local_18c8._4_4_ = (float)((ulong)local_53d8 >> 0x20);
          uStack_18c0._0_4_ = (float)uStack_53d0;
          uStack_18c0._4_4_ = (float)((ulong)uStack_53d0 >> 0x20);
          local_5408 = CONCAT44(fStack_18b4 + local_18c8._4_4_,local_18b8 + (float)local_18c8);
          uStack_5400 = CONCAT44(fStack_18ac + uStack_18c0._4_4_,fStack_18b0 + (float)uStack_18c0);
          local_1898 = local_6028 * (float)local_7c8;
          fStack_1894 = local_6028 * local_7c8._4_4_;
          fStack_1890 = local_6028 * (float)uStack_7c0;
          fStack_188c = local_6028 * uStack_7c0._4_4_;
          in_stack_ffffffffffff87a8 = local_1898 + local_18b8 + (float)local_18c8;
          in_stack_ffffffffffff87ac = fStack_1894 + fStack_18b4 + local_18c8._4_4_;
          in_stack_ffffffffffff87a0 = fStack_1890 + fStack_18b0 + (float)uStack_18c0;
          in_stack_ffffffffffff87a4 = fStack_188c + fStack_18ac + uStack_18c0._4_4_;
          local_5438 = CONCAT44(in_stack_ffffffffffff87ac,in_stack_ffffffffffff87a8);
          uStack_5430 = CONCAT44(in_stack_ffffffffffff87a4,in_stack_ffffffffffff87a0);
          local_1878 = local_6048 * (float)local_7a8;
          fStack_1874 = local_6048 * local_7a8._4_4_;
          fStack_1870 = local_6048 * (float)uStack_7a0;
          fStack_186c = local_6048 * uStack_7a0._4_4_;
          in_stack_ffffffffffff87a8 = local_1878 + in_stack_ffffffffffff87a8;
          in_stack_ffffffffffff87ac = fStack_1874 + in_stack_ffffffffffff87ac;
          in_stack_ffffffffffff87a0 = fStack_1870 + in_stack_ffffffffffff87a0;
          in_stack_ffffffffffff87a4 = fStack_186c + in_stack_ffffffffffff87a4;
          local_5468 = CONCAT44(in_stack_ffffffffffff87ac,in_stack_ffffffffffff87a8);
          uStack_5460 = CONCAT44(in_stack_ffffffffffff87a4,in_stack_ffffffffffff87a0);
          local_1858 = local_6068 * (float)local_788;
          fStack_1854 = local_6068 * local_788._4_4_;
          fStack_1850 = local_6068 * (float)uStack_780;
          fStack_184c = local_6068 * uStack_780._4_4_;
          in_stack_ffffffffffff87a8 = local_1858 + in_stack_ffffffffffff87a8;
          in_stack_ffffffffffff87ac = fStack_1854 + in_stack_ffffffffffff87ac;
          in_stack_ffffffffffff87a0 = fStack_1850 + in_stack_ffffffffffff87a0;
          in_stack_ffffffffffff87a4 = fStack_184c + in_stack_ffffffffffff87a4;
          local_5498 = CONCAT44(in_stack_ffffffffffff87ac,in_stack_ffffffffffff87a8);
          uStack_5490 = CONCAT44(in_stack_ffffffffffff87a4,in_stack_ffffffffffff87a0);
          local_1838 = local_6088 * (float)local_768;
          fStack_1834 = local_6088 * local_768._4_4_;
          fStack_1830 = local_6088 * (float)uStack_760;
          fStack_182c = local_6088 * uStack_760._4_4_;
          in_stack_ffffffffffff87a8 = local_1838 + in_stack_ffffffffffff87a8;
          in_stack_ffffffffffff87ac = fStack_1834 + in_stack_ffffffffffff87ac;
          in_stack_ffffffffffff87a0 = fStack_1830 + in_stack_ffffffffffff87a0;
          in_stack_ffffffffffff87a4 = fStack_182c + in_stack_ffffffffffff87a4;
          local_54c8 = CONCAT44(in_stack_ffffffffffff87ac,in_stack_ffffffffffff87a8);
          uStack_54c0 = CONCAT44(in_stack_ffffffffffff87a4,in_stack_ffffffffffff87a0);
          local_1818 = local_60a8 * (float)local_748;
          fStack_1814 = local_60a8 * local_748._4_4_;
          fStack_1810 = local_60a8 * (float)uStack_740;
          fStack_180c = local_60a8 * uStack_740._4_4_;
          in_stack_ffffffffffff87a8 = local_1818 + in_stack_ffffffffffff87a8;
          in_stack_ffffffffffff87ac = fStack_1814 + in_stack_ffffffffffff87ac;
          in_stack_ffffffffffff87a0 = fStack_1810 + in_stack_ffffffffffff87a0;
          in_stack_ffffffffffff87a4 = fStack_180c + in_stack_ffffffffffff87a4;
          local_54f8 = CONCAT44(in_stack_ffffffffffff87ac,in_stack_ffffffffffff87a8);
          uStack_54f0 = CONCAT44(in_stack_ffffffffffff87a4,in_stack_ffffffffffff87a0);
          local_17f8 = local_60c8 * (float)local_728;
          fStack_17f4 = local_60c8 * local_728._4_4_;
          fStack_17f0 = local_60c8 * (float)uStack_720;
          fStack_17ec = local_60c8 * uStack_720._4_4_;
          in_stack_ffffffffffff8798 = local_17f8 + in_stack_ffffffffffff87a8;
          in_stack_ffffffffffff879c = fStack_17f4 + in_stack_ffffffffffff87ac;
          in_stack_ffffffffffff87a0 = fStack_17f0 + in_stack_ffffffffffff87a0;
          in_stack_ffffffffffff87a4 = fStack_17ec + in_stack_ffffffffffff87a4;
          local_5528 = CONCAT44(in_stack_ffffffffffff879c,in_stack_ffffffffffff8798);
          uStack_5520 = CONCAT44(in_stack_ffffffffffff87a4,in_stack_ffffffffffff87a0);
          local_17d8 = local_60e8 * (float)local_708;
          fStack_17d4 = local_60e8 * local_708._4_4_;
          fStack_17d0 = local_60e8 * (float)uStack_700;
          fStack_17cc = local_60e8 * uStack_700._4_4_;
          in_stack_ffffffffffff8790 = fStack_17d0 + in_stack_ffffffffffff87a0;
          in_stack_ffffffffffff8794 = fStack_17cc + in_stack_ffffffffffff87a4;
          local_5558 = CONCAT44(fStack_17d4 + in_stack_ffffffffffff879c,
                                local_17d8 + in_stack_ffffffffffff8798);
          uStack_5550 = CONCAT44(in_stack_ffffffffffff8794,in_stack_ffffffffffff8790);
          local_17b8._0_4_ = local_6108 * (float)local_6e8;
          local_17b8._4_4_ = local_6108 * local_6e8._4_4_;
          local_17b8._8_4_ = local_6108 * (float)uStack_6e0;
          local_17b8._12_4_ = local_6108 * uStack_6e0._4_4_;
          local_31e8 = CONCAT44(local_17b8._4_4_ + fStack_17d4 + in_stack_ffffffffffff879c,
                                local_17b8._0_4_ + local_17d8 + in_stack_ffffffffffff8798);
          uStack_31e0 = CONCAT44(local_17b8._12_4_ + in_stack_ffffffffffff8794,
                                 local_17b8._8_4_ + in_stack_ffffffffffff8790);
          local_31d0 = local_6878;
          *(undefined8 *)local_6878 = local_31e8;
          *(undefined8 *)(local_6878 + 2) = uStack_31e0;
          local_68c8 = local_68c8 + 1;
          local_68d0 = local_68d0 + 1;
          local_68d8 = local_68d8 + 1;
          local_6878 = local_6878 + 4;
          fStack_6104 = local_6108;
          fStack_6100 = local_6108;
          fStack_60fc = local_6108;
          local_60ec = local_6108;
          fStack_60e4 = local_60e8;
          fStack_60e0 = local_60e8;
          fStack_60dc = local_60e8;
          local_60cc = local_60e8;
          fStack_60c4 = local_60c8;
          fStack_60c0 = local_60c8;
          fStack_60bc = local_60c8;
          local_60ac = local_60c8;
          fStack_60a4 = local_60a8;
          fStack_60a0 = local_60a8;
          fStack_609c = local_60a8;
          local_608c = local_60a8;
          fStack_6084 = local_6088;
          fStack_6080 = local_6088;
          fStack_607c = local_6088;
          local_606c = local_6088;
          fStack_6064 = local_6068;
          fStack_6060 = local_6068;
          fStack_605c = local_6068;
          local_604c = local_6068;
          fStack_6044 = local_6048;
          fStack_6040 = local_6048;
          fStack_603c = local_6048;
          local_602c = local_6048;
          fStack_6024 = local_6028;
          fStack_6020 = local_6028;
          fStack_601c = local_6028;
          local_600c = local_6028;
          fStack_6004 = local_6008;
          fStack_6000 = local_6008;
          fStack_5ffc = local_6008;
          local_5fec = local_6008;
          local_5548 = uVar17;
          uStack_5540 = uVar18;
          local_5518 = uVar15;
          uStack_5510 = uVar16;
          local_54e8 = uVar13;
          uStack_54e0 = uVar14;
          local_54b8 = uVar11;
          uStack_54b0 = uVar12;
          local_5488 = uVar9;
          uStack_5480 = uVar10;
          local_5458 = uVar7;
          uStack_5450 = uVar8;
          local_5428 = uVar5;
          uStack_5420 = uVar6;
          local_53f8 = uVar3;
          uStack_53f0 = uVar4;
          local_53c8 = uVar1;
          uStack_53c0 = uVar2;
          local_18c8 = local_53d8;
          uStack_18c0 = uStack_53d0;
          local_18a8 = local_5408;
          uStack_18a0 = uStack_5400;
          local_1888 = local_5438;
          uStack_1880 = uStack_5430;
          local_1868 = local_5468;
          uStack_1860 = uStack_5460;
          local_1848 = local_5498;
          uStack_1840 = uStack_5490;
          local_1828 = local_54c8;
          uStack_1820 = uStack_54c0;
          local_1808 = local_54f8;
          uStack_1800 = uStack_54f0;
          local_17e8 = local_5528;
          uStack_17e0 = uStack_5520;
          local_17c8 = local_5558;
          uStack_17c0 = uStack_5550;
          local_128 = uVar1;
          uStack_120 = uVar2;
          local_118 = local_53b8;
          uStack_110 = uStack_53b0;
          local_108 = uVar3;
          uStack_100 = uVar4;
          local_f8 = local_53e8;
          uStack_f0 = uStack_53e0;
          local_e8 = uVar5;
          uStack_e0 = uVar6;
          local_d8 = local_5418;
          uStack_d0 = uStack_5410;
          local_c8 = uVar7;
          uStack_c0 = uVar8;
          local_b8 = local_5448;
          uStack_b0 = uStack_5440;
          local_a8 = uVar9;
          uStack_a0 = uVar10;
          local_98 = local_5478;
          uStack_90 = uStack_5470;
          local_88 = uVar11;
          uStack_80 = uVar12;
          local_78 = local_54a8;
          uStack_70 = uStack_54a0;
          local_68 = uVar13;
          uStack_60 = uVar14;
          local_58 = local_54d8;
          uStack_50 = uStack_54d0;
          local_48 = uVar15;
          uStack_40 = uVar16;
          local_38 = local_5508;
          uStack_30 = uStack_5500;
          local_28 = uVar17;
          uStack_20 = uVar18;
          local_18 = local_5538;
          uStack_10 = uStack_5530;
        }
        local_68c8 = local_68c8 + 2;
        local_68d0 = local_68d0 + 2;
        local_68d8 = local_68d8 + 2;
        local_7e8 = uVar19;
        uStack_7e0 = uVar20;
        local_7c8 = uVar21;
        uStack_7c0 = uVar22;
        local_7a8 = uVar23;
        uStack_7a0 = uVar24;
        local_788 = uVar25;
        uStack_780 = uVar26;
        local_768 = uVar27;
        uStack_760 = uVar28;
        local_748 = uVar29;
        uStack_740 = uVar30;
        local_728 = uVar31;
        uStack_720 = uVar32;
        local_708 = uVar33;
        uStack_700 = uVar34;
        local_6e8 = uVar35;
        uStack_6e0 = uVar36;
      }
      local_6820 = local_6820 + 0x24;
      Mat::~Mat((Mat *)0x3444ba);
    }
    Mat::~Mat((Mat *)0x3444dd);
  }
  return;
}

Assistant:

static void conv3x3s1_pack1to4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;
    const float* bias = _bias;

    int nn_outch = outch >> 1;
    int remain_outch_start = nn_outch << 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 2;

        Mat out0 = top_blob.channel(p);
        Mat out1 = top_blob.channel(p + 1);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + p * 4) : _mm_set1_ps(0.f);
        __m128 _bias1 = bias ? _mm_loadu_ps((const float*)bias + (p + 1) * 4) : _mm_set1_ps(0.f);
        out0.fill(_bias0);
        out1.fill(_bias1);

        const float* k0 = kernel.channel(p);
        const float* k1 = kernel.channel(p + 1);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0;
            float* outptr1 = out1;

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);
            const float* r2 = img0.row(2);

            __m128 _k00_0 = _mm_loadu_ps(k0);
            __m128 _k01_0 = _mm_loadu_ps(k0 + 4);
            __m128 _k02_0 = _mm_loadu_ps(k0 + 8);
            __m128 _k10_0 = _mm_loadu_ps(k0 + 12);
            __m128 _k11_0 = _mm_loadu_ps(k0 + 16);
            __m128 _k12_0 = _mm_loadu_ps(k0 + 20);
            __m128 _k20_0 = _mm_loadu_ps(k0 + 24);
            __m128 _k21_0 = _mm_loadu_ps(k0 + 28);
            __m128 _k22_0 = _mm_loadu_ps(k0 + 32);

            __m128 _k00_1 = _mm_loadu_ps(k1);
            __m128 _k01_1 = _mm_loadu_ps(k1 + 4);
            __m128 _k02_1 = _mm_loadu_ps(k1 + 8);
            __m128 _k10_1 = _mm_loadu_ps(k1 + 12);
            __m128 _k11_1 = _mm_loadu_ps(k1 + 16);
            __m128 _k12_1 = _mm_loadu_ps(k1 + 20);
            __m128 _k20_1 = _mm_loadu_ps(k1 + 24);
            __m128 _k21_1 = _mm_loadu_ps(k1 + 28);
            __m128 _k22_1 = _mm_loadu_ps(k1 + 32);

            int i = 0;

            for (; i < outh; i++)
            {
                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);
                    __m128 _sum10 = _mm_loadu_ps(outptr1);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm_storeu_ps(outptr0, _sum00);
                    _mm_storeu_ps(outptr1, _sum10);

                    __m128 _sum01 = _mm_loadu_ps(outptr0 + 4);
                    __m128 _sum11 = _mm_loadu_ps(outptr1 + 4);

                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));

                    _sum01 = _mm_comp_fmadd_ps(_r02, _k00_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r03, _k01_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r04, _k02_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r12, _k10_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r13, _k11_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r14, _k12_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r22, _k20_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r23, _k21_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r24, _k22_0, _sum01);

                    _sum11 = _mm_comp_fmadd_ps(_r02, _k00_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r03, _k01_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r04, _k02_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r12, _k10_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r13, _k11_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r14, _k12_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r22, _k20_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r23, _k21_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r24, _k22_1, _sum11);

                    _mm_storeu_ps(outptr0 + 4, _sum01);
                    _mm_storeu_ps(outptr1 + 4, _sum11);

                    __m128 _sum02 = _mm_loadu_ps(outptr0 + 8);
                    __m128 _sum12 = _mm_loadu_ps(outptr1 + 8);

                    __m128 _r05 = _mm_set1_ps(*(r0 + 4));
                    __m128 _r15 = _mm_set1_ps(*(r1 + 4));
                    __m128 _r25 = _mm_set1_ps(*(r2 + 4));

                    _sum02 = _mm_comp_fmadd_ps(_r03, _k00_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r04, _k01_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r05, _k02_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r13, _k10_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r14, _k11_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r15, _k12_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r23, _k20_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r24, _k21_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r25, _k22_0, _sum02);

                    _sum12 = _mm_comp_fmadd_ps(_r03, _k00_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r04, _k01_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r05, _k02_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r13, _k10_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r14, _k11_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r15, _k12_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r23, _k20_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r24, _k21_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r25, _k22_1, _sum12);

                    _mm_storeu_ps(outptr0 + 8, _sum02);
                    _mm_storeu_ps(outptr1 + 8, _sum12);

                    __m128 _r06 = _mm_set1_ps(*(r0 + 5));
                    __m128 _r16 = _mm_set1_ps(*(r1 + 5));
                    __m128 _r26 = _mm_set1_ps(*(r2 + 5));

                    __m128 _sum03 = _mm_loadu_ps(outptr0 + 12);
                    __m128 _sum13 = _mm_loadu_ps(outptr1 + 12);

                    _sum03 = _mm_comp_fmadd_ps(_r04, _k00_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r05, _k01_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r06, _k02_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r14, _k10_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r15, _k11_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r16, _k12_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r24, _k20_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r25, _k21_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r26, _k22_0, _sum03);

                    _sum13 = _mm_comp_fmadd_ps(_r04, _k00_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r05, _k01_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r06, _k02_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r14, _k10_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r15, _k11_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r16, _k12_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r24, _k20_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r25, _k21_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r26, _k22_1, _sum13);

                    _mm_storeu_ps(outptr0 + 12, _sum03);
                    _mm_storeu_ps(outptr1 + 12, _sum13);

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    outptr0 += 16;
                    outptr1 += 16;
                }

                for (; j + 1 < outw; j += 2)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);
                    __m128 _sum10 = _mm_loadu_ps(outptr1);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm_storeu_ps(outptr0, _sum00);
                    _mm_storeu_ps(outptr1, _sum10);

                    __m128 _sum01 = _mm_loadu_ps(outptr0 + 4);
                    __m128 _sum11 = _mm_loadu_ps(outptr1 + 4);

                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));

                    _sum01 = _mm_comp_fmadd_ps(_r02, _k00_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r03, _k01_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r04, _k02_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r12, _k10_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r13, _k11_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r14, _k12_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r22, _k20_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r23, _k21_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r24, _k22_0, _sum01);

                    _sum11 = _mm_comp_fmadd_ps(_r02, _k00_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r03, _k01_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r04, _k02_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r12, _k10_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r13, _k11_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r14, _k12_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r22, _k20_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r23, _k21_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r24, _k22_1, _sum11);

                    _mm_storeu_ps(outptr0 + 4, _sum01);
                    _mm_storeu_ps(outptr1 + 4, _sum11);

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr0 += 8;
                    outptr1 += 8;
                }

                for (; j < outw; j++)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);
                    __m128 _sum10 = _mm_loadu_ps(outptr1);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm_storeu_ps(outptr0, _sum00);
                    _mm_storeu_ps(outptr1, _sum10);

                    r0 += 1;
                    r1 += 1;
                    r2 += 1;
                    outptr0 += 4;
                    outptr1 += 4;
                }

                r0 += 2;
                r1 += 2;
                r2 += 2;
            }

            k0 += 9 * 4;
            k1 += 9 * 4;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + p * 4) : _mm_set1_ps(0.f);
        out0.fill(_bias0);

        const float* k0 = kernel.channel(p);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);
            const float* r2 = img0.row(2);

            __m128 _k00 = _mm_loadu_ps(k0);
            __m128 _k01 = _mm_loadu_ps(k0 + 4);
            __m128 _k02 = _mm_loadu_ps(k0 + 8);
            __m128 _k10 = _mm_loadu_ps(k0 + 12);
            __m128 _k11 = _mm_loadu_ps(k0 + 16);
            __m128 _k12 = _mm_loadu_ps(k0 + 20);
            __m128 _k20 = _mm_loadu_ps(k0 + 24);
            __m128 _k21 = _mm_loadu_ps(k0 + 28);
            __m128 _k22 = _mm_loadu_ps(k0 + 32);

            int i = 0;

            for (; i < outh; i++)
            {
                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m128 _sum0 = _mm_loadu_ps(outptr0);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum0 = _mm_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r23, _k22, _sum0);

                    __m128 _sum1 = _mm_loadu_ps(outptr0 + 4);
                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));
                    _mm_storeu_ps(outptr0, _sum0);

                    _sum1 = _mm_comp_fmadd_ps(_r02, _k00, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r03, _k01, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r04, _k02, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r12, _k10, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r13, _k11, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r14, _k12, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r22, _k20, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r23, _k21, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r24, _k22, _sum1);

                    __m128 _sum2 = _mm_loadu_ps(outptr0 + 8);
                    __m128 _r05 = _mm_set1_ps(*(r0 + 4));
                    __m128 _r15 = _mm_set1_ps(*(r1 + 4));
                    __m128 _r25 = _mm_set1_ps(*(r2 + 4));
                    _mm_storeu_ps(outptr0 + 4, _sum1);

                    _sum2 = _mm_comp_fmadd_ps(_r03, _k00, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r04, _k01, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r05, _k02, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r13, _k10, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r14, _k11, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r15, _k12, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r23, _k20, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r24, _k21, _sum2);
                    _sum2 = _mm_comp_fmadd_ps(_r25, _k22, _sum2);

                    __m128 _sum3 = _mm_loadu_ps(outptr0 + 12);
                    __m128 _r06 = _mm_set1_ps(*(r0 + 5));
                    __m128 _r16 = _mm_set1_ps(*(r1 + 5));
                    __m128 _r26 = _mm_set1_ps(*(r2 + 5));
                    _mm_storeu_ps(outptr0 + 8, _sum2);

                    _sum3 = _mm_comp_fmadd_ps(_r04, _k00, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r05, _k01, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r06, _k02, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r14, _k10, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r15, _k11, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r16, _k12, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r24, _k20, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r25, _k21, _sum3);
                    _sum3 = _mm_comp_fmadd_ps(_r26, _k22, _sum3);

                    _mm_storeu_ps(outptr0 + 12, _sum3);

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    outptr0 += 16;
                }
                for (; j + 1 < outw; j += 2)
                {
                    __m128 _sum0 = _mm_loadu_ps(outptr0);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum0 = _mm_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r23, _k22, _sum0);

                    __m128 _sum1 = _mm_loadu_ps(outptr0 + 4);
                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));
                    _mm_storeu_ps(outptr0, _sum0);

                    _sum1 = _mm_comp_fmadd_ps(_r02, _k00, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r03, _k01, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r04, _k02, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r12, _k10, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r13, _k11, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r14, _k12, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r22, _k20, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r23, _k21, _sum1);
                    _sum1 = _mm_comp_fmadd_ps(_r24, _k22, _sum1);

                    _mm_storeu_ps(outptr0 + 4, _sum1);

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr0 += 8;
                }
                for (; j < outw; j++)
                {
                    __m128 _sum0 = _mm_loadu_ps(outptr0);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum0 = _mm_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm_comp_fmadd_ps(_r23, _k22, _sum0);

                    _mm_storeu_ps(outptr0, _sum0);
                    r0 += 1;
                    r1 += 1;
                    r2 += 1;
                    outptr0 += 4;
                }

                r0 += 2;
                r1 += 2;
                r2 += 2;
            }

            k0 += 9 * 4;
        }
    }
}